

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Primitive PVar30;
  Geometry *pGVar31;
  __int_type_conflict _Var32;
  long lVar33;
  RTCFilterFunctionN p_Var34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  bool bVar90;
  undefined1 auVar91 [12];
  bool bVar92;
  bool bVar93;
  bool bVar94;
  bool bVar95;
  bool bVar96;
  bool bVar97;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  uint uVar104;
  ulong uVar105;
  ulong uVar106;
  long lVar107;
  long lVar108;
  uint uVar109;
  long lVar110;
  bool bVar111;
  float fVar112;
  float fVar141;
  float fVar142;
  __m128 a;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar113;
  undefined1 auVar119 [16];
  float fVar114;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar143;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar144;
  float fVar186;
  float fVar189;
  undefined1 auVar147 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar196;
  float fVar198;
  float fVar200;
  undefined1 auVar163 [32];
  undefined1 auVar148 [16];
  float fVar191;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar192;
  undefined1 auVar149 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar193;
  undefined1 auVar166 [32];
  float fVar145;
  float fVar146;
  float fVar187;
  float fVar194;
  undefined1 auVar167 [32];
  float fVar188;
  float fVar190;
  float fVar195;
  float fVar197;
  float fVar199;
  float fVar201;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar202 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  float fVar220;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar203 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar221;
  float fVar240;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [28];
  float fVar239;
  float fVar241;
  float fVar242;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar243;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar244;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar265;
  float fVar267;
  undefined1 auVar255 [28];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar258 [32];
  float fVar263;
  float fVar264;
  float fVar266;
  undefined1 auVar259 [64];
  float fVar268;
  float fVar289;
  float fVar290;
  undefined1 auVar269 [16];
  float fVar292;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar294;
  float fVar296;
  float fVar298;
  undefined1 auVar276 [32];
  float fVar291;
  float fVar293;
  float fVar295;
  float fVar297;
  float fVar299;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [64];
  float fVar300;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar314;
  float fVar315;
  float fVar319;
  float fVar321;
  float fVar323;
  undefined1 auVar305 [32];
  float fVar317;
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  float fVar316;
  float fVar318;
  float fVar320;
  float fVar322;
  float fVar324;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [64];
  float fVar325;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [64];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [28];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [64];
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  float fVar380;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [64];
  float fVar381;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float in_register_0000151c;
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  float fVar395;
  float fVar396;
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  float fVar397;
  float fVar398;
  float fVar402;
  float fVar404;
  float fVar406;
  float fVar408;
  float fVar410;
  float fVar412;
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  float fVar403;
  float fVar405;
  float fVar407;
  float fVar409;
  float fVar411;
  float fVar413;
  float fVar414;
  undefined1 auVar401 [32];
  float fVar415;
  float fVar420;
  float fVar421;
  float fVar422;
  float fVar423;
  float fVar424;
  float fVar425;
  float in_register_0000159c;
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  float fVar426;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  float in_register_000015dc;
  undefined1 auVar427 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_ae4;
  undefined1 local_ae0 [32];
  ulong local_aa8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [32];
  ulong local_a58;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9d0 [8];
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 auStack_990 [16];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined8 local_930;
  float local_928;
  float local_924;
  undefined4 local_920;
  uint local_91c;
  uint local_918;
  uint local_914;
  uint local_910;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7c0 [16];
  Primitive *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined8 local_640;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined4 uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0 [4];
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar30 = prim[1];
  uVar105 = (ulong)(byte)PVar30;
  lVar107 = uVar105 * 0x25;
  fVar221 = *(float *)(prim + lVar107 + 0x12);
  auVar118 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar107 + 6));
  auVar269._0_4_ = fVar221 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar269._4_4_ = fVar221 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar269._8_4_ = fVar221 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar269._12_4_ = fVar221 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 4 + 6)));
  auVar147._0_4_ = fVar221 * auVar118._0_4_;
  auVar147._4_4_ = fVar221 * auVar118._4_4_;
  auVar147._8_4_ = fVar221 * auVar118._8_4_;
  auVar147._12_4_ = fVar221 * auVar118._12_4_;
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 4 + 10)));
  auVar135._16_16_ = auVar118;
  auVar135._0_16_ = auVar160;
  auVar135 = vcvtdq2ps_avx(auVar135);
  lVar33 = uVar105 * 5;
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar33 + 6)));
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar33 + 10)));
  auVar210._16_16_ = auVar118;
  auVar210._0_16_ = auVar160;
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 6 + 6)));
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 6 + 10)));
  auVar174 = vcvtdq2ps_avx(auVar210);
  auVar232._16_16_ = auVar118;
  auVar232._0_16_ = auVar160;
  auVar35 = vcvtdq2ps_avx(auVar232);
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xf + 6)));
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0xf + 10)));
  auVar233._16_16_ = auVar118;
  auVar233._0_16_ = auVar160;
  auVar36 = vcvtdq2ps_avx(auVar233);
  lVar110 = (ulong)(byte)PVar30 * 0x10;
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar110 + 6)));
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar110 + 10)));
  auVar305._16_16_ = auVar118;
  auVar305._0_16_ = auVar160;
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar110 + uVar105 + 6)));
  auVar214 = vcvtdq2ps_avx(auVar305);
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar110 + uVar105 + 10)));
  auVar326._16_16_ = auVar118;
  auVar326._0_16_ = auVar160;
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1a + 6)));
  auVar37 = vcvtdq2ps_avx(auVar326);
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1a + 10)));
  auVar327._16_16_ = auVar118;
  auVar327._0_16_ = auVar160;
  auVar359 = vcvtdq2ps_avx(auVar327);
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1b + 6)));
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1b + 10)));
  auVar353._16_16_ = auVar118;
  auVar353._0_16_ = auVar160;
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1c + 6)));
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar105 * 0x1c + 10)));
  auVar427 = vcvtdq2ps_avx(auVar353);
  auVar361._16_16_ = auVar118;
  auVar361._0_16_ = auVar160;
  auVar38 = vcvtdq2ps_avx(auVar361);
  auVar160 = vshufps_avx(auVar269,auVar269,0);
  auVar118 = vshufps_avx(auVar269,auVar269,0x55);
  auVar123 = vshufps_avx(auVar269,auVar269,0xaa);
  fVar221 = auVar123._0_4_;
  fVar113 = auVar123._4_4_;
  fVar239 = auVar123._8_4_;
  fVar114 = auVar123._12_4_;
  fVar220 = auVar118._0_4_;
  fVar145 = auVar118._4_4_;
  fVar240 = auVar118._8_4_;
  fVar191 = auVar118._12_4_;
  fVar241 = auVar160._0_4_;
  fVar242 = auVar160._4_4_;
  fVar243 = auVar160._8_4_;
  fVar244 = auVar160._12_4_;
  auVar382._0_4_ = fVar241 * auVar135._0_4_ + fVar220 * auVar174._0_4_ + fVar221 * auVar35._0_4_;
  auVar382._4_4_ = fVar242 * auVar135._4_4_ + fVar145 * auVar174._4_4_ + fVar113 * auVar35._4_4_;
  auVar382._8_4_ = fVar243 * auVar135._8_4_ + fVar240 * auVar174._8_4_ + fVar239 * auVar35._8_4_;
  auVar382._12_4_ = fVar244 * auVar135._12_4_ + fVar191 * auVar174._12_4_ + fVar114 * auVar35._12_4_
  ;
  auVar382._16_4_ = fVar241 * auVar135._16_4_ + fVar220 * auVar174._16_4_ + fVar221 * auVar35._16_4_
  ;
  auVar382._20_4_ = fVar242 * auVar135._20_4_ + fVar145 * auVar174._20_4_ + fVar113 * auVar35._20_4_
  ;
  auVar382._24_4_ = fVar243 * auVar135._24_4_ + fVar240 * auVar174._24_4_ + fVar239 * auVar35._24_4_
  ;
  auVar382._28_4_ = fVar191 + in_register_000015dc + in_register_0000151c;
  auVar372._0_4_ = fVar241 * auVar36._0_4_ + fVar220 * auVar214._0_4_ + auVar37._0_4_ * fVar221;
  auVar372._4_4_ = fVar242 * auVar36._4_4_ + fVar145 * auVar214._4_4_ + auVar37._4_4_ * fVar113;
  auVar372._8_4_ = fVar243 * auVar36._8_4_ + fVar240 * auVar214._8_4_ + auVar37._8_4_ * fVar239;
  auVar372._12_4_ = fVar244 * auVar36._12_4_ + fVar191 * auVar214._12_4_ + auVar37._12_4_ * fVar114;
  auVar372._16_4_ = fVar241 * auVar36._16_4_ + fVar220 * auVar214._16_4_ + auVar37._16_4_ * fVar221;
  auVar372._20_4_ = fVar242 * auVar36._20_4_ + fVar145 * auVar214._20_4_ + auVar37._20_4_ * fVar113;
  auVar372._24_4_ = fVar243 * auVar36._24_4_ + fVar240 * auVar214._24_4_ + auVar37._24_4_ * fVar239;
  auVar372._28_4_ = fVar191 + in_register_000015dc + in_register_0000159c;
  auVar276._0_4_ = fVar241 * auVar359._0_4_ + fVar220 * auVar427._0_4_ + auVar38._0_4_ * fVar221;
  auVar276._4_4_ = fVar242 * auVar359._4_4_ + fVar145 * auVar427._4_4_ + auVar38._4_4_ * fVar113;
  auVar276._8_4_ = fVar243 * auVar359._8_4_ + fVar240 * auVar427._8_4_ + auVar38._8_4_ * fVar239;
  auVar276._12_4_ = fVar244 * auVar359._12_4_ + fVar191 * auVar427._12_4_ + auVar38._12_4_ * fVar114
  ;
  auVar276._16_4_ = fVar241 * auVar359._16_4_ + fVar220 * auVar427._16_4_ + auVar38._16_4_ * fVar221
  ;
  auVar276._20_4_ = fVar242 * auVar359._20_4_ + fVar145 * auVar427._20_4_ + auVar38._20_4_ * fVar113
  ;
  auVar276._24_4_ = fVar243 * auVar359._24_4_ + fVar240 * auVar427._24_4_ + auVar38._24_4_ * fVar239
  ;
  auVar276._28_4_ = fVar244 + fVar191 + fVar114;
  auVar160 = vshufps_avx(auVar147,auVar147,0);
  auVar118 = vshufps_avx(auVar147,auVar147,0x55);
  auVar123 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar221 = auVar123._0_4_;
  fVar113 = auVar123._4_4_;
  fVar239 = auVar123._8_4_;
  fVar114 = auVar123._12_4_;
  fVar242 = auVar118._0_4_;
  fVar243 = auVar118._4_4_;
  fVar244 = auVar118._8_4_;
  fVar260 = auVar118._12_4_;
  fVar220 = auVar174._28_4_ + auVar35._28_4_;
  fVar145 = auVar160._0_4_;
  fVar240 = auVar160._4_4_;
  fVar191 = auVar160._8_4_;
  fVar241 = auVar160._12_4_;
  auVar163._0_4_ = fVar145 * auVar135._0_4_ + fVar242 * auVar174._0_4_ + fVar221 * auVar35._0_4_;
  auVar163._4_4_ = fVar240 * auVar135._4_4_ + fVar243 * auVar174._4_4_ + fVar113 * auVar35._4_4_;
  auVar163._8_4_ = fVar191 * auVar135._8_4_ + fVar244 * auVar174._8_4_ + fVar239 * auVar35._8_4_;
  auVar163._12_4_ = fVar241 * auVar135._12_4_ + fVar260 * auVar174._12_4_ + fVar114 * auVar35._12_4_
  ;
  auVar163._16_4_ = fVar145 * auVar135._16_4_ + fVar242 * auVar174._16_4_ + fVar221 * auVar35._16_4_
  ;
  auVar163._20_4_ = fVar240 * auVar135._20_4_ + fVar243 * auVar174._20_4_ + fVar113 * auVar35._20_4_
  ;
  auVar163._24_4_ = fVar191 * auVar135._24_4_ + fVar244 * auVar174._24_4_ + fVar239 * auVar35._24_4_
  ;
  auVar163._28_4_ = auVar135._28_4_ + fVar220;
  auVar127._0_4_ = fVar145 * auVar36._0_4_ + auVar37._0_4_ * fVar221 + fVar242 * auVar214._0_4_;
  auVar127._4_4_ = fVar240 * auVar36._4_4_ + auVar37._4_4_ * fVar113 + fVar243 * auVar214._4_4_;
  auVar127._8_4_ = fVar191 * auVar36._8_4_ + auVar37._8_4_ * fVar239 + fVar244 * auVar214._8_4_;
  auVar127._12_4_ = fVar241 * auVar36._12_4_ + auVar37._12_4_ * fVar114 + fVar260 * auVar214._12_4_;
  auVar127._16_4_ = fVar145 * auVar36._16_4_ + auVar37._16_4_ * fVar221 + fVar242 * auVar214._16_4_;
  auVar127._20_4_ = fVar240 * auVar36._20_4_ + auVar37._20_4_ * fVar113 + fVar243 * auVar214._20_4_;
  auVar127._24_4_ = fVar191 * auVar36._24_4_ + auVar37._24_4_ * fVar239 + fVar244 * auVar214._24_4_;
  auVar127._28_4_ = auVar135._28_4_ + auVar37._28_4_ + auVar35._28_4_;
  auVar328._8_4_ = 0x7fffffff;
  auVar328._0_8_ = 0x7fffffff7fffffff;
  auVar328._12_4_ = 0x7fffffff;
  auVar328._16_4_ = 0x7fffffff;
  auVar328._20_4_ = 0x7fffffff;
  auVar328._24_4_ = 0x7fffffff;
  auVar328._28_4_ = 0x7fffffff;
  auVar345._8_4_ = 0x219392ef;
  auVar345._0_8_ = 0x219392ef219392ef;
  auVar345._12_4_ = 0x219392ef;
  auVar345._16_4_ = 0x219392ef;
  auVar345._20_4_ = 0x219392ef;
  auVar345._24_4_ = 0x219392ef;
  auVar345._28_4_ = 0x219392ef;
  auVar135 = vandps_avx(auVar382,auVar328);
  auVar135 = vcmpps_avx(auVar135,auVar345,1);
  auVar174 = vblendvps_avx(auVar382,auVar345,auVar135);
  auVar135 = vandps_avx(auVar372,auVar328);
  auVar135 = vcmpps_avx(auVar135,auVar345,1);
  auVar35 = vblendvps_avx(auVar372,auVar345,auVar135);
  auVar135 = vandps_avx(auVar276,auVar328);
  auVar135 = vcmpps_avx(auVar135,auVar345,1);
  auVar135 = vblendvps_avx(auVar276,auVar345,auVar135);
  auVar211._0_4_ = fVar145 * auVar359._0_4_ + fVar242 * auVar427._0_4_ + auVar38._0_4_ * fVar221;
  auVar211._4_4_ = fVar240 * auVar359._4_4_ + fVar243 * auVar427._4_4_ + auVar38._4_4_ * fVar113;
  auVar211._8_4_ = fVar191 * auVar359._8_4_ + fVar244 * auVar427._8_4_ + auVar38._8_4_ * fVar239;
  auVar211._12_4_ = fVar241 * auVar359._12_4_ + fVar260 * auVar427._12_4_ + auVar38._12_4_ * fVar114
  ;
  auVar211._16_4_ = fVar145 * auVar359._16_4_ + fVar242 * auVar427._16_4_ + auVar38._16_4_ * fVar221
  ;
  auVar211._20_4_ = fVar240 * auVar359._20_4_ + fVar243 * auVar427._20_4_ + auVar38._20_4_ * fVar113
  ;
  auVar211._24_4_ = fVar191 * auVar359._24_4_ + fVar244 * auVar427._24_4_ + auVar38._24_4_ * fVar239
  ;
  auVar211._28_4_ = fVar220 + auVar214._28_4_ + fVar114;
  auVar36 = vrcpps_avx(auVar174);
  fVar221 = auVar36._0_4_;
  fVar239 = auVar36._4_4_;
  auVar214._4_4_ = auVar174._4_4_ * fVar239;
  auVar214._0_4_ = auVar174._0_4_ * fVar221;
  fVar220 = auVar36._8_4_;
  auVar214._8_4_ = auVar174._8_4_ * fVar220;
  fVar240 = auVar36._12_4_;
  auVar214._12_4_ = auVar174._12_4_ * fVar240;
  fVar241 = auVar36._16_4_;
  auVar214._16_4_ = auVar174._16_4_ * fVar241;
  fVar242 = auVar36._20_4_;
  auVar214._20_4_ = auVar174._20_4_ * fVar242;
  fVar243 = auVar36._24_4_;
  auVar214._24_4_ = auVar174._24_4_ * fVar243;
  auVar214._28_4_ = auVar174._28_4_;
  auVar346._8_4_ = 0x3f800000;
  auVar346._0_8_ = &DAT_3f8000003f800000;
  auVar346._12_4_ = 0x3f800000;
  auVar346._16_4_ = 0x3f800000;
  auVar346._20_4_ = 0x3f800000;
  auVar346._24_4_ = 0x3f800000;
  auVar346._28_4_ = 0x3f800000;
  auVar37 = vsubps_avx(auVar346,auVar214);
  auVar214 = vrcpps_avx(auVar35);
  fVar221 = fVar221 + fVar221 * auVar37._0_4_;
  fVar239 = fVar239 + fVar239 * auVar37._4_4_;
  fVar220 = fVar220 + fVar220 * auVar37._8_4_;
  fVar240 = fVar240 + fVar240 * auVar37._12_4_;
  fVar241 = fVar241 + fVar241 * auVar37._16_4_;
  fVar242 = fVar242 + fVar242 * auVar37._20_4_;
  fVar243 = fVar243 + fVar243 * auVar37._24_4_;
  fVar244 = auVar214._0_4_;
  fVar260 = auVar214._4_4_;
  auVar174._4_4_ = fVar260 * auVar35._4_4_;
  auVar174._0_4_ = fVar244 * auVar35._0_4_;
  fVar261 = auVar214._8_4_;
  auVar174._8_4_ = fVar261 * auVar35._8_4_;
  fVar262 = auVar214._12_4_;
  auVar174._12_4_ = fVar262 * auVar35._12_4_;
  fVar263 = auVar214._16_4_;
  auVar174._16_4_ = fVar263 * auVar35._16_4_;
  fVar264 = auVar214._20_4_;
  auVar174._20_4_ = fVar264 * auVar35._20_4_;
  fVar266 = auVar214._24_4_;
  auVar174._24_4_ = fVar266 * auVar35._24_4_;
  auVar174._28_4_ = auVar35._28_4_;
  auVar35 = vsubps_avx(auVar346,auVar174);
  fVar244 = fVar244 + fVar244 * auVar35._0_4_;
  fVar260 = fVar260 + fVar260 * auVar35._4_4_;
  fVar261 = fVar261 + fVar261 * auVar35._8_4_;
  fVar262 = fVar262 + fVar262 * auVar35._12_4_;
  fVar263 = fVar263 + fVar263 * auVar35._16_4_;
  fVar264 = fVar264 + fVar264 * auVar35._20_4_;
  fVar266 = fVar266 + fVar266 * auVar35._24_4_;
  auVar174 = vrcpps_avx(auVar135);
  fVar268 = auVar174._0_4_;
  fVar289 = auVar174._4_4_;
  auVar359._4_4_ = fVar289 * auVar135._4_4_;
  auVar359._0_4_ = fVar268 * auVar135._0_4_;
  fVar290 = auVar174._8_4_;
  auVar359._8_4_ = fVar290 * auVar135._8_4_;
  fVar292 = auVar174._12_4_;
  auVar359._12_4_ = fVar292 * auVar135._12_4_;
  fVar294 = auVar174._16_4_;
  auVar359._16_4_ = fVar294 * auVar135._16_4_;
  fVar296 = auVar174._20_4_;
  auVar359._20_4_ = fVar296 * auVar135._20_4_;
  fVar298 = auVar174._24_4_;
  auVar359._24_4_ = fVar298 * auVar135._24_4_;
  auVar359._28_4_ = auVar135._28_4_;
  auVar135 = vsubps_avx(auVar346,auVar359);
  fVar268 = fVar268 + fVar268 * auVar135._0_4_;
  fVar289 = fVar289 + fVar289 * auVar135._4_4_;
  fVar290 = fVar290 + fVar290 * auVar135._8_4_;
  fVar292 = fVar292 + fVar292 * auVar135._12_4_;
  fVar294 = fVar294 + fVar294 * auVar135._16_4_;
  fVar296 = fVar296 + fVar296 * auVar135._20_4_;
  fVar298 = fVar298 + fVar298 * auVar135._24_4_;
  auVar160 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar107 + 0x16)) * *(float *)(prim + lVar107 + 0x1a)))
  ;
  auVar40 = vshufps_avx(auVar160,auVar160,0);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar105 * 7 + 6);
  auVar160 = vpmovsxwd_avx(auVar160);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar105 * 7 + 0xe);
  auVar118 = vpmovsxwd_avx(auVar118);
  auVar329._16_16_ = auVar118;
  auVar329._0_16_ = auVar160;
  auVar135 = vcvtdq2ps_avx(auVar329);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *(ulong *)(prim + uVar105 * 0xb + 6);
  auVar160 = vpmovsxwd_avx(auVar123);
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar105 * 0xb + 0xe);
  auVar118 = vpmovsxwd_avx(auVar225);
  auVar347._16_16_ = auVar118;
  auVar347._0_16_ = auVar160;
  auVar174 = vcvtdq2ps_avx(auVar347);
  auVar174 = vsubps_avx(auVar174,auVar135);
  fVar113 = auVar40._0_4_;
  fVar114 = auVar40._4_4_;
  fVar145 = auVar40._8_4_;
  fVar191 = auVar40._12_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar105 * 9 + 6);
  auVar160 = vpmovsxwd_avx(auVar40);
  auVar153._8_8_ = 0;
  auVar153._0_8_ = *(ulong *)(prim + uVar105 * 9 + 0xe);
  auVar118 = vpmovsxwd_avx(auVar153);
  auVar330._0_4_ = auVar174._0_4_ * fVar113 + auVar135._0_4_;
  auVar330._4_4_ = auVar174._4_4_ * fVar114 + auVar135._4_4_;
  auVar330._8_4_ = auVar174._8_4_ * fVar145 + auVar135._8_4_;
  auVar330._12_4_ = auVar174._12_4_ * fVar191 + auVar135._12_4_;
  auVar330._16_4_ = auVar174._16_4_ * fVar113 + auVar135._16_4_;
  auVar330._20_4_ = auVar174._20_4_ * fVar114 + auVar135._20_4_;
  auVar330._24_4_ = auVar174._24_4_ * fVar145 + auVar135._24_4_;
  auVar330._28_4_ = auVar174._28_4_ + auVar135._28_4_;
  auVar348._16_16_ = auVar118;
  auVar348._0_16_ = auVar160;
  auVar135 = vcvtdq2ps_avx(auVar348);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar105 * 0xd + 6);
  auVar160 = vpmovsxwd_avx(auVar159);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar105 * 0xd + 0xe);
  auVar118 = vpmovsxwd_avx(auVar13);
  auVar354._16_16_ = auVar118;
  auVar354._0_16_ = auVar160;
  auVar174 = vcvtdq2ps_avx(auVar354);
  auVar174 = vsubps_avx(auVar174,auVar135);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar105 * 0x12 + 6);
  auVar160 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar105 * 0x12 + 0xe);
  auVar118 = vpmovsxwd_avx(auVar15);
  auVar349._0_4_ = auVar135._0_4_ + auVar174._0_4_ * fVar113;
  auVar349._4_4_ = auVar135._4_4_ + auVar174._4_4_ * fVar114;
  auVar349._8_4_ = auVar135._8_4_ + auVar174._8_4_ * fVar145;
  auVar349._12_4_ = auVar135._12_4_ + auVar174._12_4_ * fVar191;
  auVar349._16_4_ = auVar135._16_4_ + auVar174._16_4_ * fVar113;
  auVar349._20_4_ = auVar135._20_4_ + auVar174._20_4_ * fVar114;
  auVar349._24_4_ = auVar135._24_4_ + auVar174._24_4_ * fVar145;
  auVar349._28_4_ = auVar135._28_4_ + auVar174._28_4_;
  auVar355._16_16_ = auVar118;
  auVar355._0_16_ = auVar160;
  auVar135 = vcvtdq2ps_avx(auVar355);
  uVar106 = (ulong)(uint)((int)lVar33 << 2);
  lVar107 = uVar105 * 2 + uVar106;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + lVar107 + 6);
  auVar160 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar107 + 0xe);
  auVar118 = vpmovsxwd_avx(auVar17);
  auVar362._16_16_ = auVar118;
  auVar362._0_16_ = auVar160;
  auVar174 = vcvtdq2ps_avx(auVar362);
  auVar174 = vsubps_avx(auVar174,auVar135);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar106 + 6);
  auVar160 = vpmovsxwd_avx(auVar18);
  auVar356._0_4_ = auVar135._0_4_ + auVar174._0_4_ * fVar113;
  auVar356._4_4_ = auVar135._4_4_ + auVar174._4_4_ * fVar114;
  auVar356._8_4_ = auVar135._8_4_ + auVar174._8_4_ * fVar145;
  auVar356._12_4_ = auVar135._12_4_ + auVar174._12_4_ * fVar191;
  auVar356._16_4_ = auVar135._16_4_ + auVar174._16_4_ * fVar113;
  auVar356._20_4_ = auVar135._20_4_ + auVar174._20_4_ * fVar114;
  auVar356._24_4_ = auVar135._24_4_ + auVar174._24_4_ * fVar145;
  auVar356._28_4_ = auVar135._28_4_ + auVar174._28_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar106 + 0xe);
  auVar118 = vpmovsxwd_avx(auVar19);
  auVar363._16_16_ = auVar118;
  auVar363._0_16_ = auVar160;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar105 * 0x18 + 6);
  auVar160 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar105 * 0x18 + 0xe);
  auVar118 = vpmovsxwd_avx(auVar21);
  auVar135 = vcvtdq2ps_avx(auVar363);
  auVar373._16_16_ = auVar118;
  auVar373._0_16_ = auVar160;
  auVar174 = vcvtdq2ps_avx(auVar373);
  auVar174 = vsubps_avx(auVar174,auVar135);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar105 * 0x1d + 6);
  auVar160 = vpmovsxwd_avx(auVar22);
  auVar364._0_4_ = auVar135._0_4_ + auVar174._0_4_ * fVar113;
  auVar364._4_4_ = auVar135._4_4_ + auVar174._4_4_ * fVar114;
  auVar364._8_4_ = auVar135._8_4_ + auVar174._8_4_ * fVar145;
  auVar364._12_4_ = auVar135._12_4_ + auVar174._12_4_ * fVar191;
  auVar364._16_4_ = auVar135._16_4_ + auVar174._16_4_ * fVar113;
  auVar364._20_4_ = auVar135._20_4_ + auVar174._20_4_ * fVar114;
  auVar364._24_4_ = auVar135._24_4_ + auVar174._24_4_ * fVar145;
  auVar364._28_4_ = auVar135._28_4_ + auVar174._28_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar105 * 0x1d + 0xe);
  auVar118 = vpmovsxwd_avx(auVar23);
  lVar107 = uVar105 + (ulong)(byte)PVar30 * 0x20;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + lVar107 + 6);
  auVar123 = vpmovsxwd_avx(auVar24);
  auVar374._16_16_ = auVar118;
  auVar374._0_16_ = auVar160;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar107 + 0xe);
  auVar160 = vpmovsxwd_avx(auVar25);
  auVar383._16_16_ = auVar160;
  auVar383._0_16_ = auVar123;
  auVar135 = vcvtdq2ps_avx(auVar374);
  auVar174 = vcvtdq2ps_avx(auVar383);
  auVar174 = vsubps_avx(auVar174,auVar135);
  auVar375._0_4_ = auVar135._0_4_ + auVar174._0_4_ * fVar113;
  auVar375._4_4_ = auVar135._4_4_ + auVar174._4_4_ * fVar114;
  auVar375._8_4_ = auVar135._8_4_ + auVar174._8_4_ * fVar145;
  auVar375._12_4_ = auVar135._12_4_ + auVar174._12_4_ * fVar191;
  auVar375._16_4_ = auVar135._16_4_ + auVar174._16_4_ * fVar113;
  auVar375._20_4_ = auVar135._20_4_ + auVar174._20_4_ * fVar114;
  auVar375._24_4_ = auVar135._24_4_ + auVar174._24_4_ * fVar145;
  auVar375._28_4_ = auVar135._28_4_ + auVar174._28_4_;
  lVar107 = (ulong)(byte)PVar30 * 0x20 - uVar105;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar107 + 6);
  auVar160 = vpmovsxwd_avx(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar107 + 0xe);
  auVar118 = vpmovsxwd_avx(auVar27);
  auVar384._16_16_ = auVar118;
  auVar384._0_16_ = auVar160;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar105 * 0x23 + 6);
  auVar160 = vpmovsxwd_avx(auVar28);
  local_7b0 = prim;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar105 * 0x23 + 0xe);
  auVar118 = vpmovsxwd_avx(auVar29);
  auVar399._16_16_ = auVar118;
  auVar399._0_16_ = auVar160;
  auVar135 = vcvtdq2ps_avx(auVar384);
  auVar174 = vcvtdq2ps_avx(auVar399);
  auVar174 = vsubps_avx(auVar174,auVar135);
  auVar385._0_4_ = auVar135._0_4_ + auVar174._0_4_ * fVar113;
  auVar385._4_4_ = auVar135._4_4_ + auVar174._4_4_ * fVar114;
  auVar385._8_4_ = auVar135._8_4_ + auVar174._8_4_ * fVar145;
  auVar385._12_4_ = auVar135._12_4_ + auVar174._12_4_ * fVar191;
  auVar385._16_4_ = auVar135._16_4_ + auVar174._16_4_ * fVar113;
  auVar385._20_4_ = auVar135._20_4_ + auVar174._20_4_ * fVar114;
  auVar385._24_4_ = auVar135._24_4_ + auVar174._24_4_ * fVar145;
  auVar385._28_4_ = auVar135._28_4_ + fVar191;
  auVar135 = vsubps_avx(auVar330,auVar163);
  auVar301._0_4_ = fVar221 * auVar135._0_4_;
  auVar301._4_4_ = fVar239 * auVar135._4_4_;
  auVar301._8_4_ = fVar220 * auVar135._8_4_;
  auVar301._12_4_ = fVar240 * auVar135._12_4_;
  auVar427._16_4_ = fVar241 * auVar135._16_4_;
  auVar427._0_16_ = auVar301;
  auVar427._20_4_ = fVar242 * auVar135._20_4_;
  auVar427._24_4_ = fVar243 * auVar135._24_4_;
  auVar427._28_4_ = auVar135._28_4_;
  auVar135 = vsubps_avx(auVar349,auVar163);
  auVar222._0_4_ = fVar221 * auVar135._0_4_;
  auVar222._4_4_ = fVar239 * auVar135._4_4_;
  auVar222._8_4_ = fVar220 * auVar135._8_4_;
  auVar222._12_4_ = fVar240 * auVar135._12_4_;
  auVar38._16_4_ = fVar241 * auVar135._16_4_;
  auVar38._0_16_ = auVar222;
  auVar38._20_4_ = fVar242 * auVar135._20_4_;
  auVar38._24_4_ = fVar243 * auVar135._24_4_;
  auVar38._28_4_ = auVar36._28_4_ + auVar37._28_4_;
  auVar135 = vsubps_avx(auVar356,auVar127);
  auVar148._0_4_ = fVar244 * auVar135._0_4_;
  auVar148._4_4_ = fVar260 * auVar135._4_4_;
  auVar148._8_4_ = fVar261 * auVar135._8_4_;
  auVar148._12_4_ = fVar262 * auVar135._12_4_;
  auVar36._16_4_ = fVar263 * auVar135._16_4_;
  auVar36._0_16_ = auVar148;
  auVar36._20_4_ = fVar264 * auVar135._20_4_;
  auVar36._24_4_ = fVar266 * auVar135._24_4_;
  auVar36._28_4_ = auVar135._28_4_;
  auVar135 = vsubps_avx(auVar364,auVar127);
  auVar245._0_4_ = fVar244 * auVar135._0_4_;
  auVar245._4_4_ = fVar260 * auVar135._4_4_;
  auVar245._8_4_ = fVar261 * auVar135._8_4_;
  auVar245._12_4_ = fVar262 * auVar135._12_4_;
  auVar37._16_4_ = fVar263 * auVar135._16_4_;
  auVar37._0_16_ = auVar245;
  auVar37._20_4_ = fVar264 * auVar135._20_4_;
  auVar37._24_4_ = fVar266 * auVar135._24_4_;
  auVar37._28_4_ = auVar214._28_4_ + auVar35._28_4_;
  auVar135 = vsubps_avx(auVar375,auVar211);
  auVar115._0_4_ = fVar268 * auVar135._0_4_;
  auVar115._4_4_ = fVar289 * auVar135._4_4_;
  auVar115._8_4_ = fVar290 * auVar135._8_4_;
  auVar115._12_4_ = fVar292 * auVar135._12_4_;
  auVar35._16_4_ = fVar294 * auVar135._16_4_;
  auVar35._0_16_ = auVar115;
  auVar35._20_4_ = fVar296 * auVar135._20_4_;
  auVar35._24_4_ = fVar298 * auVar135._24_4_;
  auVar35._28_4_ = auVar135._28_4_;
  auVar135 = vsubps_avx(auVar385,auVar211);
  auVar202._0_4_ = fVar268 * auVar135._0_4_;
  auVar202._4_4_ = fVar289 * auVar135._4_4_;
  auVar202._8_4_ = fVar290 * auVar135._8_4_;
  auVar202._12_4_ = fVar292 * auVar135._12_4_;
  auVar41._16_4_ = fVar294 * auVar135._16_4_;
  auVar41._0_16_ = auVar202;
  auVar41._20_4_ = fVar296 * auVar135._20_4_;
  auVar41._24_4_ = fVar298 * auVar135._24_4_;
  auVar41._28_4_ = auVar135._28_4_;
  auVar160 = vpminsd_avx(auVar427._16_16_,auVar38._16_16_);
  auVar118 = vpminsd_avx(auVar301,auVar222);
  auVar350._16_16_ = auVar160;
  auVar350._0_16_ = auVar118;
  auVar160 = vpminsd_avx(auVar36._16_16_,auVar37._16_16_);
  auVar118 = vpminsd_avx(auVar148,auVar245);
  auVar376._16_16_ = auVar160;
  auVar376._0_16_ = auVar118;
  auVar135 = vmaxps_avx(auVar350,auVar376);
  auVar123 = auVar41._16_16_;
  auVar379 = ZEXT1664(auVar123);
  auVar160 = vpminsd_avx(auVar35._16_16_,auVar123);
  auVar118 = vpminsd_avx(auVar115,auVar202);
  auVar400._16_16_ = auVar160;
  auVar400._0_16_ = auVar118;
  uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar416._4_4_ = uVar8;
  auVar416._0_4_ = uVar8;
  auVar416._8_4_ = uVar8;
  auVar416._12_4_ = uVar8;
  auVar416._16_4_ = uVar8;
  auVar416._20_4_ = uVar8;
  auVar416._24_4_ = uVar8;
  auVar416._28_4_ = uVar8;
  auVar174 = vmaxps_avx(auVar400,auVar416);
  auVar135 = vmaxps_avx(auVar135,auVar174);
  local_3e0._4_4_ = auVar135._4_4_ * 0.99999964;
  local_3e0._0_4_ = auVar135._0_4_ * 0.99999964;
  local_3e0._8_4_ = auVar135._8_4_ * 0.99999964;
  local_3e0._12_4_ = auVar135._12_4_ * 0.99999964;
  local_3e0._16_4_ = auVar135._16_4_ * 0.99999964;
  local_3e0._20_4_ = auVar135._20_4_ * 0.99999964;
  local_3e0._24_4_ = auVar135._24_4_ * 0.99999964;
  local_3e0._28_4_ = auVar135._28_4_;
  auVar160 = vpmaxsd_avx(auVar427._16_16_,auVar38._16_16_);
  auVar118 = vpmaxsd_avx(auVar301,auVar222);
  auVar234._16_16_ = auVar160;
  auVar234._0_16_ = auVar118;
  auVar160 = vpmaxsd_avx(auVar36._16_16_,auVar37._16_16_);
  auVar118 = vpmaxsd_avx(auVar148,auVar245);
  auVar164._16_16_ = auVar160;
  auVar164._0_16_ = auVar118;
  auVar135 = vminps_avx(auVar234,auVar164);
  auVar160 = vpmaxsd_avx(auVar35._16_16_,auVar123);
  auVar118 = vpmaxsd_avx(auVar115,auVar202);
  fVar221 = (ray->super_RayK<1>).tfar;
  auVar212._4_4_ = fVar221;
  auVar212._0_4_ = fVar221;
  auVar212._8_4_ = fVar221;
  auVar212._12_4_ = fVar221;
  auVar212._16_4_ = fVar221;
  auVar212._20_4_ = fVar221;
  auVar212._24_4_ = fVar221;
  auVar212._28_4_ = fVar221;
  auVar128._16_16_ = auVar160;
  auVar128._0_16_ = auVar118;
  auVar174 = vminps_avx(auVar128,auVar212);
  auVar135 = vminps_avx(auVar135,auVar174);
  auVar42._4_4_ = auVar135._4_4_ * 1.0000004;
  auVar42._0_4_ = auVar135._0_4_ * 1.0000004;
  auVar42._8_4_ = auVar135._8_4_ * 1.0000004;
  auVar42._12_4_ = auVar135._12_4_ * 1.0000004;
  auVar42._16_4_ = auVar135._16_4_ * 1.0000004;
  auVar42._20_4_ = auVar135._20_4_ * 1.0000004;
  auVar42._24_4_ = auVar135._24_4_ * 1.0000004;
  auVar42._28_4_ = auVar135._28_4_;
  auVar135 = vcmpps_avx(local_3e0,auVar42,2);
  auVar160 = vpshufd_avx(ZEXT116((byte)PVar30),0);
  auVar165._16_16_ = auVar160;
  auVar165._0_16_ = auVar160;
  auVar174 = vcvtdq2ps_avx(auVar165);
  auVar174 = vcmpps_avx(_DAT_02020f40,auVar174,1);
  auVar135 = vandps_avx(auVar135,auVar174);
  uVar104 = vmovmskps_avx(auVar135);
  if (uVar104 == 0) {
    return;
  }
  uVar104 = uVar104 & 0xff;
  auVar129._16_16_ = mm_lookupmask_ps._240_16_;
  auVar129._0_16_ = mm_lookupmask_ps._240_16_;
  local_3c0 = vblendps_avx(auVar129,ZEXT832(0) << 0x20,0x80);
  auVar336 = ZEXT1664((undefined1  [16])0x0);
LAB_011e0b4f:
  local_7a8 = (ulong)uVar104;
  lVar107 = 0;
  if ((ulong)uVar104 != 0) {
    for (; (uVar104 >> lVar107 & 1) == 0; lVar107 = lVar107 + 1) {
    }
  }
  local_aa8 = (ulong)*(uint *)(local_7b0 + 2);
  pGVar31 = (context->scene->geometries).items[*(uint *)(local_7b0 + 2)].ptr;
  local_a58 = (ulong)*(uint *)(local_7b0 + lVar107 * 4 + 6);
  uVar105 = (ulong)*(uint *)(*(long *)&pGVar31->field_0x58 +
                            (ulong)*(uint *)(local_7b0 + lVar107 * 4 + 6) *
                            pGVar31[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar221 = (pGVar31->time_range).lower;
  fVar221 = pGVar31->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar221) /
            ((pGVar31->time_range).upper - fVar221));
  auVar160 = vroundss_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),9);
  auVar160 = vminss_avx(auVar160,ZEXT416((uint)(pGVar31->fnumTimeSegments + -1.0)));
  auVar160 = vmaxss_avx(auVar336._0_16_,auVar160);
  fVar221 = fVar221 - auVar160._0_4_;
  _Var32 = pGVar31[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar108 = (long)(int)auVar160._0_4_ * 0x38;
  lVar107 = *(long *)(_Var32 + 0x10 + lVar108);
  lVar33 = *(long *)(_Var32 + 0x38 + lVar108);
  lVar110 = *(long *)(_Var32 + 0x48 + lVar108);
  auVar160 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
  pfVar1 = (float *)(lVar33 + uVar105 * lVar110);
  fVar220 = auVar160._0_4_;
  fVar145 = auVar160._4_4_;
  fVar240 = auVar160._8_4_;
  fVar191 = auVar160._12_4_;
  pfVar2 = (float *)(lVar33 + (uVar105 + 1) * lVar110);
  pfVar3 = (float *)(lVar33 + (uVar105 + 2) * lVar110);
  pfVar4 = (float *)(lVar33 + lVar110 * (uVar105 + 3));
  lVar33 = *(long *)(_Var32 + lVar108);
  auVar160 = vshufps_avx(ZEXT416((uint)(1.0 - fVar221)),ZEXT416((uint)(1.0 - fVar221)),0);
  pfVar5 = (float *)(lVar33 + lVar107 * uVar105);
  fVar221 = auVar160._0_4_;
  fVar113 = auVar160._4_4_;
  fVar239 = auVar160._8_4_;
  fVar114 = auVar160._12_4_;
  pfVar6 = (float *)(lVar33 + lVar107 * (uVar105 + 1));
  pfVar7 = (float *)(lVar33 + lVar107 * (uVar105 + 2));
  auVar203._0_4_ = fVar220 * *pfVar1 + fVar221 * *pfVar5;
  auVar203._4_4_ = fVar145 * pfVar1[1] + fVar113 * pfVar5[1];
  auVar203._8_4_ = fVar240 * pfVar1[2] + fVar239 * pfVar5[2];
  auVar203._12_4_ = fVar191 * pfVar1[3] + fVar114 * pfVar5[3];
  auVar223._0_4_ = fVar221 * *pfVar6 + fVar220 * *pfVar2;
  auVar223._4_4_ = fVar113 * pfVar6[1] + fVar145 * pfVar2[1];
  auVar223._8_4_ = fVar239 * pfVar6[2] + fVar240 * pfVar2[2];
  auVar223._12_4_ = fVar114 * pfVar6[3] + fVar191 * pfVar2[3];
  auVar246._0_4_ = fVar221 * *pfVar7 + fVar220 * *pfVar3;
  auVar246._4_4_ = fVar113 * pfVar7[1] + fVar145 * pfVar3[1];
  auVar246._8_4_ = fVar239 * pfVar7[2] + fVar240 * pfVar3[2];
  auVar246._12_4_ = fVar114 * pfVar7[3] + fVar191 * pfVar3[3];
  pfVar1 = (float *)(lVar33 + lVar107 * (uVar105 + 3));
  auVar270._0_4_ = fVar221 * *pfVar1 + fVar220 * *pfVar4;
  auVar270._4_4_ = fVar113 * pfVar1[1] + fVar145 * pfVar4[1];
  auVar270._8_4_ = fVar239 * pfVar1[2] + fVar240 * pfVar4[2];
  auVar270._12_4_ = fVar114 * pfVar1[3] + fVar191 * pfVar4[3];
  auVar116._0_4_ = (auVar203._0_4_ + auVar223._0_4_ + auVar246._0_4_ + auVar270._0_4_) * 0.25;
  auVar116._4_4_ = (auVar203._4_4_ + auVar223._4_4_ + auVar246._4_4_ + auVar270._4_4_) * 0.25;
  auVar116._8_4_ = (auVar203._8_4_ + auVar223._8_4_ + auVar246._8_4_ + auVar270._8_4_) * 0.25;
  auVar116._12_4_ = (auVar203._12_4_ + auVar223._12_4_ + auVar246._12_4_ + auVar270._12_4_) * 0.25;
  aVar10 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar11 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar160 = vsubps_avx(auVar116,(undefined1  [16])aVar10);
  auVar160 = vdpps_avx(auVar160,(undefined1  [16])aVar11,0x7f);
  auVar118 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
  auVar123 = vrcpss_avx(auVar118,auVar118);
  fVar221 = auVar160._0_4_ * auVar123._0_4_ * (2.0 - auVar123._0_4_ * auVar118._0_4_);
  local_7c0 = ZEXT416((uint)fVar221);
  auVar118 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
  fVar221 = aVar11.x;
  fVar113 = aVar11.y;
  fVar239 = aVar11.z;
  aVar192 = aVar11.field_3;
  auVar302._0_4_ = aVar10.x + fVar221 * auVar118._0_4_;
  auVar302._4_4_ = aVar10.y + fVar113 * auVar118._4_4_;
  auVar302._8_4_ = aVar10.z + fVar239 * auVar118._8_4_;
  auVar302._12_4_ = aVar10.field_3.w + aVar192.w * auVar118._12_4_;
  auVar160 = vblendps_avx(auVar302,_DAT_01feba10,8);
  auVar313 = ZEXT1664(auVar160);
  _local_9b0 = vsubps_avx(auVar203,auVar160);
  auVar336 = ZEXT1664(_local_9b0);
  _local_9c0 = vsubps_avx(auVar246,auVar160);
  auVar259 = ZEXT1664(_local_9c0);
  _local_9d0 = vsubps_avx(auVar223,auVar160);
  _local_9e0 = vsubps_avx(auVar270,auVar160);
  auVar160 = vshufps_avx(_local_9b0,_local_9b0,0);
  register0x00001290 = auVar160;
  _local_1a0 = auVar160;
  auVar160 = vshufps_avx(_local_9b0,_local_9b0,0x55);
  register0x00001290 = auVar160;
  _local_1c0 = auVar160;
  auVar160 = vshufps_avx(_local_9b0,_local_9b0,0xaa);
  register0x00001290 = auVar160;
  _local_1e0 = auVar160;
  auVar160 = vshufps_avx(_local_9b0,_local_9b0,0xff);
  register0x00001290 = auVar160;
  _local_200 = auVar160;
  auVar160 = vshufps_avx(_local_9d0,_local_9d0,0);
  register0x00001290 = auVar160;
  _local_220 = auVar160;
  auVar160 = vshufps_avx(_local_9d0,_local_9d0,0x55);
  register0x00001290 = auVar160;
  _local_240 = auVar160;
  auVar160 = vshufps_avx(_local_9d0,_local_9d0,0xaa);
  register0x00001290 = auVar160;
  _local_260 = auVar160;
  auVar149._0_4_ = fVar221 * fVar221;
  auVar149._4_4_ = fVar113 * fVar113;
  auVar149._8_4_ = fVar239 * fVar239;
  auVar149._12_4_ = aVar192.w * aVar192.w;
  auVar160 = vshufps_avx(auVar149,auVar149,0xaa);
  auVar123 = vshufps_avx(auVar149,auVar149,0x55);
  auVar225 = vshufps_avx(_local_9d0,_local_9d0,0xff);
  auVar235._16_16_ = auVar225;
  auVar235._0_16_ = auVar225;
  _local_280 = auVar235;
  auVar225 = vshufps_avx(auVar149,auVar149,0);
  local_2a0._0_4_ = auVar225._0_4_ + auVar123._0_4_ + auVar160._0_4_;
  local_2a0._4_4_ = auVar225._4_4_ + auVar123._4_4_ + auVar160._4_4_;
  local_2a0._8_4_ = auVar225._8_4_ + auVar123._8_4_ + auVar160._8_4_;
  local_2a0._12_4_ = auVar225._12_4_ + auVar123._12_4_ + auVar160._12_4_;
  local_2a0._16_4_ = auVar225._0_4_ + auVar123._0_4_ + auVar160._0_4_;
  local_2a0._20_4_ = auVar225._4_4_ + auVar123._4_4_ + auVar160._4_4_;
  local_2a0._24_4_ = auVar225._8_4_ + auVar123._8_4_ + auVar160._8_4_;
  local_2a0._28_4_ = auVar225._12_4_ + auVar123._12_4_ + auVar160._12_4_;
  auVar160 = vshufps_avx(_local_9c0,_local_9c0,0);
  register0x00001250 = auVar160;
  _local_2c0 = auVar160;
  auVar160 = vshufps_avx(_local_9c0,_local_9c0,0x55);
  register0x00001250 = auVar160;
  _local_2e0 = auVar160;
  auVar160 = vshufps_avx(_local_9c0,_local_9c0,0xaa);
  register0x00001250 = auVar160;
  _local_300 = auVar160;
  auVar160 = vshufps_avx(_local_9c0,_local_9c0,0xff);
  register0x00001250 = auVar160;
  _local_320 = auVar160;
  auVar160 = vshufps_avx(_local_9e0,_local_9e0,0);
  register0x00001250 = auVar160;
  _local_340 = auVar160;
  auVar160 = vshufps_avx(_local_9e0,_local_9e0,0x55);
  register0x00001250 = auVar160;
  _local_360 = auVar160;
  auVar160 = vshufps_avx(_local_9e0,_local_9e0,0xaa);
  register0x00001250 = auVar160;
  _local_380 = auVar160;
  auVar160 = vshufps_avx(_local_9e0,_local_9e0,0xff);
  register0x00001250 = auVar160;
  _local_3a0 = auVar160;
  register0x00001210 = auVar118;
  _local_760 = auVar118;
  uVar106 = 0;
  local_500 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_4fc = local_500;
  fStack_4f8 = local_500;
  fStack_4f4 = local_500;
  fStack_4f0 = local_500;
  fStack_4ec = local_500;
  fStack_4e8 = local_500;
  fStack_4e4 = local_500;
  local_520 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  local_540 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  auVar130._8_4_ = 0x7fffffff;
  auVar130._0_8_ = 0x7fffffff7fffffff;
  auVar130._12_4_ = 0x7fffffff;
  auVar130._16_4_ = 0x7fffffff;
  auVar130._20_4_ = 0x7fffffff;
  auVar130._24_4_ = 0x7fffffff;
  auVar130._28_4_ = 0x7fffffff;
  local_400 = vandps_avx(local_2a0,auVar130);
  local_7d0 = 0x3f80000000000000;
  uStack_7c8 = 0;
  auVar288 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  uVar105 = 1;
  do {
    auVar100._8_8_ = uStack_7c8;
    auVar100._0_8_ = local_7d0;
    auVar160 = vmovshdup_avx(auVar100);
    fVar221 = auVar160._0_4_ - (float)local_7d0;
    auVar160 = vshufps_avx(auVar100,auVar100,0);
    _fStack_8f0 = auVar160;
    _local_900 = auVar160;
    auVar118 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
    register0x00001250 = auVar118;
    _local_820 = auVar118;
    fVar144 = auVar118._0_4_;
    fVar186 = auVar118._4_4_;
    fVar189 = auVar118._8_4_;
    fVar193 = auVar118._12_4_;
    fVar112 = auVar160._0_4_;
    auVar166._0_4_ = fVar112 + fVar144 * 0.0;
    fVar141 = auVar160._4_4_;
    auVar166._4_4_ = fVar141 + fVar186 * 0.14285715;
    fVar142 = auVar160._8_4_;
    auVar166._8_4_ = fVar142 + fVar189 * 0.2857143;
    fVar143 = auVar160._12_4_;
    auVar166._12_4_ = fVar143 + fVar193 * 0.42857146;
    auVar166._16_4_ = fVar112 + fVar144 * 0.5714286;
    auVar166._20_4_ = fVar141 + fVar186 * 0.71428573;
    auVar166._24_4_ = fVar142 + fVar189 * 0.8571429;
    auVar166._28_4_ = fVar143 + fVar193;
    auVar135 = vsubps_avx(auVar288._0_32_,auVar166);
    fVar113 = auVar235._28_4_;
    fVar239 = auVar135._0_4_;
    fVar114 = auVar135._4_4_;
    fVar220 = auVar135._8_4_;
    fVar145 = auVar135._12_4_;
    fVar240 = auVar135._16_4_;
    fVar191 = auVar135._20_4_;
    fVar241 = auVar135._24_4_;
    fVar300 = (float)local_2c0._0_4_ * auVar166._0_4_ + (float)local_220._0_4_ * fVar239;
    fVar314 = (float)local_2c0._4_4_ * auVar166._4_4_ + (float)local_220._4_4_ * fVar114;
    fVar315 = fStack_2b8 * auVar166._8_4_ + fStack_218 * fVar220;
    fVar317 = fStack_2b4 * auVar166._12_4_ + fStack_214 * fVar145;
    fVar319 = fStack_2b0 * auVar166._16_4_ + fStack_210 * fVar240;
    fVar321 = fStack_2ac * auVar166._20_4_ + fStack_20c * fVar191;
    fVar323 = fStack_2a8 * auVar166._24_4_ + fStack_208 * fVar241;
    fVar242 = (float)local_2e0._0_4_ * auVar166._0_4_ + (float)local_240._0_4_ * fVar239;
    fVar243 = (float)local_2e0._4_4_ * auVar166._4_4_ + (float)local_240._4_4_ * fVar114;
    fVar244 = fStack_2d8 * auVar166._8_4_ + fStack_238 * fVar220;
    fVar260 = fStack_2d4 * auVar166._12_4_ + fStack_234 * fVar145;
    fVar261 = fStack_2d0 * auVar166._16_4_ + fStack_230 * fVar240;
    fVar262 = fStack_2cc * auVar166._20_4_ + fStack_22c * fVar191;
    fVar263 = fStack_2c8 * auVar166._24_4_ + fStack_228 * fVar241;
    fVar264 = (float)local_300._0_4_ * auVar166._0_4_ + (float)local_260._0_4_ * fVar239;
    fVar266 = (float)local_300._4_4_ * auVar166._4_4_ + (float)local_260._4_4_ * fVar114;
    fVar268 = fStack_2f8 * auVar166._8_4_ + fStack_258 * fVar220;
    fVar289 = fStack_2f4 * auVar166._12_4_ + fStack_254 * fVar145;
    fVar290 = fStack_2f0 * auVar166._16_4_ + fStack_250 * fVar240;
    fVar292 = fStack_2ec * auVar166._20_4_ + fStack_24c * fVar191;
    fVar294 = fStack_2e8 * auVar166._24_4_ + fStack_248 * fVar241;
    fVar296 = (float)local_320._0_4_ * auVar166._0_4_ + (float)local_280._0_4_ * fVar239;
    fVar298 = (float)local_320._4_4_ * auVar166._4_4_ + (float)local_280._4_4_ * fVar114;
    fVar291 = fStack_318 * auVar166._8_4_ + fStack_278 * fVar220;
    fVar293 = fStack_314 * auVar166._12_4_ + fStack_274 * fVar145;
    fVar295 = fStack_310 * auVar166._16_4_ + fStack_270 * fVar240;
    fVar297 = fStack_30c * auVar166._20_4_ + fStack_26c * fVar191;
    fVar299 = fStack_308 * auVar166._24_4_ + fStack_268 * fVar241;
    fVar380 = auVar379._28_4_;
    fVar414 = fVar380 + fStack_224;
    fVar395 = fStack_204 + fVar380;
    auVar357._0_4_ =
         ((float)local_220._0_4_ * auVar166._0_4_ + fVar239 * (float)local_1a0._0_4_) * fVar239 +
         auVar166._0_4_ * fVar300;
    auVar357._4_4_ =
         ((float)local_220._4_4_ * auVar166._4_4_ + fVar114 * (float)local_1a0._4_4_) * fVar114 +
         auVar166._4_4_ * fVar314;
    auVar357._8_4_ =
         (fStack_218 * auVar166._8_4_ + fVar220 * fStack_198) * fVar220 + auVar166._8_4_ * fVar315;
    auVar357._12_4_ =
         (fStack_214 * auVar166._12_4_ + fVar145 * fStack_194) * fVar145 + auVar166._12_4_ * fVar317
    ;
    auVar357._16_4_ =
         (fStack_210 * auVar166._16_4_ + fVar240 * fStack_190) * fVar240 + auVar166._16_4_ * fVar319
    ;
    auVar357._20_4_ =
         (fStack_20c * auVar166._20_4_ + fVar191 * fStack_18c) * fVar191 + auVar166._20_4_ * fVar321
    ;
    auVar357._24_4_ =
         (fStack_208 * auVar166._24_4_ + fVar241 * fStack_188) * fVar241 + auVar166._24_4_ * fVar323
    ;
    auVar357._28_4_ = fStack_304 + fVar380;
    auVar365._0_4_ =
         fVar239 * ((float)local_240._0_4_ * auVar166._0_4_ + fVar239 * (float)local_1c0._0_4_) +
         auVar166._0_4_ * fVar242;
    auVar365._4_4_ =
         fVar114 * ((float)local_240._4_4_ * auVar166._4_4_ + fVar114 * (float)local_1c0._4_4_) +
         auVar166._4_4_ * fVar243;
    auVar365._8_4_ =
         fVar220 * (fStack_238 * auVar166._8_4_ + fVar220 * fStack_1b8) + auVar166._8_4_ * fVar244;
    auVar365._12_4_ =
         fVar145 * (fStack_234 * auVar166._12_4_ + fVar145 * fStack_1b4) + auVar166._12_4_ * fVar260
    ;
    auVar365._16_4_ =
         fVar240 * (fStack_230 * auVar166._16_4_ + fVar240 * fStack_1b0) + auVar166._16_4_ * fVar261
    ;
    auVar365._20_4_ =
         fVar191 * (fStack_22c * auVar166._20_4_ + fVar191 * fStack_1ac) + auVar166._20_4_ * fVar262
    ;
    auVar365._24_4_ =
         fVar241 * (fStack_228 * auVar166._24_4_ + fVar241 * fStack_1a8) + auVar166._24_4_ * fVar263
    ;
    auVar365._28_4_ = fVar113 + auVar336._28_4_ + fVar380;
    auVar377._0_4_ =
         fVar239 * ((float)local_260._0_4_ * auVar166._0_4_ + fVar239 * (float)local_1e0._0_4_) +
         auVar166._0_4_ * fVar264;
    auVar377._4_4_ =
         fVar114 * ((float)local_260._4_4_ * auVar166._4_4_ + fVar114 * (float)local_1e0._4_4_) +
         auVar166._4_4_ * fVar266;
    auVar377._8_4_ =
         fVar220 * (fStack_258 * auVar166._8_4_ + fVar220 * fStack_1d8) + auVar166._8_4_ * fVar268;
    auVar377._12_4_ =
         fVar145 * (fStack_254 * auVar166._12_4_ + fVar145 * fStack_1d4) + auVar166._12_4_ * fVar289
    ;
    auVar377._16_4_ =
         fVar240 * (fStack_250 * auVar166._16_4_ + fVar240 * fStack_1d0) + auVar166._16_4_ * fVar290
    ;
    auVar377._20_4_ =
         fVar191 * (fStack_24c * auVar166._20_4_ + fVar191 * fStack_1cc) + auVar166._20_4_ * fVar292
    ;
    auVar377._24_4_ =
         fVar241 * (fStack_248 * auVar166._24_4_ + fVar241 * fStack_1c8) + auVar166._24_4_ * fVar294
    ;
    auVar377._28_4_ = fStack_2e4 + fVar380;
    auVar331._0_4_ =
         auVar166._0_4_ * fVar296 +
         fVar239 * ((float)local_280._0_4_ * auVar166._0_4_ + fVar239 * (float)local_200._0_4_);
    auVar331._4_4_ =
         auVar166._4_4_ * fVar298 +
         fVar114 * ((float)local_280._4_4_ * auVar166._4_4_ + fVar114 * (float)local_200._4_4_);
    auVar331._8_4_ =
         auVar166._8_4_ * fVar291 + fVar220 * (fStack_278 * auVar166._8_4_ + fVar220 * fStack_1f8);
    auVar331._12_4_ =
         auVar166._12_4_ * fVar293 + fVar145 * (fStack_274 * auVar166._12_4_ + fVar145 * fStack_1f4)
    ;
    auVar331._16_4_ =
         auVar166._16_4_ * fVar295 + fVar240 * (fStack_270 * auVar166._16_4_ + fVar240 * fStack_1f0)
    ;
    auVar331._20_4_ =
         auVar166._20_4_ * fVar297 + fVar191 * (fStack_26c * auVar166._20_4_ + fVar191 * fStack_1ec)
    ;
    auVar331._24_4_ =
         auVar166._24_4_ * fVar299 + fVar241 * (fStack_268 * auVar166._24_4_ + fVar241 * fStack_1e8)
    ;
    auVar331._28_4_ = fStack_2e4 + fStack_2c4;
    auVar417._0_4_ =
         (auVar166._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar239) *
         auVar166._0_4_ + fVar239 * fVar300;
    auVar417._4_4_ =
         (auVar166._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar114) *
         auVar166._4_4_ + fVar114 * fVar314;
    auVar417._8_4_ =
         (auVar166._8_4_ * fStack_338 + fStack_2b8 * fVar220) * auVar166._8_4_ + fVar220 * fVar315;
    auVar417._12_4_ =
         (auVar166._12_4_ * fStack_334 + fStack_2b4 * fVar145) * auVar166._12_4_ + fVar145 * fVar317
    ;
    auVar417._16_4_ =
         (auVar166._16_4_ * fStack_330 + fStack_2b0 * fVar240) * auVar166._16_4_ + fVar240 * fVar319
    ;
    auVar417._20_4_ =
         (auVar166._20_4_ * fStack_32c + fStack_2ac * fVar191) * auVar166._20_4_ + fVar191 * fVar321
    ;
    auVar417._24_4_ =
         (auVar166._24_4_ * fStack_328 + fStack_2a8 * fVar241) * auVar166._24_4_ + fVar241 * fVar323
    ;
    auVar417._28_4_ = fStack_2e4 + fVar113 + auVar313._28_4_;
    auVar236._0_4_ =
         (auVar166._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar239) *
         auVar166._0_4_ + fVar239 * fVar242;
    auVar236._4_4_ =
         (auVar166._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar114) *
         auVar166._4_4_ + fVar114 * fVar243;
    auVar236._8_4_ =
         (auVar166._8_4_ * fStack_358 + fStack_2d8 * fVar220) * auVar166._8_4_ + fVar220 * fVar244;
    auVar236._12_4_ =
         (auVar166._12_4_ * fStack_354 + fStack_2d4 * fVar145) * auVar166._12_4_ + fVar145 * fVar260
    ;
    auVar236._16_4_ =
         (auVar166._16_4_ * fStack_350 + fStack_2d0 * fVar240) * auVar166._16_4_ + fVar240 * fVar261
    ;
    auVar236._20_4_ =
         (auVar166._20_4_ * fStack_34c + fStack_2cc * fVar191) * auVar166._20_4_ + fVar191 * fVar262
    ;
    auVar236._24_4_ =
         (auVar166._24_4_ * fStack_348 + fStack_2c8 * fVar241) * auVar166._24_4_ + fVar241 * fVar263
    ;
    auVar236._28_4_ = fStack_2e4 + auVar259._28_4_ + fVar113;
    auVar256._0_4_ =
         auVar166._0_4_ *
         (auVar166._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar239) +
         fVar239 * fVar264;
    auVar256._4_4_ =
         auVar166._4_4_ *
         (auVar166._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar114) +
         fVar114 * fVar266;
    auVar256._8_4_ =
         auVar166._8_4_ * (auVar166._8_4_ * fStack_378 + fStack_2f8 * fVar220) + fVar220 * fVar268;
    auVar256._12_4_ =
         auVar166._12_4_ * (auVar166._12_4_ * fStack_374 + fStack_2f4 * fVar145) + fVar145 * fVar289
    ;
    auVar256._16_4_ =
         auVar166._16_4_ * (auVar166._16_4_ * fStack_370 + fStack_2f0 * fVar240) + fVar240 * fVar290
    ;
    auVar256._20_4_ =
         auVar166._20_4_ * (auVar166._20_4_ * fStack_36c + fStack_2ec * fVar191) + fVar191 * fVar292
    ;
    auVar256._24_4_ =
         auVar166._24_4_ * (auVar166._24_4_ * fStack_368 + fStack_2e8 * fVar241) + fVar241 * fVar294
    ;
    auVar256._28_4_ = fVar395 + auVar288._28_4_ + auVar259._28_4_;
    auVar277._0_4_ =
         (auVar166._0_4_ * (float)local_3a0._0_4_ + (float)local_320._0_4_ * fVar239) *
         auVar166._0_4_ + fVar239 * fVar296;
    auVar277._4_4_ =
         (auVar166._4_4_ * (float)local_3a0._4_4_ + (float)local_320._4_4_ * fVar114) *
         auVar166._4_4_ + fVar114 * fVar298;
    auVar277._8_4_ =
         (auVar166._8_4_ * fStack_398 + fStack_318 * fVar220) * auVar166._8_4_ + fVar220 * fVar291;
    auVar277._12_4_ =
         (auVar166._12_4_ * fStack_394 + fStack_314 * fVar145) * auVar166._12_4_ + fVar145 * fVar293
    ;
    auVar277._16_4_ =
         (auVar166._16_4_ * fStack_390 + fStack_310 * fVar240) * auVar166._16_4_ + fVar240 * fVar295
    ;
    auVar277._20_4_ =
         (auVar166._20_4_ * fStack_38c + fStack_30c * fVar191) * auVar166._20_4_ + fVar191 * fVar297
    ;
    auVar277._24_4_ =
         (auVar166._24_4_ * fStack_388 + fStack_308 * fVar241) * auVar166._24_4_ + fVar241 * fVar299
    ;
    auVar277._28_4_ = fVar414 + fVar380 + auVar288._28_4_;
    local_aa0 = auVar357._0_4_ * fVar239 + auVar417._0_4_ * auVar166._0_4_;
    fStack_a9c = auVar357._4_4_ * fVar114 + auVar417._4_4_ * auVar166._4_4_;
    fStack_a98 = auVar357._8_4_ * fVar220 + auVar417._8_4_ * auVar166._8_4_;
    fStack_a94 = auVar357._12_4_ * fVar145 + auVar417._12_4_ * auVar166._12_4_;
    fStack_a90 = auVar357._16_4_ * fVar240 + auVar417._16_4_ * auVar166._16_4_;
    fStack_a8c = auVar357._20_4_ * fVar191 + auVar417._20_4_ * auVar166._20_4_;
    fStack_a88 = auVar357._24_4_ * fVar241 + auVar417._24_4_ * auVar166._24_4_;
    fStack_a84 = fVar414 + fStack_2e4;
    local_680._0_4_ = auVar365._0_4_ * fVar239 + auVar166._0_4_ * auVar236._0_4_;
    local_680._4_4_ = auVar365._4_4_ * fVar114 + auVar166._4_4_ * auVar236._4_4_;
    fStack_678 = auVar365._8_4_ * fVar220 + auVar166._8_4_ * auVar236._8_4_;
    fStack_674 = auVar365._12_4_ * fVar145 + auVar166._12_4_ * auVar236._12_4_;
    fStack_670 = auVar365._16_4_ * fVar240 + auVar166._16_4_ * auVar236._16_4_;
    fStack_66c = auVar365._20_4_ * fVar191 + auVar166._20_4_ * auVar236._20_4_;
    fStack_668 = auVar365._24_4_ * fVar241 + auVar166._24_4_ * auVar236._24_4_;
    register0x000015dc = fStack_2e4 + fVar395;
    local_560._0_4_ = auVar377._0_4_ * fVar239 + auVar166._0_4_ * auVar256._0_4_;
    local_560._4_4_ = auVar377._4_4_ * fVar114 + auVar166._4_4_ * auVar256._4_4_;
    fStack_558 = auVar377._8_4_ * fVar220 + auVar166._8_4_ * auVar256._8_4_;
    fStack_554 = auVar377._12_4_ * fVar145 + auVar166._12_4_ * auVar256._12_4_;
    fStack_550 = auVar377._16_4_ * fVar240 + auVar166._16_4_ * auVar256._16_4_;
    fStack_54c = auVar377._20_4_ * fVar191 + auVar166._20_4_ * auVar256._20_4_;
    fStack_548 = auVar377._24_4_ * fVar241 + auVar166._24_4_ * auVar256._24_4_;
    fStack_544 = fVar395 + fStack_2e4;
    local_840._0_4_ = fVar239 * auVar331._0_4_ + auVar166._0_4_ * auVar277._0_4_;
    local_840._4_4_ = fVar114 * auVar331._4_4_ + auVar166._4_4_ * auVar277._4_4_;
    fStack_838 = fVar220 * auVar331._8_4_ + auVar166._8_4_ * auVar277._8_4_;
    fStack_834 = fVar145 * auVar331._12_4_ + auVar166._12_4_ * auVar277._12_4_;
    fStack_830 = fVar240 * auVar331._16_4_ + auVar166._16_4_ * auVar277._16_4_;
    fStack_82c = fVar191 * auVar331._20_4_ + auVar166._20_4_ * auVar277._20_4_;
    fStack_828 = fVar241 * auVar331._24_4_ + auVar166._24_4_ * auVar277._24_4_;
    fStack_824 = auVar135._28_4_ + auVar166._28_4_;
    auVar35 = vsubps_avx(auVar417,auVar357);
    auVar135 = vsubps_avx(auVar236,auVar365);
    auVar174 = vsubps_avx(auVar256,auVar377);
    auVar36 = vsubps_avx(auVar277,auVar331);
    auVar160 = vshufps_avx(ZEXT416((uint)(fVar221 * 0.04761905)),
                           ZEXT416((uint)(fVar221 * 0.04761905)),0);
    fVar266 = auVar160._0_4_;
    fVar325 = fVar266 * auVar35._0_4_ * 3.0;
    fVar268 = auVar160._4_4_;
    fVar337 = fVar268 * auVar35._4_4_ * 3.0;
    local_8c0._4_4_ = fVar337;
    local_8c0._0_4_ = fVar325;
    fVar296 = auVar160._8_4_;
    fVar338 = fVar296 * auVar35._8_4_ * 3.0;
    fStack_8b8 = fVar338;
    fVar260 = auVar160._12_4_;
    fVar339 = fVar260 * auVar35._12_4_ * 3.0;
    fStack_8b4 = fVar339;
    fVar340 = fVar266 * auVar35._16_4_ * 3.0;
    unique0x1000c064 = fVar340;
    fVar341 = fVar268 * auVar35._20_4_ * 3.0;
    unique0x1000c068 = fVar341;
    fVar342 = fVar296 * auVar35._24_4_ * 3.0;
    unique0x1000c06c = fVar342;
    unique0x1000c070 = auVar331._28_4_;
    fVar381 = fVar266 * auVar135._0_4_ * 3.0;
    fVar389 = fVar268 * auVar135._4_4_ * 3.0;
    local_860._4_4_ = fVar389;
    local_860._0_4_ = fVar381;
    fVar390 = fVar296 * auVar135._8_4_ * 3.0;
    local_860._8_4_ = fVar390;
    fVar391 = fVar260 * auVar135._12_4_ * 3.0;
    local_860._12_4_ = fVar391;
    fVar392 = fVar266 * auVar135._16_4_ * 3.0;
    local_860._16_4_ = fVar392;
    fVar393 = fVar268 * auVar135._20_4_ * 3.0;
    local_860._20_4_ = fVar393;
    fVar394 = fVar296 * auVar135._24_4_ * 3.0;
    local_860._24_4_ = fVar394;
    local_860._28_4_ = fVar395;
    fVar397 = fVar266 * auVar174._0_4_ * 3.0;
    fVar402 = fVar268 * auVar174._4_4_ * 3.0;
    local_a00._4_4_ = fVar402;
    local_a00._0_4_ = fVar397;
    fVar404 = fVar296 * auVar174._8_4_ * 3.0;
    local_a00._8_4_ = fVar404;
    fVar406 = fVar260 * auVar174._12_4_ * 3.0;
    local_a00._12_4_ = fVar406;
    fVar408 = fVar266 * auVar174._16_4_ * 3.0;
    local_a00._16_4_ = fVar408;
    fVar410 = fVar268 * auVar174._20_4_ * 3.0;
    local_a00._20_4_ = fVar410;
    fVar412 = fVar296 * auVar174._24_4_ * 3.0;
    local_a00._24_4_ = fVar412;
    local_a00._28_4_ = fVar414;
    fVar145 = fVar266 * auVar36._0_4_ * 3.0;
    fVar240 = fVar268 * auVar36._4_4_ * 3.0;
    auVar43._4_4_ = fVar240;
    auVar43._0_4_ = fVar145;
    fVar244 = fVar296 * auVar36._8_4_ * 3.0;
    auVar43._8_4_ = fVar244;
    fVar260 = fVar260 * auVar36._12_4_ * 3.0;
    auVar43._12_4_ = fVar260;
    fVar266 = fVar266 * auVar36._16_4_ * 3.0;
    auVar43._16_4_ = fVar266;
    fVar268 = fVar268 * auVar36._20_4_ * 3.0;
    auVar43._20_4_ = fVar268;
    fVar296 = fVar296 * auVar36._24_4_ * 3.0;
    auVar43._24_4_ = fVar296;
    auVar43._28_4_ = auVar35._28_4_;
    auVar135 = vperm2f128_avx(_local_680,_local_680,1);
    auVar135 = vshufps_avx(auVar135,_local_680,0x30);
    local_a80 = vshufps_avx(_local_680,auVar135,0x29);
    auVar135 = vperm2f128_avx(_local_560,_local_560,1);
    auVar135 = vshufps_avx(auVar135,_local_560,0x30);
    _local_9a0 = vshufps_avx(_local_560,auVar135,0x29);
    auVar174 = vsubps_avx(_local_840,auVar43);
    auVar135 = vperm2f128_avx(auVar174,auVar174,1);
    auVar135 = vshufps_avx(auVar135,auVar174,0x30);
    local_800 = vshufps_avx(auVar174,auVar135,0x29);
    local_580 = vsubps_avx(local_a80,_local_680);
    _local_6a0 = vsubps_avx(_local_9a0,_local_560);
    fVar113 = local_580._0_4_;
    fVar191 = local_580._4_4_;
    auVar44._4_4_ = fVar402 * fVar191;
    auVar44._0_4_ = fVar397 * fVar113;
    fVar261 = local_580._8_4_;
    auVar44._8_4_ = fVar404 * fVar261;
    fVar289 = local_580._12_4_;
    auVar44._12_4_ = fVar406 * fVar289;
    fVar291 = local_580._16_4_;
    auVar44._16_4_ = fVar408 * fVar291;
    fVar314 = local_580._20_4_;
    auVar44._20_4_ = fVar410 * fVar314;
    fVar380 = local_580._24_4_;
    auVar44._24_4_ = fVar412 * fVar380;
    auVar44._28_4_ = auVar174._28_4_;
    fVar239 = local_6a0._0_4_;
    fVar241 = local_6a0._4_4_;
    auVar45._4_4_ = fVar389 * fVar241;
    auVar45._0_4_ = fVar381 * fVar239;
    fVar262 = local_6a0._8_4_;
    auVar45._8_4_ = fVar390 * fVar262;
    fVar290 = local_6a0._12_4_;
    auVar45._12_4_ = fVar391 * fVar290;
    fVar293 = local_6a0._16_4_;
    auVar45._16_4_ = fVar392 * fVar293;
    fVar315 = local_6a0._20_4_;
    auVar45._20_4_ = fVar393 * fVar315;
    fVar414 = local_6a0._24_4_;
    auVar45._24_4_ = fVar394 * fVar414;
    auVar45._28_4_ = auVar135._28_4_;
    auVar36 = vsubps_avx(auVar45,auVar44);
    auVar98._4_4_ = fStack_a9c;
    auVar98._0_4_ = local_aa0;
    auVar98._8_4_ = fStack_a98;
    auVar98._12_4_ = fStack_a94;
    auVar98._16_4_ = fStack_a90;
    auVar98._20_4_ = fStack_a8c;
    auVar98._24_4_ = fStack_a88;
    auVar98._28_4_ = fStack_a84;
    auVar135 = vperm2f128_avx(auVar98,auVar98,1);
    auVar135 = vshufps_avx(auVar135,auVar98,0x30);
    local_6e0 = vshufps_avx(auVar98,auVar135,0x29);
    _local_7a0 = vsubps_avx(local_6e0,auVar98);
    auVar46._4_4_ = fVar241 * fVar337;
    auVar46._0_4_ = fVar239 * fVar325;
    auVar46._8_4_ = fVar262 * fVar338;
    auVar46._12_4_ = fVar290 * fVar339;
    auVar46._16_4_ = fVar293 * fVar340;
    auVar46._20_4_ = fVar315 * fVar341;
    auVar46._24_4_ = fVar414 * fVar342;
    auVar46._28_4_ = auVar135._28_4_;
    fVar114 = local_7a0._0_4_;
    fVar242 = local_7a0._4_4_;
    auVar47._4_4_ = fVar402 * fVar242;
    auVar47._0_4_ = fVar397 * fVar114;
    fVar263 = local_7a0._8_4_;
    auVar47._8_4_ = fVar404 * fVar263;
    fVar292 = local_7a0._12_4_;
    auVar47._12_4_ = fVar406 * fVar292;
    fVar295 = local_7a0._16_4_;
    auVar47._16_4_ = fVar408 * fVar295;
    fVar317 = local_7a0._20_4_;
    auVar47._20_4_ = fVar410 * fVar317;
    fVar39 = local_7a0._24_4_;
    auVar47._24_4_ = fVar412 * fVar39;
    auVar47._28_4_ = fStack_a84;
    auVar214 = vsubps_avx(auVar47,auVar46);
    auVar48._4_4_ = fVar389 * fVar242;
    auVar48._0_4_ = fVar381 * fVar114;
    auVar48._8_4_ = fVar390 * fVar263;
    auVar48._12_4_ = fVar391 * fVar292;
    auVar48._16_4_ = fVar392 * fVar295;
    auVar48._20_4_ = fVar393 * fVar317;
    auVar48._24_4_ = fVar394 * fVar39;
    auVar48._28_4_ = fStack_a84;
    auVar49._4_4_ = fVar191 * fVar337;
    auVar49._0_4_ = fVar113 * fVar325;
    auVar49._8_4_ = fVar261 * fVar338;
    auVar49._12_4_ = fVar289 * fVar339;
    auVar49._16_4_ = fVar291 * fVar340;
    auVar49._20_4_ = fVar314 * fVar341;
    auVar49._24_4_ = fVar380 * fVar342;
    auVar49._28_4_ = auVar365._28_4_;
    auVar37 = vsubps_avx(auVar49,auVar48);
    fVar221 = auVar37._28_4_;
    auVar213._0_4_ = fVar114 * fVar114 + fVar113 * fVar113 + fVar239 * fVar239;
    auVar213._4_4_ = fVar242 * fVar242 + fVar191 * fVar191 + fVar241 * fVar241;
    auVar213._8_4_ = fVar263 * fVar263 + fVar261 * fVar261 + fVar262 * fVar262;
    auVar213._12_4_ = fVar292 * fVar292 + fVar289 * fVar289 + fVar290 * fVar290;
    auVar213._16_4_ = fVar295 * fVar295 + fVar291 * fVar291 + fVar293 * fVar293;
    auVar213._20_4_ = fVar317 * fVar317 + fVar314 * fVar314 + fVar315 * fVar315;
    auVar213._24_4_ = fVar39 * fVar39 + fVar380 * fVar380 + fVar414 * fVar414;
    auVar213._28_4_ = fVar221 + fVar221 + auVar36._28_4_;
    auVar135 = vrcpps_avx(auVar213);
    fVar298 = auVar135._0_4_;
    fVar299 = auVar135._4_4_;
    auVar50._4_4_ = fVar299 * auVar213._4_4_;
    auVar50._0_4_ = fVar298 * auVar213._0_4_;
    fVar300 = auVar135._8_4_;
    auVar50._8_4_ = fVar300 * auVar213._8_4_;
    fVar321 = auVar135._12_4_;
    auVar50._12_4_ = fVar321 * auVar213._12_4_;
    fVar323 = auVar135._16_4_;
    auVar50._16_4_ = fVar323 * auVar213._16_4_;
    fVar265 = auVar135._20_4_;
    auVar50._20_4_ = fVar265 * auVar213._20_4_;
    fVar267 = auVar135._24_4_;
    auVar50._24_4_ = fVar267 * auVar213._24_4_;
    auVar50._28_4_ = auVar365._28_4_;
    auVar418._8_4_ = 0x3f800000;
    auVar418._0_8_ = &DAT_3f8000003f800000;
    auVar418._12_4_ = 0x3f800000;
    auVar418._16_4_ = 0x3f800000;
    auVar418._20_4_ = 0x3f800000;
    auVar418._24_4_ = 0x3f800000;
    auVar418._28_4_ = 0x3f800000;
    auVar359 = vsubps_avx(auVar418,auVar50);
    fVar298 = auVar359._0_4_ * fVar298 + fVar298;
    fVar299 = auVar359._4_4_ * fVar299 + fVar299;
    fVar300 = auVar359._8_4_ * fVar300 + fVar300;
    fVar321 = auVar359._12_4_ * fVar321 + fVar321;
    fVar323 = auVar359._16_4_ * fVar323 + fVar323;
    fVar265 = auVar359._20_4_ * fVar265 + fVar265;
    fVar267 = auVar359._24_4_ * fVar267 + fVar267;
    auVar174 = vperm2f128_avx(local_860,local_860,1);
    auVar174 = vshufps_avx(auVar174,local_860,0x30);
    local_960 = vshufps_avx(local_860,auVar174,0x29);
    auVar174 = vperm2f128_avx(local_a00,local_a00,1);
    auVar174 = vshufps_avx(auVar174,local_a00,0x30);
    local_980 = vshufps_avx(local_a00,auVar174,0x29);
    fVar398 = local_980._0_4_;
    fVar403 = local_980._4_4_;
    auVar51._4_4_ = fVar403 * fVar191;
    auVar51._0_4_ = fVar398 * fVar113;
    fVar405 = local_980._8_4_;
    auVar51._8_4_ = fVar405 * fVar261;
    fVar407 = local_980._12_4_;
    auVar51._12_4_ = fVar407 * fVar289;
    fVar409 = local_980._16_4_;
    auVar51._16_4_ = fVar409 * fVar291;
    fVar411 = local_980._20_4_;
    auVar51._20_4_ = fVar411 * fVar314;
    fVar413 = local_980._24_4_;
    auVar51._24_4_ = fVar413 * fVar380;
    auVar51._28_4_ = auVar174._28_4_;
    fVar415 = local_960._0_4_;
    fVar420 = local_960._4_4_;
    auVar52._4_4_ = fVar420 * fVar241;
    auVar52._0_4_ = fVar415 * fVar239;
    fVar421 = local_960._8_4_;
    auVar52._8_4_ = fVar421 * fVar262;
    fVar422 = local_960._12_4_;
    auVar52._12_4_ = fVar422 * fVar290;
    fVar423 = local_960._16_4_;
    auVar52._16_4_ = fVar423 * fVar293;
    fVar424 = local_960._20_4_;
    auVar52._20_4_ = fVar424 * fVar315;
    fVar425 = local_960._24_4_;
    auVar52._24_4_ = fVar425 * fVar414;
    auVar52._28_4_ = fVar395;
    auVar427 = vsubps_avx(auVar52,auVar51);
    auVar174 = vperm2f128_avx(_local_8c0,_local_8c0,1);
    auVar174 = vshufps_avx(auVar174,_local_8c0,0x30);
    local_880 = vshufps_avx(_local_8c0,auVar174,0x29);
    fVar220 = local_880._0_4_;
    fVar243 = local_880._4_4_;
    auVar53._4_4_ = fVar241 * fVar243;
    auVar53._0_4_ = fVar239 * fVar220;
    fVar264 = local_880._8_4_;
    auVar53._8_4_ = fVar262 * fVar264;
    fVar294 = local_880._12_4_;
    auVar53._12_4_ = fVar290 * fVar294;
    fVar297 = local_880._16_4_;
    auVar53._16_4_ = fVar293 * fVar297;
    fVar319 = local_880._20_4_;
    auVar53._20_4_ = fVar315 * fVar319;
    fVar395 = local_880._24_4_;
    auVar53._24_4_ = fVar414 * fVar395;
    auVar53._28_4_ = auVar174._28_4_;
    auVar54._4_4_ = fVar403 * fVar242;
    auVar54._0_4_ = fVar398 * fVar114;
    auVar54._8_4_ = fVar405 * fVar263;
    auVar54._12_4_ = fVar407 * fVar292;
    auVar54._16_4_ = fVar409 * fVar295;
    auVar54._20_4_ = fVar411 * fVar317;
    uVar104 = local_980._28_4_;
    auVar54._24_4_ = fVar413 * fVar39;
    auVar54._28_4_ = uVar104;
    auVar174 = vsubps_avx(auVar54,auVar53);
    auVar55._4_4_ = fVar420 * fVar242;
    auVar55._0_4_ = fVar415 * fVar114;
    auVar55._8_4_ = fVar421 * fVar263;
    auVar55._12_4_ = fVar422 * fVar292;
    auVar55._16_4_ = fVar423 * fVar295;
    auVar55._20_4_ = fVar424 * fVar317;
    auVar55._24_4_ = fVar425 * fVar39;
    auVar55._28_4_ = uVar104;
    auVar56._4_4_ = fVar191 * fVar243;
    auVar56._0_4_ = fVar113 * fVar220;
    auVar56._8_4_ = fVar261 * fVar264;
    auVar56._12_4_ = fVar289 * fVar294;
    auVar56._16_4_ = fVar291 * fVar297;
    auVar56._20_4_ = fVar314 * fVar319;
    auVar56._24_4_ = fVar380 * fVar395;
    auVar56._28_4_ = local_960._28_4_;
    auVar38 = vsubps_avx(auVar56,auVar55);
    fVar187 = auVar38._28_4_;
    fVar396 = auVar174._28_4_ + fVar187;
    auVar57._4_4_ =
         (auVar36._4_4_ * auVar36._4_4_ +
         auVar214._4_4_ * auVar214._4_4_ + auVar37._4_4_ * auVar37._4_4_) * fVar299;
    auVar57._0_4_ =
         (auVar36._0_4_ * auVar36._0_4_ +
         auVar214._0_4_ * auVar214._0_4_ + auVar37._0_4_ * auVar37._0_4_) * fVar298;
    auVar57._8_4_ =
         (auVar36._8_4_ * auVar36._8_4_ +
         auVar214._8_4_ * auVar214._8_4_ + auVar37._8_4_ * auVar37._8_4_) * fVar300;
    auVar57._12_4_ =
         (auVar36._12_4_ * auVar36._12_4_ +
         auVar214._12_4_ * auVar214._12_4_ + auVar37._12_4_ * auVar37._12_4_) * fVar321;
    auVar57._16_4_ =
         (auVar36._16_4_ * auVar36._16_4_ +
         auVar214._16_4_ * auVar214._16_4_ + auVar37._16_4_ * auVar37._16_4_) * fVar323;
    auVar57._20_4_ =
         (auVar36._20_4_ * auVar36._20_4_ +
         auVar214._20_4_ * auVar214._20_4_ + auVar37._20_4_ * auVar37._20_4_) * fVar265;
    auVar57._24_4_ =
         (auVar36._24_4_ * auVar36._24_4_ +
         auVar214._24_4_ * auVar214._24_4_ + auVar37._24_4_ * auVar37._24_4_) * fVar267;
    auVar57._28_4_ = auVar36._28_4_ + auVar214._28_4_ + fVar221;
    auVar58._4_4_ =
         (auVar427._4_4_ * auVar427._4_4_ +
         auVar174._4_4_ * auVar174._4_4_ + auVar38._4_4_ * auVar38._4_4_) * fVar299;
    auVar58._0_4_ =
         (auVar427._0_4_ * auVar427._0_4_ +
         auVar174._0_4_ * auVar174._0_4_ + auVar38._0_4_ * auVar38._0_4_) * fVar298;
    auVar58._8_4_ =
         (auVar427._8_4_ * auVar427._8_4_ +
         auVar174._8_4_ * auVar174._8_4_ + auVar38._8_4_ * auVar38._8_4_) * fVar300;
    auVar58._12_4_ =
         (auVar427._12_4_ * auVar427._12_4_ +
         auVar174._12_4_ * auVar174._12_4_ + auVar38._12_4_ * auVar38._12_4_) * fVar321;
    auVar58._16_4_ =
         (auVar427._16_4_ * auVar427._16_4_ +
         auVar174._16_4_ * auVar174._16_4_ + auVar38._16_4_ * auVar38._16_4_) * fVar323;
    auVar58._20_4_ =
         (auVar427._20_4_ * auVar427._20_4_ +
         auVar174._20_4_ * auVar174._20_4_ + auVar38._20_4_ * auVar38._20_4_) * fVar265;
    auVar58._24_4_ =
         (auVar427._24_4_ * auVar427._24_4_ +
         auVar174._24_4_ * auVar174._24_4_ + auVar38._24_4_ * auVar38._24_4_) * fVar267;
    auVar58._28_4_ = auVar359._28_4_ + auVar135._28_4_;
    local_ae0 = vmaxps_avx(auVar57,auVar58);
    auVar135 = vperm2f128_avx(_local_840,_local_840,1);
    auVar135 = vshufps_avx(auVar135,_local_840,0x30);
    local_700 = vshufps_avx(_local_840,auVar135,0x29);
    local_720._0_4_ = (float)local_840._0_4_ + fVar145;
    local_720._4_4_ = (float)local_840._4_4_ + fVar240;
    local_720._8_4_ = fStack_838 + fVar244;
    local_720._12_4_ = fStack_834 + fVar260;
    local_720._16_4_ = fStack_830 + fVar266;
    local_720._20_4_ = fStack_82c + fVar268;
    local_720._24_4_ = fStack_828 + fVar296;
    local_720._28_4_ = fStack_824 + auVar35._28_4_;
    auVar135 = vmaxps_avx(_local_840,local_720);
    auVar174 = vmaxps_avx(local_800,local_700);
    auVar135 = vmaxps_avx(auVar135,auVar174);
    auVar174 = vrsqrtps_avx(auVar213);
    fVar221 = auVar174._0_4_;
    fVar145 = auVar174._4_4_;
    fVar240 = auVar174._8_4_;
    fVar244 = auVar174._12_4_;
    fVar260 = auVar174._16_4_;
    fVar266 = auVar174._20_4_;
    fVar268 = auVar174._24_4_;
    local_5e0._0_4_ = fVar221 * 1.5 + fVar221 * fVar221 * fVar221 * auVar213._0_4_ * -0.5;
    local_5e0._4_4_ = fVar145 * 1.5 + fVar145 * fVar145 * fVar145 * auVar213._4_4_ * -0.5;
    local_5e0._8_4_ = fVar240 * 1.5 + fVar240 * fVar240 * fVar240 * auVar213._8_4_ * -0.5;
    local_5e0._12_4_ = fVar244 * 1.5 + fVar244 * fVar244 * fVar244 * auVar213._12_4_ * -0.5;
    local_5e0._16_4_ = fVar260 * 1.5 + fVar260 * fVar260 * fVar260 * auVar213._16_4_ * -0.5;
    local_5e0._20_4_ = fVar266 * 1.5 + fVar266 * fVar266 * fVar266 * auVar213._20_4_ * -0.5;
    local_5e0._24_4_ = fVar268 * 1.5 + fVar268 * fVar268 * fVar268 * auVar213._24_4_ * -0.5;
    local_5e0._28_4_ = auVar174._28_4_ + auVar213._28_4_;
    auVar174 = vsubps_avx(ZEXT832(0) << 0x20,_local_680);
    auVar35 = vsubps_avx(ZEXT832(0) << 0x20,_local_560);
    fVar145 = auVar35._0_4_;
    fVar244 = auVar35._4_4_;
    fVar266 = auVar35._8_4_;
    fVar296 = auVar35._12_4_;
    fVar299 = auVar35._16_4_;
    fVar321 = auVar35._20_4_;
    fVar265 = auVar35._24_4_;
    fVar426 = auVar174._0_4_;
    fVar428 = auVar174._4_4_;
    fVar429 = auVar174._8_4_;
    fVar430 = auVar174._12_4_;
    fVar431 = auVar174._16_4_;
    fVar432 = auVar174._20_4_;
    fVar433 = auVar174._24_4_;
    auVar99._4_4_ = fStack_a9c;
    auVar99._0_4_ = local_aa0;
    auVar99._8_4_ = fStack_a98;
    auVar99._12_4_ = fStack_a94;
    auVar99._16_4_ = fStack_a90;
    auVar99._20_4_ = fStack_a8c;
    auVar99._24_4_ = fStack_a88;
    auVar99._28_4_ = fStack_a84;
    auVar214 = ZEXT832(0) << 0x20;
    auVar174 = vsubps_avx(auVar214,auVar99);
    fVar240 = auVar174._0_4_;
    fVar260 = auVar174._4_4_;
    fVar268 = auVar174._8_4_;
    fVar298 = auVar174._12_4_;
    fVar300 = auVar174._16_4_;
    fVar323 = auVar174._20_4_;
    fVar267 = auVar174._24_4_;
    auVar366._0_4_ = local_500 * fVar240 + fVar426 * local_520 + local_540 * fVar145;
    auVar366._4_4_ = fStack_4fc * fVar260 + fVar428 * fStack_51c + fStack_53c * fVar244;
    auVar366._8_4_ = fStack_4f8 * fVar268 + fVar429 * fStack_518 + fStack_538 * fVar266;
    auVar366._12_4_ = fStack_4f4 * fVar298 + fVar430 * fStack_514 + fStack_534 * fVar296;
    auVar366._16_4_ = fStack_4f0 * fVar300 + fVar431 * fStack_510 + fStack_530 * fVar299;
    auVar366._20_4_ = fStack_4ec * fVar323 + fVar432 * fStack_50c + fStack_52c * fVar321;
    auVar366._24_4_ = fStack_4e8 * fVar267 + fVar433 * fStack_508 + fStack_528 * fVar265;
    auVar366._28_4_ = fVar396 + auVar427._28_4_ + fVar396 + 1.5;
    auVar386._0_4_ = fVar240 * fVar240 + fVar426 * fVar426 + fVar145 * fVar145;
    auVar386._4_4_ = fVar260 * fVar260 + fVar428 * fVar428 + fVar244 * fVar244;
    auVar386._8_4_ = fVar268 * fVar268 + fVar429 * fVar429 + fVar266 * fVar266;
    auVar386._12_4_ = fVar298 * fVar298 + fVar430 * fVar430 + fVar296 * fVar296;
    auVar386._16_4_ = fVar300 * fVar300 + fVar431 * fVar431 + fVar299 * fVar299;
    auVar386._20_4_ = fVar323 * fVar323 + fVar432 * fVar432 + fVar321 * fVar321;
    auVar386._24_4_ = fVar267 * fVar267 + fVar433 * fVar433 + fVar265 * fVar265;
    auVar386._28_4_ = fVar187 + fVar187 + fVar396;
    auVar379 = ZEXT3264(local_5e0);
    local_a20._0_4_ =
         local_500 * local_5e0._0_4_ * fVar114 +
         fVar113 * local_5e0._0_4_ * local_520 + fVar239 * local_5e0._0_4_ * local_540;
    local_a20._4_4_ =
         fStack_4fc * local_5e0._4_4_ * fVar242 +
         fVar191 * local_5e0._4_4_ * fStack_51c + fVar241 * local_5e0._4_4_ * fStack_53c;
    fStack_a18 = fStack_4f8 * local_5e0._8_4_ * fVar263 +
                 fVar261 * local_5e0._8_4_ * fStack_518 + fVar262 * local_5e0._8_4_ * fStack_538;
    fStack_a14 = fStack_4f4 * local_5e0._12_4_ * fVar292 +
                 fVar289 * local_5e0._12_4_ * fStack_514 + fVar290 * local_5e0._12_4_ * fStack_534;
    fStack_a10 = fStack_4f0 * local_5e0._16_4_ * fVar295 +
                 fVar291 * local_5e0._16_4_ * fStack_510 + fVar293 * local_5e0._16_4_ * fStack_530;
    fStack_a0c = fStack_4ec * local_5e0._20_4_ * fVar317 +
                 fVar314 * local_5e0._20_4_ * fStack_50c + fVar315 * local_5e0._20_4_ * fStack_52c;
    fStack_a08 = fStack_4e8 * local_5e0._24_4_ * fVar39 +
                 fVar380 * local_5e0._24_4_ * fStack_508 + fVar414 * local_5e0._24_4_ * fStack_528;
    fStack_a04 = fStack_4e4 + fStack_504 + fStack_524;
    fVar221 = fStack_4e4 + fStack_504 + fStack_524;
    local_6c0._0_4_ =
         fVar240 * local_5e0._0_4_ * fVar114 +
         fVar426 * fVar113 * local_5e0._0_4_ + fVar239 * local_5e0._0_4_ * fVar145;
    local_6c0._4_4_ =
         fVar260 * local_5e0._4_4_ * fVar242 +
         fVar428 * fVar191 * local_5e0._4_4_ + fVar241 * local_5e0._4_4_ * fVar244;
    fStack_6b8 = fVar268 * local_5e0._8_4_ * fVar263 +
                 fVar429 * fVar261 * local_5e0._8_4_ + fVar262 * local_5e0._8_4_ * fVar266;
    fStack_6b4 = fVar298 * local_5e0._12_4_ * fVar292 +
                 fVar430 * fVar289 * local_5e0._12_4_ + fVar290 * local_5e0._12_4_ * fVar296;
    fStack_6b0 = fVar300 * local_5e0._16_4_ * fVar295 +
                 fVar431 * fVar291 * local_5e0._16_4_ + fVar293 * local_5e0._16_4_ * fVar299;
    fStack_6ac = fVar323 * local_5e0._20_4_ * fVar317 +
                 fVar432 * fVar314 * local_5e0._20_4_ + fVar315 * local_5e0._20_4_ * fVar321;
    fStack_6a8 = fVar267 * local_5e0._24_4_ * fVar39 +
                 fVar433 * fVar380 * local_5e0._24_4_ + fVar414 * local_5e0._24_4_ * fVar265;
    fStack_6a4 = fStack_504 + fVar221;
    auVar59._4_4_ = (float)local_6c0._4_4_ * (float)local_a20._4_4_;
    auVar59._0_4_ = (float)local_6c0._0_4_ * (float)local_a20._0_4_;
    auVar59._8_4_ = fStack_6b8 * fStack_a18;
    auVar59._12_4_ = fStack_6b4 * fStack_a14;
    auVar59._16_4_ = fStack_6b0 * fStack_a10;
    auVar59._20_4_ = fStack_6ac * fStack_a0c;
    auVar59._24_4_ = fStack_6a8 * fStack_a08;
    auVar59._28_4_ = fVar221;
    auVar36 = vsubps_avx(auVar366,auVar59);
    auVar60._4_4_ = (float)local_6c0._4_4_ * (float)local_6c0._4_4_;
    auVar60._0_4_ = (float)local_6c0._0_4_ * (float)local_6c0._0_4_;
    auVar60._8_4_ = fStack_6b8 * fStack_6b8;
    auVar60._12_4_ = fStack_6b4 * fStack_6b4;
    auVar60._16_4_ = fStack_6b0 * fStack_6b0;
    auVar60._20_4_ = fStack_6ac * fStack_6ac;
    auVar60._24_4_ = fStack_6a8 * fStack_6a8;
    auVar60._28_4_ = fStack_504;
    _local_740 = vsubps_avx(auVar386,auVar60);
    _local_8a0 = vsqrtps_avx(local_ae0);
    auVar313 = ZEXT3264(CONCAT428(0x3f800002,
                                  CONCAT424(0x3f800002,
                                            CONCAT420(0x3f800002,
                                                      CONCAT416(0x3f800002,
                                                                CONCAT412(0x3f800002,
                                                                          CONCAT48(0x3f800002,
                                                                                                                                                                      
                                                  0x3f8000023f800002)))))));
    fVar221 = (local_8a0._0_4_ + auVar135._0_4_) * 1.0000002;
    fVar187 = (local_8a0._4_4_ + auVar135._4_4_) * 1.0000002;
    fVar396 = (local_8a0._8_4_ + auVar135._8_4_) * 1.0000002;
    fVar194 = (local_8a0._12_4_ + auVar135._12_4_) * 1.0000002;
    fVar196 = (local_8a0._16_4_ + auVar135._16_4_) * 1.0000002;
    fVar198 = (local_8a0._20_4_ + auVar135._20_4_) * 1.0000002;
    fVar200 = (local_8a0._24_4_ + auVar135._24_4_) * 1.0000002;
    auVar61._4_4_ = fVar187 * fVar187;
    auVar61._0_4_ = fVar221 * fVar221;
    auVar61._8_4_ = fVar396 * fVar396;
    auVar61._12_4_ = fVar194 * fVar194;
    auVar61._16_4_ = fVar196 * fVar196;
    auVar61._20_4_ = fVar198 * fVar198;
    auVar61._24_4_ = fVar200 * fVar200;
    auVar61._28_4_ = local_8a0._28_4_ + auVar135._28_4_;
    fVar194 = auVar36._0_4_ + auVar36._0_4_;
    fVar196 = auVar36._4_4_ + auVar36._4_4_;
    local_8e0._0_8_ = CONCAT44(fVar196,fVar194);
    local_8e0._8_4_ = auVar36._8_4_ + auVar36._8_4_;
    local_8e0._12_4_ = auVar36._12_4_ + auVar36._12_4_;
    local_8e0._16_4_ = auVar36._16_4_ + auVar36._16_4_;
    local_8e0._20_4_ = auVar36._20_4_ + auVar36._20_4_;
    local_8e0._24_4_ = auVar36._24_4_ + auVar36._24_4_;
    fVar221 = auVar36._28_4_;
    local_8e0._28_4_ = fVar221 + fVar221;
    auVar135 = vsubps_avx(_local_740,auVar61);
    local_5a0._4_4_ = (float)local_a20._4_4_ * (float)local_a20._4_4_;
    local_5a0._0_4_ = (float)local_a20._0_4_ * (float)local_a20._0_4_;
    local_5a0._8_4_ = fStack_a18 * fStack_a18;
    local_5a0._12_4_ = fStack_a14 * fStack_a14;
    local_5a0._16_4_ = fStack_a10 * fStack_a10;
    local_5a0._20_4_ = fStack_a0c * fStack_a0c;
    local_5a0._24_4_ = fStack_a08 * fStack_a08;
    local_5a0._28_4_ = fStack_544;
    local_660 = vsubps_avx(local_2a0,local_5a0);
    local_780._4_4_ = fVar196 * fVar196;
    local_780._0_4_ = fVar194 * fVar194;
    local_780._8_4_ = local_8e0._8_4_ * local_8e0._8_4_;
    local_780._12_4_ = local_8e0._12_4_ * local_8e0._12_4_;
    local_780._16_4_ = local_8e0._16_4_ * local_8e0._16_4_;
    local_780._20_4_ = local_8e0._20_4_ * local_8e0._20_4_;
    local_780._24_4_ = local_8e0._24_4_ * local_8e0._24_4_;
    local_780._28_4_ = fVar221;
    fVar198 = local_660._0_4_;
    fVar187 = fVar198 * 4.0;
    fVar200 = local_660._4_4_;
    fVar396 = fVar200 * 4.0;
    fVar367 = local_660._8_4_;
    fStack_638 = fVar367 * 4.0;
    fVar368 = local_660._12_4_;
    fStack_634 = fVar368 * 4.0;
    fVar369 = local_660._16_4_;
    fStack_630 = fVar369 * 4.0;
    fVar370 = local_660._20_4_;
    fStack_62c = fVar370 * 4.0;
    fVar371 = local_660._24_4_;
    fStack_628 = fVar371 * 4.0;
    local_640 = CONCAT44(fVar396,fVar187);
    uStack_624 = 0x40800000;
    auVar62._4_4_ = auVar135._4_4_ * fVar396;
    auVar62._0_4_ = auVar135._0_4_ * fVar187;
    auVar62._8_4_ = auVar135._8_4_ * fStack_638;
    auVar62._12_4_ = auVar135._12_4_ * fStack_634;
    auVar62._16_4_ = auVar135._16_4_ * fStack_630;
    auVar62._20_4_ = auVar135._20_4_ * fStack_62c;
    auVar62._24_4_ = auVar135._24_4_ * fStack_628;
    auVar62._28_4_ = 0x40800000;
    auVar36 = vsubps_avx(local_780,auVar62);
    local_ae0 = vcmpps_avx(auVar36,auVar214,5);
    fVar221 = local_660._28_4_;
    if ((((((((local_ae0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_ae0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_ae0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_ae0 >> 0x7f,0) == '\0') &&
          (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_ae0 >> 0xbf,0) == '\0') &&
        (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_ae0[0x1f]) {
      auVar167._8_4_ = 0x7f800000;
      auVar167._0_8_ = 0x7f8000007f800000;
      auVar167._12_4_ = 0x7f800000;
      auVar167._16_4_ = 0x7f800000;
      auVar167._20_4_ = 0x7f800000;
      auVar167._24_4_ = 0x7f800000;
      auVar167._28_4_ = 0x7f800000;
      auVar387._8_4_ = 0xff800000;
      auVar387._0_8_ = 0xff800000ff800000;
      auVar387._12_4_ = 0xff800000;
      auVar387._16_4_ = 0xff800000;
      auVar387._20_4_ = 0xff800000;
      auVar387._24_4_ = 0xff800000;
      auVar387._28_4_ = 0xff800000;
      fVar194 = 0.0;
    }
    else {
      auVar359 = vsqrtps_avx(auVar36);
      auVar306._0_4_ = fVar198 + fVar198;
      auVar306._4_4_ = fVar200 + fVar200;
      auVar306._8_4_ = fVar367 + fVar367;
      auVar306._12_4_ = fVar368 + fVar368;
      auVar306._16_4_ = fVar369 + fVar369;
      auVar306._20_4_ = fVar370 + fVar370;
      auVar306._24_4_ = fVar371 + fVar371;
      auVar306._28_4_ = fVar221 + fVar221;
      auVar37 = vrcpps_avx(auVar306);
      auVar214 = vcmpps_avx(auVar36,auVar214,5);
      fVar146 = auVar37._0_4_;
      fVar188 = auVar37._4_4_;
      auVar63._4_4_ = auVar306._4_4_ * fVar188;
      auVar63._0_4_ = auVar306._0_4_ * fVar146;
      fVar190 = auVar37._8_4_;
      auVar63._8_4_ = auVar306._8_4_ * fVar190;
      fVar195 = auVar37._12_4_;
      auVar63._12_4_ = auVar306._12_4_ * fVar195;
      fVar197 = auVar37._16_4_;
      auVar63._16_4_ = auVar306._16_4_ * fVar197;
      fVar199 = auVar37._20_4_;
      auVar63._20_4_ = auVar306._20_4_ * fVar199;
      fVar201 = auVar37._24_4_;
      auVar63._24_4_ = auVar306._24_4_ * fVar201;
      auVar63._28_4_ = auVar36._28_4_;
      auVar131._8_4_ = 0x3f800000;
      auVar131._0_8_ = &DAT_3f8000003f800000;
      auVar131._12_4_ = 0x3f800000;
      auVar131._16_4_ = 0x3f800000;
      auVar131._20_4_ = 0x3f800000;
      auVar131._24_4_ = 0x3f800000;
      auVar131._28_4_ = 0x3f800000;
      auVar36 = vsubps_avx(auVar131,auVar63);
      fVar146 = fVar146 + fVar146 * auVar36._0_4_;
      fVar188 = fVar188 + fVar188 * auVar36._4_4_;
      fVar190 = fVar190 + fVar190 * auVar36._8_4_;
      fVar195 = fVar195 + fVar195 * auVar36._12_4_;
      fVar197 = fVar197 + fVar197 * auVar36._16_4_;
      fVar199 = fVar199 + fVar199 * auVar36._20_4_;
      fVar201 = fVar201 + fVar201 * auVar36._24_4_;
      auVar307._0_8_ = CONCAT44(fVar196,fVar194) ^ 0x8000000080000000;
      auVar307._8_4_ = -local_8e0._8_4_;
      auVar307._12_4_ = -local_8e0._12_4_;
      auVar307._16_4_ = -local_8e0._16_4_;
      auVar307._20_4_ = -local_8e0._20_4_;
      auVar307._24_4_ = -local_8e0._24_4_;
      auVar307._28_4_ = -local_8e0._28_4_;
      auVar427 = vsubps_avx(auVar307,auVar359);
      fVar194 = auVar427._0_4_ * fVar146;
      fVar196 = auVar427._4_4_ * fVar188;
      auVar64._4_4_ = fVar196;
      auVar64._0_4_ = fVar194;
      fVar316 = auVar427._8_4_ * fVar190;
      auVar64._8_4_ = fVar316;
      fVar318 = auVar427._12_4_ * fVar195;
      auVar64._12_4_ = fVar318;
      fVar320 = auVar427._16_4_ * fVar197;
      auVar64._16_4_ = fVar320;
      fVar322 = auVar427._20_4_ * fVar199;
      auVar64._20_4_ = fVar322;
      fVar324 = auVar427._24_4_ * fVar201;
      auVar64._24_4_ = fVar324;
      auVar64._28_4_ = auVar427._28_4_;
      auVar359 = vsubps_avx(auVar359,local_8e0);
      fVar146 = auVar359._0_4_ * fVar146;
      fVar188 = auVar359._4_4_ * fVar188;
      auVar65._4_4_ = fVar188;
      auVar65._0_4_ = fVar146;
      fVar190 = auVar359._8_4_ * fVar190;
      auVar65._8_4_ = fVar190;
      fVar195 = auVar359._12_4_ * fVar195;
      auVar65._12_4_ = fVar195;
      fVar197 = auVar359._16_4_ * fVar197;
      auVar65._16_4_ = fVar197;
      fVar199 = auVar359._20_4_ * fVar199;
      auVar65._20_4_ = fVar199;
      fVar201 = auVar359._24_4_ * fVar201;
      auVar65._24_4_ = fVar201;
      auVar65._28_4_ = auVar359._28_4_;
      fStack_4a4 = fStack_6a4 + auVar37._28_4_ + auVar36._28_4_;
      local_4c0[0] = local_5e0._0_4_ * ((float)local_6c0._0_4_ + (float)local_a20._0_4_ * fVar194);
      local_4c0[1] = local_5e0._4_4_ * ((float)local_6c0._4_4_ + (float)local_a20._4_4_ * fVar196);
      local_4c0[2] = local_5e0._8_4_ * (fStack_6b8 + fStack_a18 * fVar316);
      local_4c0[3] = local_5e0._12_4_ * (fStack_6b4 + fStack_a14 * fVar318);
      fStack_4b0 = local_5e0._16_4_ * (fStack_6b0 + fStack_a10 * fVar320);
      fStack_4ac = local_5e0._20_4_ * (fStack_6ac + fStack_a0c * fVar322);
      fStack_4a8 = local_5e0._24_4_ * (fStack_6a8 + fStack_a08 * fVar324);
      local_4e0[0] = local_5e0._0_4_ * ((float)local_6c0._0_4_ + (float)local_a20._0_4_ * fVar146);
      local_4e0[1] = local_5e0._4_4_ * ((float)local_6c0._4_4_ + (float)local_a20._4_4_ * fVar188);
      local_4e0[2] = local_5e0._8_4_ * (fStack_6b8 + fStack_a18 * fVar190);
      local_4e0[3] = local_5e0._12_4_ * (fStack_6b4 + fStack_a14 * fVar195);
      fStack_4d0 = local_5e0._16_4_ * (fStack_6b0 + fStack_a10 * fVar197);
      fStack_4cc = local_5e0._20_4_ * (fStack_6ac + fStack_a0c * fVar199);
      fStack_4c8 = local_5e0._24_4_ * (fStack_6a8 + fStack_a08 * fVar201);
      fStack_4c4 = fStack_6a4 + fStack_4a4;
      auVar168._8_4_ = 0x7f800000;
      auVar168._0_8_ = 0x7f8000007f800000;
      auVar168._12_4_ = 0x7f800000;
      auVar168._16_4_ = 0x7f800000;
      auVar168._20_4_ = 0x7f800000;
      auVar168._24_4_ = 0x7f800000;
      auVar168._28_4_ = 0x7f800000;
      auVar167 = vblendvps_avx(auVar168,auVar64,auVar214);
      auVar332._8_4_ = 0x7fffffff;
      auVar332._0_8_ = 0x7fffffff7fffffff;
      auVar332._12_4_ = 0x7fffffff;
      auVar332._16_4_ = 0x7fffffff;
      auVar332._20_4_ = 0x7fffffff;
      auVar332._24_4_ = 0x7fffffff;
      auVar332._28_4_ = 0x7fffffff;
      auVar36 = vandps_avx(local_5a0,auVar332);
      auVar36 = vmaxps_avx(local_400,auVar36);
      auVar66._4_4_ = auVar36._4_4_ * 1.9073486e-06;
      auVar66._0_4_ = auVar36._0_4_ * 1.9073486e-06;
      auVar66._8_4_ = auVar36._8_4_ * 1.9073486e-06;
      auVar66._12_4_ = auVar36._12_4_ * 1.9073486e-06;
      auVar66._16_4_ = auVar36._16_4_ * 1.9073486e-06;
      auVar66._20_4_ = auVar36._20_4_ * 1.9073486e-06;
      auVar66._24_4_ = auVar36._24_4_ * 1.9073486e-06;
      auVar66._28_4_ = auVar36._28_4_;
      auVar36 = vandps_avx(local_660,auVar332);
      auVar36 = vcmpps_avx(auVar36,auVar66,1);
      auVar308._8_4_ = 0xff800000;
      auVar308._0_8_ = 0xff800000ff800000;
      auVar308._12_4_ = 0xff800000;
      auVar308._16_4_ = 0xff800000;
      auVar308._20_4_ = 0xff800000;
      auVar308._24_4_ = 0xff800000;
      auVar308._28_4_ = 0xff800000;
      auVar313 = ZEXT3264(auVar308);
      auVar387 = vblendvps_avx(auVar308,auVar65,auVar214);
      auVar37 = auVar214 & auVar36;
      fVar194 = fStack_6a4;
      if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar37 >> 0x7f,0) != '\0') ||
            (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar37 >> 0xbf,0) != '\0') ||
          (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar37[0x1f] < '\0') {
        auVar36 = vandps_avx(auVar36,auVar214);
        auVar160 = vpackssdw_avx(auVar36._0_16_,auVar36._16_16_);
        auVar359 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar37 = vcmpps_avx(auVar135,auVar359,2);
        auVar139._8_4_ = 0xff800000;
        auVar139._0_8_ = 0xff800000ff800000;
        auVar139._12_4_ = 0xff800000;
        auVar139._16_4_ = 0xff800000;
        auVar139._20_4_ = 0xff800000;
        auVar139._24_4_ = 0xff800000;
        auVar139._28_4_ = 0xff800000;
        auVar351._8_4_ = 0x7f800000;
        auVar351._0_8_ = 0x7f8000007f800000;
        auVar351._12_4_ = 0x7f800000;
        auVar351._16_4_ = 0x7f800000;
        auVar351._20_4_ = 0x7f800000;
        auVar351._24_4_ = 0x7f800000;
        auVar351._28_4_ = 0x7f800000;
        auVar135 = vblendvps_avx(auVar351,auVar139,auVar37);
        auVar118 = vpmovsxwd_avx(auVar160);
        auVar160 = vpunpckhwd_avx(auVar160,auVar160);
        auVar312._16_16_ = auVar160;
        auVar312._0_16_ = auVar118;
        auVar167 = vblendvps_avx(auVar167,auVar135,auVar312);
        auVar135 = vblendvps_avx(auVar139,auVar351,auVar37);
        auVar387 = vblendvps_avx(auVar387,auVar135,auVar312);
        auVar135 = vcmpps_avx(auVar359,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
        auVar313 = ZEXT3264(auVar135);
        auVar287._0_4_ = auVar36._0_4_ ^ auVar135._0_4_;
        auVar287._4_4_ = auVar36._4_4_ ^ auVar135._4_4_;
        auVar287._8_4_ = auVar36._8_4_ ^ auVar135._8_4_;
        auVar287._12_4_ = auVar36._12_4_ ^ auVar135._12_4_;
        auVar287._16_4_ = auVar36._16_4_ ^ auVar135._16_4_;
        auVar287._20_4_ = auVar36._20_4_ ^ auVar135._20_4_;
        auVar287._24_4_ = auVar36._24_4_ ^ auVar135._24_4_;
        auVar287._28_4_ = auVar36._28_4_ ^ auVar135._28_4_;
        auVar135 = vorps_avx(auVar37,auVar287);
        local_ae0 = vandps_avx(auVar214,auVar135);
      }
    }
    auVar135 = local_3c0 & local_ae0;
    auVar278._8_4_ = 0x3f800000;
    auVar278._0_8_ = &DAT_3f8000003f800000;
    auVar278._12_4_ = 0x3f800000;
    auVar278._16_4_ = 0x3f800000;
    auVar278._20_4_ = 0x3f800000;
    auVar278._24_4_ = 0x3f800000;
    auVar278._28_4_ = 0x3f800000;
    auVar288 = ZEXT3264(auVar278);
    if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar135 >> 0x7f,0) == '\0') &&
          (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar135 >> 0xbf,0) == '\0') &&
        (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar135[0x1f])
    {
LAB_011e1c48:
      auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
      local_640 = uVar105;
    }
    else {
      auVar160 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7c0._0_4_));
      auVar160 = vshufps_avx(auVar160,auVar160,0);
      auVar279._16_16_ = auVar160;
      auVar279._0_16_ = auVar160;
      _local_5c0 = vmaxps_avx(auVar279,auVar167);
      auVar160 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_7c0._0_4_));
      auVar160 = vshufps_avx(auVar160,auVar160,0);
      auVar280._16_16_ = auVar160;
      auVar280._0_16_ = auVar160;
      auVar36 = vminps_avx(auVar280,auVar387);
      fVar201 = auVar35._28_4_;
      auVar132._0_4_ = local_500 * fVar325 + local_520 * fVar381 + local_540 * fVar397;
      auVar132._4_4_ = fStack_4fc * fVar337 + fStack_51c * fVar389 + fStack_53c * fVar402;
      auVar132._8_4_ = fStack_4f8 * fVar338 + fStack_518 * fVar390 + fStack_538 * fVar404;
      auVar132._12_4_ = fStack_4f4 * fVar339 + fStack_514 * fVar391 + fStack_534 * fVar406;
      auVar132._16_4_ = fStack_4f0 * fVar340 + fStack_510 * fVar392 + fStack_530 * fVar408;
      auVar132._20_4_ = fStack_4ec * fVar341 + fStack_50c * fVar393 + fStack_52c * fVar410;
      auVar132._24_4_ = fStack_4e8 * fVar342 + fStack_508 * fVar394 + fStack_528 * fVar412;
      auVar132._28_4_ = auVar331._28_4_ + auVar174._28_4_ + fVar201;
      auVar135 = vrcpps_avx(auVar132);
      fVar196 = auVar135._0_4_;
      fVar146 = auVar135._4_4_;
      auVar67._4_4_ = auVar132._4_4_ * fVar146;
      auVar67._0_4_ = auVar132._0_4_ * fVar196;
      fVar188 = auVar135._8_4_;
      auVar67._8_4_ = auVar132._8_4_ * fVar188;
      fVar190 = auVar135._12_4_;
      auVar67._12_4_ = auVar132._12_4_ * fVar190;
      fVar195 = auVar135._16_4_;
      auVar67._16_4_ = auVar132._16_4_ * fVar195;
      fVar197 = auVar135._20_4_;
      auVar67._20_4_ = auVar132._20_4_ * fVar197;
      fVar199 = auVar135._24_4_;
      auVar67._24_4_ = auVar132._24_4_ * fVar199;
      auVar67._28_4_ = auVar174._28_4_;
      auVar174 = vsubps_avx(auVar278,auVar67);
      auVar309._8_4_ = 0x7fffffff;
      auVar309._0_8_ = 0x7fffffff7fffffff;
      auVar309._12_4_ = 0x7fffffff;
      auVar309._16_4_ = 0x7fffffff;
      auVar309._20_4_ = 0x7fffffff;
      auVar309._24_4_ = 0x7fffffff;
      auVar309._28_4_ = 0x7fffffff;
      auVar135 = vandps_avx(auVar132,auVar309);
      auVar333._8_4_ = 0x219392ef;
      auVar333._0_8_ = 0x219392ef219392ef;
      auVar333._12_4_ = 0x219392ef;
      auVar333._16_4_ = 0x219392ef;
      auVar333._20_4_ = 0x219392ef;
      auVar333._24_4_ = 0x219392ef;
      auVar333._28_4_ = 0x219392ef;
      auVar135 = vcmpps_avx(auVar135,auVar333,1);
      auVar68._4_4_ =
           (fVar146 + fVar146 * auVar174._4_4_) *
           -(fVar260 * fVar337 + fVar428 * fVar389 + fVar244 * fVar402);
      auVar68._0_4_ =
           (fVar196 + fVar196 * auVar174._0_4_) *
           -(fVar240 * fVar325 + fVar426 * fVar381 + fVar145 * fVar397);
      auVar68._8_4_ =
           (fVar188 + fVar188 * auVar174._8_4_) *
           -(fVar268 * fVar338 + fVar429 * fVar390 + fVar266 * fVar404);
      auVar68._12_4_ =
           (fVar190 + fVar190 * auVar174._12_4_) *
           -(fVar298 * fVar339 + fVar430 * fVar391 + fVar296 * fVar406);
      auVar68._16_4_ =
           (fVar195 + fVar195 * auVar174._16_4_) *
           -(fVar300 * fVar340 + fVar431 * fVar392 + fVar299 * fVar408);
      auVar68._20_4_ =
           (fVar197 + fVar197 * auVar174._20_4_) *
           -(fVar323 * fVar341 + fVar432 * fVar393 + fVar321 * fVar410);
      auVar68._24_4_ =
           (fVar199 + fVar199 * auVar174._24_4_) *
           -(fVar267 * fVar342 + fVar433 * fVar394 + fVar265 * fVar412);
      auVar68._28_4_ = -(fVar201 + fVar194 + fVar201);
      auVar174 = vcmpps_avx(auVar132,ZEXT832(0) << 0x20,1);
      auVar35 = vorps_avx(auVar135,auVar174);
      auVar174 = vcmpps_avx(auVar132,ZEXT832(0) << 0x20,6);
      auVar174 = vorps_avx(auVar135,auVar174);
      auVar378._8_4_ = 0xff800000;
      auVar378._0_8_ = 0xff800000ff800000;
      auVar378._12_4_ = 0xff800000;
      auVar378._16_4_ = 0xff800000;
      auVar378._20_4_ = 0xff800000;
      auVar378._24_4_ = 0xff800000;
      auVar378._28_4_ = 0xff800000;
      auVar379 = ZEXT3264(auVar378);
      auVar135 = vblendvps_avx(auVar68,auVar378,auVar35);
      auVar388._8_4_ = 0x7f800000;
      auVar388._0_8_ = 0x7f8000007f800000;
      auVar388._12_4_ = 0x7f800000;
      auVar388._16_4_ = 0x7f800000;
      auVar388._20_4_ = 0x7f800000;
      auVar388._24_4_ = 0x7f800000;
      auVar388._28_4_ = 0x7f800000;
      auVar174 = vblendvps_avx(auVar68,auVar388,auVar174);
      auVar35 = vmaxps_avx(_local_5c0,auVar135);
      auVar36 = vminps_avx(auVar36,auVar174);
      auVar427 = ZEXT832(0) << 0x20;
      auVar135 = vsubps_avx(auVar427,local_a80);
      auVar174 = vsubps_avx(auVar427,_local_9a0);
      auVar69._4_4_ = auVar174._4_4_ * -fVar403;
      auVar69._0_4_ = auVar174._0_4_ * -fVar398;
      auVar69._8_4_ = auVar174._8_4_ * -fVar405;
      auVar69._12_4_ = auVar174._12_4_ * -fVar407;
      auVar69._16_4_ = auVar174._16_4_ * -fVar409;
      auVar69._20_4_ = auVar174._20_4_ * -fVar411;
      auVar69._24_4_ = auVar174._24_4_ * -fVar413;
      auVar69._28_4_ = auVar174._28_4_;
      auVar70._4_4_ = fVar420 * auVar135._4_4_;
      auVar70._0_4_ = fVar415 * auVar135._0_4_;
      auVar70._8_4_ = fVar421 * auVar135._8_4_;
      auVar70._12_4_ = fVar422 * auVar135._12_4_;
      auVar70._16_4_ = fVar423 * auVar135._16_4_;
      auVar70._20_4_ = fVar424 * auVar135._20_4_;
      auVar70._24_4_ = fVar425 * auVar135._24_4_;
      auVar70._28_4_ = auVar135._28_4_;
      auVar135 = vsubps_avx(auVar69,auVar70);
      auVar174 = vsubps_avx(auVar427,local_6e0);
      auVar71._4_4_ = fVar243 * auVar174._4_4_;
      auVar71._0_4_ = fVar220 * auVar174._0_4_;
      auVar71._8_4_ = fVar264 * auVar174._8_4_;
      auVar71._12_4_ = fVar294 * auVar174._12_4_;
      auVar71._16_4_ = fVar297 * auVar174._16_4_;
      auVar71._20_4_ = fVar319 * auVar174._20_4_;
      uVar8 = auVar174._28_4_;
      auVar71._24_4_ = fVar395 * auVar174._24_4_;
      auVar71._28_4_ = uVar8;
      auVar214 = vsubps_avx(auVar135,auVar71);
      auVar72._4_4_ = fStack_53c * -fVar403;
      auVar72._0_4_ = local_540 * -fVar398;
      auVar72._8_4_ = fStack_538 * -fVar405;
      auVar72._12_4_ = fStack_534 * -fVar407;
      auVar72._16_4_ = fStack_530 * -fVar409;
      auVar72._20_4_ = fStack_52c * -fVar411;
      auVar72._24_4_ = fStack_528 * -fVar413;
      auVar72._28_4_ = uVar104 ^ 0x80000000;
      auVar73._4_4_ = fStack_51c * fVar420;
      auVar73._0_4_ = local_520 * fVar415;
      auVar73._8_4_ = fStack_518 * fVar421;
      auVar73._12_4_ = fStack_514 * fVar422;
      auVar73._16_4_ = fStack_510 * fVar423;
      auVar73._20_4_ = fStack_50c * fVar424;
      auVar73._24_4_ = fStack_508 * fVar425;
      auVar73._28_4_ = uVar8;
      auVar135 = vsubps_avx(auVar72,auVar73);
      auVar74._4_4_ = fStack_4fc * fVar243;
      auVar74._0_4_ = local_500 * fVar220;
      auVar74._8_4_ = fStack_4f8 * fVar264;
      auVar74._12_4_ = fStack_4f4 * fVar294;
      auVar74._16_4_ = fStack_4f0 * fVar297;
      auVar74._20_4_ = fStack_4ec * fVar319;
      auVar74._24_4_ = fStack_4e8 * fVar395;
      auVar74._28_4_ = uVar8;
      auVar358._8_4_ = 0x3f800000;
      auVar358._0_8_ = &DAT_3f8000003f800000;
      auVar358._12_4_ = 0x3f800000;
      auVar358._16_4_ = 0x3f800000;
      auVar358._20_4_ = 0x3f800000;
      auVar358._24_4_ = 0x3f800000;
      auVar358._28_4_ = 0x3f800000;
      auVar37 = vsubps_avx(auVar135,auVar74);
      auVar135 = vrcpps_avx(auVar37);
      fVar220 = auVar135._0_4_;
      fVar145 = auVar135._4_4_;
      auVar75._4_4_ = auVar37._4_4_ * fVar145;
      auVar75._0_4_ = auVar37._0_4_ * fVar220;
      fVar240 = auVar135._8_4_;
      auVar75._8_4_ = auVar37._8_4_ * fVar240;
      fVar243 = auVar135._12_4_;
      auVar75._12_4_ = auVar37._12_4_ * fVar243;
      fVar244 = auVar135._16_4_;
      auVar75._16_4_ = auVar37._16_4_ * fVar244;
      fVar260 = auVar135._20_4_;
      auVar75._20_4_ = auVar37._20_4_ * fVar260;
      fVar264 = auVar135._24_4_;
      auVar75._24_4_ = auVar37._24_4_ * fVar264;
      auVar75._28_4_ = local_960._28_4_;
      auVar359 = vsubps_avx(auVar358,auVar75);
      auVar169._8_4_ = 0x7fffffff;
      auVar169._0_8_ = 0x7fffffff7fffffff;
      auVar169._12_4_ = 0x7fffffff;
      auVar169._16_4_ = 0x7fffffff;
      auVar169._20_4_ = 0x7fffffff;
      auVar169._24_4_ = 0x7fffffff;
      auVar169._28_4_ = 0x7fffffff;
      auVar135 = vandps_avx(auVar37,auVar169);
      auVar174 = vcmpps_avx(auVar135,auVar333,1);
      auVar76._4_4_ = (fVar145 + fVar145 * auVar359._4_4_) * -auVar214._4_4_;
      auVar76._0_4_ = (fVar220 + fVar220 * auVar359._0_4_) * -auVar214._0_4_;
      auVar76._8_4_ = (fVar240 + fVar240 * auVar359._8_4_) * -auVar214._8_4_;
      auVar76._12_4_ = (fVar243 + fVar243 * auVar359._12_4_) * -auVar214._12_4_;
      auVar76._16_4_ = (fVar244 + fVar244 * auVar359._16_4_) * -auVar214._16_4_;
      auVar76._20_4_ = (fVar260 + fVar260 * auVar359._20_4_) * -auVar214._20_4_;
      auVar76._24_4_ = (fVar264 + fVar264 * auVar359._24_4_) * -auVar214._24_4_;
      auVar76._28_4_ = auVar214._28_4_ ^ 0x80000000;
      auVar135 = vcmpps_avx(auVar37,auVar427,1);
      auVar135 = vorps_avx(auVar174,auVar135);
      auVar135 = vblendvps_avx(auVar76,auVar378,auVar135);
      local_440 = vmaxps_avx(auVar35,auVar135);
      auVar313 = ZEXT3264(local_440);
      auVar135 = vcmpps_avx(auVar37,ZEXT832(0) << 0x20,6);
      auVar135 = vorps_avx(auVar174,auVar135);
      auVar174 = vblendvps_avx(auVar76,auVar388,auVar135);
      auVar135 = vandps_avx(local_3c0,local_ae0);
      local_460 = vminps_avx(auVar36,auVar174);
      auVar174 = vcmpps_avx(local_440,local_460,2);
      auVar35 = auVar135 & auVar174;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar35 >> 0x7f,0) == '\0') &&
            (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar35 >> 0xbf,0) == '\0') &&
          (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar35[0x1f])
      {
        auVar288 = ZEXT3264(auVar358);
        goto LAB_011e1c48;
      }
      auVar35 = vminps_avx(_local_840,local_720);
      auVar36 = vminps_avx(local_800,local_700);
      auVar35 = vminps_avx(auVar35,auVar36);
      auVar35 = vsubps_avx(auVar35,_local_8a0);
      auVar135 = vandps_avx(auVar174,auVar135);
      auVar103._4_4_ = local_4c0[1];
      auVar103._0_4_ = local_4c0[0];
      auVar103._8_4_ = local_4c0[2];
      auVar103._12_4_ = local_4c0[3];
      auVar103._16_4_ = fStack_4b0;
      auVar103._20_4_ = fStack_4ac;
      auVar103._24_4_ = fStack_4a8;
      auVar103._28_4_ = fStack_4a4;
      auVar174 = vminps_avx(auVar103,auVar358);
      auVar91 = ZEXT812(0);
      _local_7a0 = ZEXT1232(auVar91) << 0x20;
      auVar174 = vmaxps_avx(auVar174,ZEXT1232(auVar91) << 0x20);
      local_4c0[0] = fVar112 + fVar144 * (auVar174._0_4_ + 0.0) * 0.125;
      local_4c0[1] = fVar141 + fVar186 * (auVar174._4_4_ + 1.0) * 0.125;
      local_4c0[2] = fVar142 + fVar189 * (auVar174._8_4_ + 2.0) * 0.125;
      local_4c0[3] = fVar143 + fVar193 * (auVar174._12_4_ + 3.0) * 0.125;
      fStack_4b0 = fVar112 + fVar144 * (auVar174._16_4_ + 4.0) * 0.125;
      fStack_4ac = fVar141 + fVar186 * (auVar174._20_4_ + 5.0) * 0.125;
      fStack_4a8 = fVar142 + fVar189 * (auVar174._24_4_ + 6.0) * 0.125;
      fStack_4a4 = fVar143 + auVar174._28_4_ + 7.0;
      auVar102._4_4_ = local_4e0[1];
      auVar102._0_4_ = local_4e0[0];
      auVar102._8_4_ = local_4e0[2];
      auVar102._12_4_ = local_4e0[3];
      auVar102._16_4_ = fStack_4d0;
      auVar102._20_4_ = fStack_4cc;
      auVar102._24_4_ = fStack_4c8;
      auVar102._28_4_ = fStack_4c4;
      auVar174 = vminps_avx(auVar102,auVar358);
      auVar174 = vmaxps_avx(auVar174,ZEXT1232(auVar91) << 0x20);
      local_4e0[0] = fVar112 + fVar144 * (auVar174._0_4_ + 0.0) * 0.125;
      local_4e0[1] = fVar141 + fVar186 * (auVar174._4_4_ + 1.0) * 0.125;
      local_4e0[2] = fVar142 + fVar189 * (auVar174._8_4_ + 2.0) * 0.125;
      local_4e0[3] = fVar143 + fVar193 * (auVar174._12_4_ + 3.0) * 0.125;
      fStack_4d0 = fVar112 + fVar144 * (auVar174._16_4_ + 4.0) * 0.125;
      fStack_4cc = fVar141 + fVar186 * (auVar174._20_4_ + 5.0) * 0.125;
      fStack_4c8 = fVar142 + fVar189 * (auVar174._24_4_ + 6.0) * 0.125;
      fStack_4c4 = fVar143 + auVar174._28_4_ + 7.0;
      auVar77._4_4_ = auVar35._4_4_ * 0.99999976;
      auVar77._0_4_ = auVar35._0_4_ * 0.99999976;
      auVar77._8_4_ = auVar35._8_4_ * 0.99999976;
      auVar77._12_4_ = auVar35._12_4_ * 0.99999976;
      auVar77._16_4_ = auVar35._16_4_ * 0.99999976;
      auVar77._20_4_ = auVar35._20_4_ * 0.99999976;
      auVar77._24_4_ = auVar35._24_4_ * 0.99999976;
      auVar77._28_4_ = 0x3f7ffffc;
      auVar174 = vmaxps_avx(ZEXT832(0) << 0x20,auVar77);
      auVar78._4_4_ = auVar174._4_4_ * auVar174._4_4_;
      auVar78._0_4_ = auVar174._0_4_ * auVar174._0_4_;
      auVar78._8_4_ = auVar174._8_4_ * auVar174._8_4_;
      auVar78._12_4_ = auVar174._12_4_ * auVar174._12_4_;
      auVar78._16_4_ = auVar174._16_4_ * auVar174._16_4_;
      auVar78._20_4_ = auVar174._20_4_ * auVar174._20_4_;
      auVar78._24_4_ = auVar174._24_4_ * auVar174._24_4_;
      auVar78._28_4_ = auVar174._28_4_;
      auVar35 = vsubps_avx(_local_740,auVar78);
      auVar79._4_4_ = auVar35._4_4_ * fVar396;
      auVar79._0_4_ = auVar35._0_4_ * fVar187;
      auVar79._8_4_ = auVar35._8_4_ * fStack_638;
      auVar79._12_4_ = auVar35._12_4_ * fStack_634;
      auVar79._16_4_ = auVar35._16_4_ * fStack_630;
      auVar79._20_4_ = auVar35._20_4_ * fStack_62c;
      auVar79._24_4_ = auVar35._24_4_ * fStack_628;
      auVar79._28_4_ = auVar174._28_4_;
      auVar36 = vsubps_avx(local_780,auVar79);
      auVar174 = vcmpps_avx(auVar36,ZEXT1232(auVar91) << 0x20,5);
      fVar220 = local_440._28_4_;
      if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar174 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar174 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar174 >> 0x7f,0) == '\0') &&
            (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar174 >> 0xbf,0) == '\0') &&
          (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar174[0x1f]) {
        _local_680 = ZEXT432(0) << 0x20;
        _local_6a0 = ZEXT432(0) << 0x20;
        auVar231 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar255 = ZEXT828(0) << 0x20;
        auVar352 = ZEXT828(0) << 0x20;
        auVar170._8_4_ = 0x7f800000;
        auVar170._0_8_ = 0x7f8000007f800000;
        auVar170._12_4_ = 0x7f800000;
        auVar170._16_4_ = 0x7f800000;
        auVar170._20_4_ = 0x7f800000;
        auVar170._24_4_ = 0x7f800000;
        auVar170._28_4_ = 0x7f800000;
        auVar281._8_4_ = 0xff800000;
        auVar281._0_8_ = 0xff800000ff800000;
        auVar281._12_4_ = 0xff800000;
        auVar281._16_4_ = 0xff800000;
        auVar281._20_4_ = 0xff800000;
        auVar281._24_4_ = 0xff800000;
        auVar281._28_4_ = 0xff800000;
      }
      else {
        local_a00 = auVar35;
        local_860 = auVar174;
        local_ae0 = auVar135;
        _local_8a0 = local_440;
        auVar37 = vsqrtps_avx(auVar36);
        auVar171._0_4_ = fVar198 + fVar198;
        auVar171._4_4_ = fVar200 + fVar200;
        auVar171._8_4_ = fVar367 + fVar367;
        auVar171._12_4_ = fVar368 + fVar368;
        auVar171._16_4_ = fVar369 + fVar369;
        auVar171._20_4_ = fVar370 + fVar370;
        auVar171._24_4_ = fVar371 + fVar371;
        auVar171._28_4_ = fVar221 + fVar221;
        auVar214 = vrcpps_avx(auVar171);
        fVar221 = auVar214._0_4_;
        fVar145 = auVar214._4_4_;
        auVar80._4_4_ = auVar171._4_4_ * fVar145;
        auVar80._0_4_ = auVar171._0_4_ * fVar221;
        fVar240 = auVar214._8_4_;
        auVar80._8_4_ = auVar171._8_4_ * fVar240;
        fVar243 = auVar214._12_4_;
        auVar80._12_4_ = auVar171._12_4_ * fVar243;
        fVar244 = auVar214._16_4_;
        auVar80._16_4_ = auVar171._16_4_ * fVar244;
        fVar260 = auVar214._20_4_;
        auVar80._20_4_ = auVar171._20_4_ * fVar260;
        fVar264 = auVar214._24_4_;
        auVar80._24_4_ = auVar171._24_4_ * fVar264;
        auVar80._28_4_ = auVar171._28_4_;
        auVar359 = vsubps_avx(auVar358,auVar80);
        fVar221 = fVar221 + fVar221 * auVar359._0_4_;
        fVar145 = fVar145 + fVar145 * auVar359._4_4_;
        fVar240 = fVar240 + fVar240 * auVar359._8_4_;
        fVar243 = fVar243 + fVar243 * auVar359._12_4_;
        fVar244 = fVar244 + fVar244 * auVar359._16_4_;
        fVar260 = fVar260 + fVar260 * auVar359._20_4_;
        fVar264 = fVar264 + fVar264 * auVar359._24_4_;
        fVar300 = auVar214._28_4_ + auVar359._28_4_;
        auVar172._0_8_ = local_8e0._0_8_ ^ 0x8000000080000000;
        auVar172._8_4_ = -local_8e0._8_4_;
        auVar172._12_4_ = -local_8e0._12_4_;
        auVar172._16_4_ = -local_8e0._16_4_;
        auVar172._20_4_ = -local_8e0._20_4_;
        auVar172._24_4_ = -local_8e0._24_4_;
        auVar172._28_4_ = -local_8e0._28_4_;
        auVar214 = vsubps_avx(auVar172,auVar37);
        fVar266 = auVar214._0_4_ * fVar221;
        fVar268 = auVar214._4_4_ * fVar145;
        auVar81._4_4_ = fVar268;
        auVar81._0_4_ = fVar266;
        fVar294 = auVar214._8_4_ * fVar240;
        auVar81._8_4_ = fVar294;
        fVar296 = auVar214._12_4_ * fVar243;
        auVar81._12_4_ = fVar296;
        fVar298 = auVar214._16_4_ * fVar244;
        auVar81._16_4_ = fVar298;
        fVar297 = auVar214._20_4_ * fVar260;
        auVar81._20_4_ = fVar297;
        fVar299 = auVar214._24_4_ * fVar264;
        auVar81._24_4_ = fVar299;
        auVar81._28_4_ = auVar214._28_4_;
        auVar214 = vsubps_avx(auVar37,local_8e0);
        fVar221 = auVar214._0_4_ * fVar221;
        fVar145 = auVar214._4_4_ * fVar145;
        auVar82._4_4_ = fVar145;
        auVar82._0_4_ = fVar221;
        fVar240 = auVar214._8_4_ * fVar240;
        auVar82._8_4_ = fVar240;
        fVar243 = auVar214._12_4_ * fVar243;
        auVar82._12_4_ = fVar243;
        fVar244 = auVar214._16_4_ * fVar244;
        auVar82._16_4_ = fVar244;
        fVar260 = auVar214._20_4_ * fVar260;
        auVar82._20_4_ = fVar260;
        fVar264 = auVar214._24_4_ * fVar264;
        auVar82._24_4_ = fVar264;
        auVar82._28_4_ = 0x80000000;
        fVar319 = local_5e0._0_4_ * (fVar266 * (float)local_a20._0_4_ + (float)local_6c0._0_4_);
        fVar321 = local_5e0._4_4_ * (fVar268 * (float)local_a20._4_4_ + (float)local_6c0._4_4_);
        fVar323 = local_5e0._8_4_ * (fVar294 * fStack_a18 + fStack_6b8);
        fVar395 = local_5e0._12_4_ * (fVar296 * fStack_a14 + fStack_6b4);
        fVar265 = local_5e0._16_4_ * (fVar298 * fStack_a10 + fStack_6b0);
        fVar267 = local_5e0._20_4_ * (fVar297 * fStack_a0c + fStack_6ac);
        fVar187 = local_5e0._24_4_ * (fVar299 * fStack_a08 + fStack_6a8);
        auVar237._0_4_ = local_aa0 + fVar114 * fVar319;
        auVar237._4_4_ = fStack_a9c + fVar242 * fVar321;
        auVar237._8_4_ = fStack_a98 + fVar263 * fVar323;
        auVar237._12_4_ = fStack_a94 + fVar292 * fVar395;
        auVar237._16_4_ = fStack_a90 + fVar295 * fVar265;
        auVar237._20_4_ = fStack_a8c + fVar317 * fVar267;
        auVar237._24_4_ = fStack_a88 + fVar39 * fVar187;
        auVar237._28_4_ = fStack_a84 + auVar214._28_4_ + fStack_6a4;
        auVar83._4_4_ = fStack_4fc * fVar268;
        auVar83._0_4_ = local_500 * fVar266;
        auVar83._8_4_ = fStack_4f8 * fVar294;
        auVar83._12_4_ = fStack_4f4 * fVar296;
        auVar83._16_4_ = fStack_4f0 * fVar298;
        auVar83._20_4_ = fStack_4ec * fVar297;
        auVar83._24_4_ = fStack_4e8 * fVar299;
        auVar83._28_4_ = fVar300;
        local_a80 = vsubps_avx(auVar83,auVar237);
        auVar257._0_4_ = (float)local_680._0_4_ + fVar113 * fVar319;
        auVar257._4_4_ = (float)local_680._4_4_ + fVar191 * fVar321;
        auVar257._8_4_ = fStack_678 + fVar261 * fVar323;
        auVar257._12_4_ = fStack_674 + fVar289 * fVar395;
        auVar257._16_4_ = fStack_670 + fVar291 * fVar265;
        auVar257._20_4_ = fStack_66c + fVar314 * fVar267;
        auVar257._24_4_ = fStack_668 + fVar380 * fVar187;
        auVar257._28_4_ = register0x000015dc + fVar300;
        auVar84._4_4_ = fStack_51c * fVar268;
        auVar84._0_4_ = local_520 * fVar266;
        auVar84._8_4_ = fStack_518 * fVar294;
        auVar84._12_4_ = fStack_514 * fVar296;
        auVar84._16_4_ = fStack_510 * fVar298;
        auVar84._20_4_ = fStack_50c * fVar297;
        auVar84._24_4_ = fStack_508 * fVar299;
        auVar84._28_4_ = fVar220;
        _local_9a0 = vsubps_avx(auVar84,auVar257);
        auVar282._0_4_ = (float)local_560._0_4_ + fVar239 * fVar319;
        auVar282._4_4_ = (float)local_560._4_4_ + fVar241 * fVar321;
        auVar282._8_4_ = fStack_558 + fVar262 * fVar323;
        auVar282._12_4_ = fStack_554 + fVar290 * fVar395;
        auVar282._16_4_ = fStack_550 + fVar293 * fVar265;
        auVar282._20_4_ = fStack_54c + fVar315 * fVar267;
        auVar282._24_4_ = fStack_548 + fVar414 * fVar187;
        auVar282._28_4_ = fStack_544 + fVar143;
        auVar85._4_4_ = fStack_53c * fVar268;
        auVar85._0_4_ = local_540 * fVar266;
        auVar85._8_4_ = fStack_538 * fVar294;
        auVar85._12_4_ = fStack_534 * fVar296;
        auVar85._16_4_ = fStack_530 * fVar298;
        auVar85._20_4_ = fStack_52c * fVar297;
        auVar85._24_4_ = fStack_528 * fVar299;
        auVar85._28_4_ = fVar220;
        _local_8c0 = vsubps_avx(auVar85,auVar282);
        fVar266 = local_5e0._0_4_ * (fVar221 * (float)local_a20._0_4_ + (float)local_6c0._0_4_);
        fVar268 = local_5e0._4_4_ * (fVar145 * (float)local_a20._4_4_ + (float)local_6c0._4_4_);
        fVar294 = local_5e0._8_4_ * (fVar240 * fStack_a18 + fStack_6b8);
        fVar296 = local_5e0._12_4_ * (fVar243 * fStack_a14 + fStack_6b4);
        fVar298 = local_5e0._16_4_ * (fVar244 * fStack_a10 + fStack_6b0);
        fVar297 = local_5e0._20_4_ * (fVar260 * fStack_a0c + fStack_6ac);
        fVar299 = local_5e0._24_4_ * (fVar264 * fStack_a08 + fStack_6a8);
        auVar310._0_4_ = local_aa0 + fVar114 * fVar266;
        auVar310._4_4_ = fStack_a9c + fVar242 * fVar268;
        auVar310._8_4_ = fStack_a98 + fVar263 * fVar294;
        auVar310._12_4_ = fStack_a94 + fVar292 * fVar296;
        auVar310._16_4_ = fStack_a90 + fVar295 * fVar298;
        auVar310._20_4_ = fStack_a8c + fVar317 * fVar297;
        auVar310._24_4_ = fStack_a88 + fVar39 * fVar299;
        auVar310._28_4_ = fStack_a84 + fVar220;
        auVar86._4_4_ = fVar145 * fStack_4fc;
        auVar86._0_4_ = fVar221 * local_500;
        auVar86._8_4_ = fVar240 * fStack_4f8;
        auVar86._12_4_ = fVar243 * fStack_4f4;
        auVar86._16_4_ = fVar244 * fStack_4f0;
        auVar86._20_4_ = fVar260 * fStack_4ec;
        auVar86._24_4_ = fVar264 * fStack_4e8;
        auVar86._28_4_ = fStack_4e4;
        _local_7a0 = vsubps_avx(auVar86,auVar310);
        auVar311._0_4_ = (float)local_680._0_4_ + fVar113 * fVar266;
        auVar311._4_4_ = (float)local_680._4_4_ + fVar191 * fVar268;
        auVar311._8_4_ = fStack_678 + fVar261 * fVar294;
        auVar311._12_4_ = fStack_674 + fVar289 * fVar296;
        auVar311._16_4_ = fStack_670 + fVar291 * fVar298;
        auVar311._20_4_ = fStack_66c + fVar314 * fVar297;
        auVar311._24_4_ = fStack_668 + fVar380 * fVar299;
        auVar311._28_4_ = register0x000015dc + local_7a0._28_4_;
        auVar87._4_4_ = fStack_51c * fVar145;
        auVar87._0_4_ = local_520 * fVar221;
        auVar87._8_4_ = fStack_518 * fVar240;
        auVar87._12_4_ = fStack_514 * fVar243;
        auVar87._16_4_ = fStack_510 * fVar244;
        auVar87._20_4_ = fStack_50c * fVar260;
        auVar87._24_4_ = fStack_508 * fVar264;
        auVar87._28_4_ = fStack_4e4;
        _local_680 = vsubps_avx(auVar87,auVar311);
        auVar283._0_4_ = (float)local_560._0_4_ + fVar239 * fVar266;
        auVar283._4_4_ = (float)local_560._4_4_ + fVar241 * fVar268;
        auVar283._8_4_ = fStack_558 + fVar262 * fVar294;
        auVar283._12_4_ = fStack_554 + fVar290 * fVar296;
        auVar283._16_4_ = fStack_550 + fVar293 * fVar298;
        auVar283._20_4_ = fStack_54c + fVar315 * fVar297;
        auVar283._24_4_ = fStack_548 + fVar414 * fVar299;
        auVar283._28_4_ = fStack_544 + local_8c0._28_4_ + fStack_6a4;
        auVar88._4_4_ = fStack_53c * fVar145;
        auVar88._0_4_ = local_540 * fVar221;
        auVar88._8_4_ = fStack_538 * fVar240;
        auVar88._12_4_ = fStack_534 * fVar243;
        auVar88._16_4_ = fStack_530 * fVar244;
        auVar88._20_4_ = fStack_52c * fVar260;
        auVar88._24_4_ = fStack_528 * fVar264;
        auVar88._28_4_ = local_680._28_4_;
        _local_6a0 = vsubps_avx(auVar88,auVar283);
        auVar214 = vcmpps_avx(auVar36,_DAT_02020f00,5);
        auVar284._8_4_ = 0x7f800000;
        auVar284._0_8_ = 0x7f8000007f800000;
        auVar284._12_4_ = 0x7f800000;
        auVar284._16_4_ = 0x7f800000;
        auVar284._20_4_ = 0x7f800000;
        auVar284._24_4_ = 0x7f800000;
        auVar284._28_4_ = 0x7f800000;
        auVar170 = vblendvps_avx(auVar284,auVar81,auVar214);
        auVar334._8_4_ = 0x7fffffff;
        auVar334._0_8_ = 0x7fffffff7fffffff;
        auVar334._12_4_ = 0x7fffffff;
        auVar334._16_4_ = 0x7fffffff;
        auVar334._20_4_ = 0x7fffffff;
        auVar334._24_4_ = 0x7fffffff;
        auVar334._28_4_ = 0x7fffffff;
        auVar36 = vandps_avx(auVar334,local_5a0);
        auVar36 = vmaxps_avx(local_400,auVar36);
        auVar89._4_4_ = auVar36._4_4_ * 1.9073486e-06;
        auVar89._0_4_ = auVar36._0_4_ * 1.9073486e-06;
        auVar89._8_4_ = auVar36._8_4_ * 1.9073486e-06;
        auVar89._12_4_ = auVar36._12_4_ * 1.9073486e-06;
        auVar89._16_4_ = auVar36._16_4_ * 1.9073486e-06;
        auVar89._20_4_ = auVar36._20_4_ * 1.9073486e-06;
        auVar89._24_4_ = auVar36._24_4_ * 1.9073486e-06;
        auVar89._28_4_ = auVar36._28_4_;
        auVar36 = vandps_avx(auVar334,local_660);
        auVar36 = vcmpps_avx(auVar36,auVar89,1);
        auVar285._8_4_ = 0xff800000;
        auVar285._0_8_ = 0xff800000ff800000;
        auVar285._12_4_ = 0xff800000;
        auVar285._16_4_ = 0xff800000;
        auVar285._20_4_ = 0xff800000;
        auVar285._24_4_ = 0xff800000;
        auVar285._28_4_ = 0xff800000;
        auVar281 = vblendvps_avx(auVar285,auVar82,auVar214);
        auVar37 = auVar214 & auVar36;
        if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar37 >> 0x7f,0) != '\0') ||
              (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar37 >> 0xbf,0) != '\0') ||
            (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar37[0x1f] < '\0') {
          auVar174 = vandps_avx(auVar36,auVar214);
          auVar160 = vpackssdw_avx(auVar174._0_16_,auVar174._16_16_);
          auVar36 = vcmpps_avx(auVar35,ZEXT832(0) << 0x20,2);
          auVar419._8_4_ = 0xff800000;
          auVar419._0_8_ = 0xff800000ff800000;
          auVar419._12_4_ = 0xff800000;
          auVar419._16_4_ = 0xff800000;
          auVar419._20_4_ = 0xff800000;
          auVar419._24_4_ = 0xff800000;
          auVar419._28_4_ = 0xff800000;
          auVar401._8_4_ = 0x7f800000;
          auVar401._0_8_ = 0x7f8000007f800000;
          auVar401._12_4_ = 0x7f800000;
          auVar401._16_4_ = 0x7f800000;
          auVar401._20_4_ = 0x7f800000;
          auVar401._24_4_ = 0x7f800000;
          auVar401._28_4_ = 0x7f800000;
          auVar35 = vblendvps_avx(auVar401,auVar419,auVar36);
          auVar118 = vpmovsxwd_avx(auVar160);
          auVar160 = vpunpckhwd_avx(auVar160,auVar160);
          auVar335._16_16_ = auVar160;
          auVar335._0_16_ = auVar118;
          auVar170 = vblendvps_avx(auVar170,auVar35,auVar335);
          auVar35 = vblendvps_avx(auVar419,auVar401,auVar36);
          auVar281 = vblendvps_avx(auVar281,auVar35,auVar335);
          auVar35 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          auVar219._0_4_ = auVar174._0_4_ ^ auVar35._0_4_;
          auVar219._4_4_ = auVar174._4_4_ ^ auVar35._4_4_;
          auVar219._8_4_ = auVar174._8_4_ ^ auVar35._8_4_;
          auVar219._12_4_ = auVar174._12_4_ ^ auVar35._12_4_;
          auVar219._16_4_ = auVar174._16_4_ ^ auVar35._16_4_;
          auVar219._20_4_ = auVar174._20_4_ ^ auVar35._20_4_;
          auVar219._24_4_ = auVar174._24_4_ ^ auVar35._24_4_;
          auVar219._28_4_ = auVar174._28_4_ ^ auVar35._28_4_;
          auVar174 = vorps_avx(auVar36,auVar219);
          auVar174 = vandps_avx(auVar214,auVar174);
        }
        auVar231 = local_a80._0_28_;
        auVar255 = local_9a0._0_28_;
        auVar352 = local_8c0._0_28_;
      }
      auVar313 = ZEXT3264(local_440);
      fVar221 = (ray->super_RayK<1>).dir.field_0.m128[0];
      fVar113 = (ray->super_RayK<1>).dir.field_0.m128[1];
      fVar239 = (ray->super_RayK<1>).dir.field_0.m128[2];
      local_420 = vminps_avx(local_460,auVar170);
      _local_480 = vmaxps_avx(local_440,auVar281);
      auVar379 = ZEXT3264(_local_480);
      auVar35 = vcmpps_avx(local_440,local_420,2);
      local_580 = vandps_avx(auVar135,auVar35);
      local_600 = local_580;
      auVar36 = vcmpps_avx(_local_480,local_460,2);
      local_620 = vandps_avx(auVar135,auVar36);
      auVar135 = vorps_avx(local_620,local_580);
      if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar135 >> 0x7f,0) == '\0') &&
            (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar135 >> 0xbf,0) == '\0') &&
          (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar135[0x1f]) {
        auVar288 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        goto LAB_011e1c48;
      }
      _local_5c0 = _local_480;
      _local_8a0 = local_440;
      auVar36 = _local_8a0;
      auVar135 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
      local_5e0._0_4_ = (float)(auVar174._0_4_ ^ auVar135._0_4_);
      local_5e0._4_4_ = (float)(auVar174._4_4_ ^ auVar135._4_4_);
      local_5e0._8_4_ = (float)(auVar174._8_4_ ^ auVar135._8_4_);
      local_5e0._12_4_ = (float)(auVar174._12_4_ ^ auVar135._12_4_);
      local_5e0._16_4_ = (float)(auVar174._16_4_ ^ auVar135._16_4_);
      local_5e0._20_4_ = (float)(auVar174._20_4_ ^ auVar135._20_4_);
      local_5e0._24_4_ = (float)(auVar174._24_4_ ^ auVar135._24_4_);
      local_5e0._28_4_ = (float)((uint)auVar174._28_4_ ^ (uint)auVar135._28_4_);
      auVar313 = ZEXT3264(local_5e0);
      auVar134._0_4_ =
           fVar221 * auVar231._0_4_ + fVar113 * auVar255._0_4_ + auVar352._0_4_ * fVar239;
      auVar134._4_4_ =
           fVar221 * auVar231._4_4_ + fVar113 * auVar255._4_4_ + auVar352._4_4_ * fVar239;
      auVar134._8_4_ =
           fVar221 * auVar231._8_4_ + fVar113 * auVar255._8_4_ + auVar352._8_4_ * fVar239;
      auVar134._12_4_ =
           fVar221 * auVar231._12_4_ + fVar113 * auVar255._12_4_ + auVar352._12_4_ * fVar239;
      auVar134._16_4_ =
           fVar221 * auVar231._16_4_ + fVar113 * auVar255._16_4_ + auVar352._16_4_ * fVar239;
      auVar134._20_4_ =
           fVar221 * auVar231._20_4_ + fVar113 * auVar255._20_4_ + auVar352._20_4_ * fVar239;
      auVar134._24_4_ =
           fVar221 * auVar231._24_4_ + fVar113 * auVar255._24_4_ + auVar352._24_4_ * fVar239;
      auVar134._28_4_ = auVar135._28_4_ + auVar35._28_4_ + auVar174._28_4_;
      auVar175._8_4_ = 0x7fffffff;
      auVar175._0_8_ = 0x7fffffff7fffffff;
      auVar175._12_4_ = 0x7fffffff;
      auVar175._16_4_ = 0x7fffffff;
      auVar175._20_4_ = 0x7fffffff;
      auVar175._24_4_ = 0x7fffffff;
      auVar175._28_4_ = 0x7fffffff;
      auVar135 = vandps_avx(auVar134,auVar175);
      auVar176._8_4_ = 0x3e99999a;
      auVar176._0_8_ = 0x3e99999a3e99999a;
      auVar176._12_4_ = 0x3e99999a;
      auVar176._16_4_ = 0x3e99999a;
      auVar176._20_4_ = 0x3e99999a;
      auVar176._24_4_ = 0x3e99999a;
      auVar176._28_4_ = 0x3e99999a;
      auVar135 = vcmpps_avx(auVar135,auVar176,1);
      auVar135 = vorps_avx(auVar135,local_5e0);
      auVar177._8_4_ = 3;
      auVar177._0_8_ = 0x300000003;
      auVar177._12_4_ = 3;
      auVar177._16_4_ = 3;
      auVar177._20_4_ = 3;
      auVar177._24_4_ = 3;
      auVar177._28_4_ = 3;
      auVar215._8_4_ = 2;
      auVar215._0_8_ = 0x200000002;
      auVar215._12_4_ = 2;
      auVar215._16_4_ = 2;
      auVar215._20_4_ = 2;
      auVar215._24_4_ = 2;
      auVar215._28_4_ = 2;
      auVar135 = vblendvps_avx(auVar215,auVar177,auVar135);
      _local_6c0 = ZEXT432((uint)uVar105);
      local_490 = vpshufd_avx(ZEXT416((uint)uVar105),0);
      auVar160 = vpcmpgtd_avx(auVar135._16_16_,local_490);
      auVar118 = vpcmpgtd_avx(auVar135._0_16_,local_490);
      auVar178._16_16_ = auVar160;
      auVar178._0_16_ = auVar118;
      auVar135 = vblendps_avx(ZEXT1632(auVar118),auVar178,0xf0);
      local_600 = vandnps_avx(auVar135,local_580);
      auVar259 = ZEXT3264(local_600);
      local_5a0 = auVar135;
      auVar174 = local_580 & ~auVar135;
      auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar288 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      local_640 = uVar105;
      auVar35 = local_620;
      fVar114 = fVar221;
      fVar145 = fVar221;
      fVar240 = fVar221;
      fVar191 = fVar221;
      fVar241 = fVar221;
      fVar242 = fVar221;
      fVar243 = fVar113;
      fVar244 = fVar113;
      fVar260 = fVar113;
      fVar261 = fVar113;
      fVar262 = fVar113;
      fVar263 = fVar113;
      fVar264 = fVar239;
      fVar266 = fVar239;
      fVar268 = fVar239;
      fVar289 = fVar239;
      fVar290 = fVar239;
      fVar292 = fVar239;
      if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar174 >> 0x7f,0) != '\0') ||
            (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar174 >> 0xbf,0) != '\0') ||
          (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar174[0x1f] < '\0') {
        local_8a0._0_4_ = local_440._0_4_;
        local_8a0._4_4_ = local_440._4_4_;
        fStack_898 = local_440._8_4_;
        fStack_894 = local_440._12_4_;
        fStack_890 = local_440._16_4_;
        fStack_88c = local_440._20_4_;
        fStack_888 = local_440._24_4_;
        local_560._4_4_ = (float)local_8a0._4_4_ + (float)local_760._4_4_;
        local_560._0_4_ = (float)local_8a0._0_4_ + (float)local_760._0_4_;
        fStack_558 = fStack_898 + fStack_758;
        fStack_554 = fStack_894 + fStack_754;
        fStack_550 = fStack_890 + fStack_750;
        fStack_54c = fStack_88c + fStack_74c;
        fStack_548 = fStack_888 + fStack_748;
        fStack_544 = fVar220 + fStack_744;
        local_900._4_4_ = fVar221;
        local_900._0_4_ = fVar221;
        fStack_8f8 = fVar221;
        fStack_8f4 = fVar221;
        fStack_8f0 = fVar221;
        fStack_8ec = fVar221;
        fStack_8e8 = fVar221;
        fStack_8e4 = fVar221;
        local_820._4_4_ = fVar113;
        local_820._0_4_ = fVar113;
        fStack_818 = fVar113;
        fStack_814 = fVar113;
        fStack_810 = fVar113;
        fStack_80c = fVar113;
        fStack_808 = fVar113;
        fStack_804 = fVar113;
        local_840._4_4_ = fVar239;
        local_840._0_4_ = fVar239;
        fStack_838 = fVar239;
        fStack_834 = fVar239;
        fStack_830 = fVar239;
        fStack_82c = fVar239;
        fStack_828 = fVar239;
        fStack_824 = fVar239;
        local_660 = local_620;
        _local_8a0 = auVar36;
        do {
          auVar247 = auVar288._0_16_;
          auVar179._8_4_ = 0x7f800000;
          auVar179._0_8_ = 0x7f8000007f800000;
          auVar179._12_4_ = 0x7f800000;
          auVar179._16_4_ = 0x7f800000;
          auVar179._20_4_ = 0x7f800000;
          auVar179._24_4_ = 0x7f800000;
          auVar179._28_4_ = 0x7f800000;
          auVar135 = auVar259._0_32_;
          auVar174 = vblendvps_avx(auVar179,_local_8a0,auVar135);
          auVar35 = vshufps_avx(auVar174,auVar174,0xb1);
          auVar35 = vminps_avx(auVar174,auVar35);
          auVar36 = vshufpd_avx(auVar35,auVar35,5);
          auVar35 = vminps_avx(auVar35,auVar36);
          auVar36 = vperm2f128_avx(auVar35,auVar35,1);
          auVar35 = vminps_avx(auVar35,auVar36);
          auVar174 = vcmpps_avx(auVar174,auVar35,0);
          auVar35 = auVar135 & auVar174;
          if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar35 >> 0x7f,0) != '\0') ||
                (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar35 >> 0xbf,0) != '\0') ||
              (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar35[0x1f] < '\0') {
            auVar135 = vandps_avx(auVar174,auVar135);
          }
          uVar109 = vmovmskps_avx(auVar135);
          uVar104 = 0;
          if (uVar109 != 0) {
            for (; (uVar109 >> uVar104 & 1) == 0; uVar104 = uVar104 + 1) {
            }
          }
          uVar105 = (ulong)uVar104;
          *(undefined4 *)(local_600 + uVar105 * 4) = 0;
          aVar12 = (ray->super_RayK<1>).dir.field_0;
          _local_8c0 = (undefined1  [16])aVar12;
          auVar160 = vdpps_avx((undefined1  [16])aVar12,(undefined1  [16])aVar12,0x7f);
          local_aa0 = local_4c0[uVar105];
          auVar259 = ZEXT464((uint)local_aa0);
          auVar360 = ZEXT464(*(uint *)(local_440 + uVar105 * 4));
          if (auVar160._0_4_ < 0.0) {
            fStack_a9c = 0.0;
            fStack_a98 = 0.0;
            fStack_a94 = 0.0;
            local_ae0._0_16_ = ZEXT416(*(uint *)(local_440 + uVar105 * 4));
            fVar221 = sqrtf(auVar160._0_4_);
            auVar360 = ZEXT1664(local_ae0._0_16_);
            auVar259 = ZEXT1664(CONCAT412(fStack_a94,
                                          CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
            auVar247._8_4_ = 0x7fffffff;
            auVar247._0_8_ = 0x7fffffff7fffffff;
            auVar247._12_4_ = 0x7fffffff;
          }
          else {
            auVar160 = vsqrtss_avx(auVar160,auVar160);
            fVar221 = auVar160._0_4_;
          }
          auVar118 = vminps_avx(_local_9b0,_local_9d0);
          auVar160 = vmaxps_avx(_local_9b0,_local_9d0);
          auVar123 = vminps_avx(_local_9c0,_local_9e0);
          auVar225 = vminps_avx(auVar118,auVar123);
          auVar118 = vmaxps_avx(_local_9c0,_local_9e0);
          auVar123 = vmaxps_avx(auVar160,auVar118);
          auVar160 = vandps_avx(auVar225,auVar247);
          auVar118 = vandps_avx(auVar123,auVar247);
          auVar160 = vmaxps_avx(auVar160,auVar118);
          auVar118 = vmovshdup_avx(auVar160);
          auVar118 = vmaxss_avx(auVar118,auVar160);
          auVar160 = vshufpd_avx(auVar160,auVar160,1);
          auVar160 = vmaxss_avx(auVar160,auVar118);
          local_860._0_4_ = auVar160._0_4_ * 1.9073486e-06;
          local_8e0._0_4_ = fVar221 * 1.9073486e-06;
          local_780._0_16_ = vshufps_avx(auVar123,auVar123,0xff);
          lVar107 = 4;
          do {
            local_aa0 = auVar259._0_4_;
            local_a00._0_4_ = 1.0 - local_aa0;
            auVar160 = vshufps_avx(auVar259._0_16_,auVar259._0_16_,0);
            fVar221 = auVar160._0_4_;
            fVar113 = auVar160._4_4_;
            fVar239 = auVar160._8_4_;
            fVar114 = auVar160._12_4_;
            auVar160 = vshufps_avx(ZEXT416((uint)local_a00._0_4_),ZEXT416((uint)local_a00._0_4_),0);
            fVar220 = auVar160._0_4_;
            fVar145 = auVar160._4_4_;
            fVar240 = auVar160._8_4_;
            fVar191 = auVar160._12_4_;
            fVar241 = (float)local_9c0._0_4_ * fVar221 + (float)local_9d0._0_4_ * fVar220;
            fVar242 = (float)local_9c0._4_4_ * fVar113 + (float)local_9d0._4_4_ * fVar145;
            fVar243 = fStack_9b8 * fVar239 + fStack_9c8 * fVar240;
            fVar244 = fStack_9b4 * fVar114 + fStack_9c4 * fVar191;
            auVar271._0_4_ =
                 fVar220 * ((float)local_9d0._0_4_ * fVar221 + fVar220 * (float)local_9b0._0_4_) +
                 fVar221 * fVar241;
            auVar271._4_4_ =
                 fVar145 * ((float)local_9d0._4_4_ * fVar113 + fVar145 * (float)local_9b0._4_4_) +
                 fVar113 * fVar242;
            auVar271._8_4_ =
                 fVar240 * (fStack_9c8 * fVar239 + fVar240 * fStack_9a8) + fVar239 * fVar243;
            auVar271._12_4_ =
                 fVar191 * (fStack_9c4 * fVar114 + fVar191 * fStack_9a4) + fVar114 * fVar244;
            auVar224._0_4_ =
                 fVar220 * fVar241 +
                 fVar221 * (fVar221 * (float)local_9e0._0_4_ + (float)local_9c0._0_4_ * fVar220);
            auVar224._4_4_ =
                 fVar145 * fVar242 +
                 fVar113 * (fVar113 * (float)local_9e0._4_4_ + (float)local_9c0._4_4_ * fVar145);
            auVar224._8_4_ =
                 fVar240 * fVar243 + fVar239 * (fVar239 * fStack_9d8 + fStack_9b8 * fVar240);
            auVar224._12_4_ =
                 fVar191 * fVar244 + fVar114 * (fVar114 * fStack_9d4 + fStack_9b4 * fVar191);
            auVar118 = auVar360._0_16_;
            auVar160 = vshufps_avx(auVar118,auVar118,0);
            auVar150._0_4_ = auVar160._0_4_ * (float)local_8c0._0_4_ + 0.0;
            auVar150._4_4_ = auVar160._4_4_ * (float)local_8c0._4_4_ + 0.0;
            auVar150._8_4_ = auVar160._8_4_ * fStack_8b8 + 0.0;
            auVar150._12_4_ = auVar160._12_4_ * fStack_8b4 + 0.0;
            auVar117._0_4_ = fVar220 * auVar271._0_4_ + fVar221 * auVar224._0_4_;
            auVar117._4_4_ = fVar145 * auVar271._4_4_ + fVar113 * auVar224._4_4_;
            auVar117._8_4_ = fVar240 * auVar271._8_4_ + fVar239 * auVar224._8_4_;
            auVar117._12_4_ = fVar191 * auVar271._12_4_ + fVar114 * auVar224._12_4_;
            local_6e0._0_16_ = auVar117;
            auVar160 = vsubps_avx(auVar150,auVar117);
            _local_9a0 = auVar160;
            auVar160 = vdpps_avx(auVar160,auVar160,0x7f);
            fStack_a9c = auVar259._4_4_;
            fStack_a98 = auVar259._8_4_;
            fStack_a94 = auVar259._12_4_;
            local_ae0._0_16_ = auVar118;
            local_a80._0_16_ = auVar160;
            if (auVar160._0_4_ < 0.0) {
              local_a00._0_16_ = ZEXT416((uint)local_a00._0_4_);
              local_960._0_16_ = auVar271;
              local_880._0_16_ = auVar224;
              fVar221 = sqrtf(auVar160._0_4_);
              auVar360 = ZEXT1664(local_ae0._0_16_);
              auVar259 = ZEXT1664(CONCAT412(fStack_a94,
                                            CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
              auVar224 = local_880._0_16_;
              auVar271 = local_960._0_16_;
            }
            else {
              auVar160 = vsqrtss_avx(auVar160,auVar160);
              fVar221 = auVar160._0_4_;
            }
            auVar160 = vsubps_avx(auVar224,auVar271);
            auVar303._0_4_ = auVar160._0_4_ * 3.0;
            auVar303._4_4_ = auVar160._4_4_ * 3.0;
            auVar303._8_4_ = auVar160._8_4_ * 3.0;
            auVar303._12_4_ = auVar160._12_4_ * 3.0;
            fVar113 = auVar259._0_4_;
            auVar160 = vshufps_avx(ZEXT416((uint)(fVar113 * 6.0)),ZEXT416((uint)(fVar113 * 6.0)),0);
            auVar118 = ZEXT416((uint)(((float)local_a00._0_4_ - (fVar113 + fVar113)) * 6.0));
            auVar123 = vshufps_avx(auVar118,auVar118,0);
            auVar118 = ZEXT416((uint)((fVar113 - ((float)local_a00._0_4_ + (float)local_a00._0_4_))
                                     * 6.0));
            auVar225 = vshufps_avx(auVar118,auVar118,0);
            auVar40 = vshufps_avx(ZEXT416((uint)((float)local_a00._0_4_ * 6.0)),
                                  ZEXT416((uint)((float)local_a00._0_4_ * 6.0)),0);
            auVar118 = vdpps_avx(auVar303,auVar303,0x7f);
            auVar151._0_4_ =
                 auVar40._0_4_ * (float)local_9b0._0_4_ +
                 auVar225._0_4_ * (float)local_9d0._0_4_ +
                 auVar160._0_4_ * (float)local_9e0._0_4_ + auVar123._0_4_ * (float)local_9c0._0_4_;
            auVar151._4_4_ =
                 auVar40._4_4_ * (float)local_9b0._4_4_ +
                 auVar225._4_4_ * (float)local_9d0._4_4_ +
                 auVar160._4_4_ * (float)local_9e0._4_4_ + auVar123._4_4_ * (float)local_9c0._4_4_;
            auVar151._8_4_ =
                 auVar40._8_4_ * fStack_9a8 +
                 auVar225._8_4_ * fStack_9c8 +
                 auVar160._8_4_ * fStack_9d8 + auVar123._8_4_ * fStack_9b8;
            auVar151._12_4_ =
                 auVar40._12_4_ * fStack_9a4 +
                 auVar225._12_4_ * fStack_9c4 +
                 auVar160._12_4_ * fStack_9d4 + auVar123._12_4_ * fStack_9b4;
            auVar160 = vblendps_avx(auVar118,_DAT_01feba10,0xe);
            auVar123 = vrsqrtss_avx(auVar160,auVar160);
            fVar239 = auVar123._0_4_;
            fVar113 = auVar118._0_4_;
            auVar123 = vdpps_avx(auVar303,auVar151,0x7f);
            auVar225 = vshufps_avx(auVar118,auVar118,0);
            auVar152._0_4_ = auVar151._0_4_ * auVar225._0_4_;
            auVar152._4_4_ = auVar151._4_4_ * auVar225._4_4_;
            auVar152._8_4_ = auVar151._8_4_ * auVar225._8_4_;
            auVar152._12_4_ = auVar151._12_4_ * auVar225._12_4_;
            auVar123 = vshufps_avx(auVar123,auVar123,0);
            auVar248._0_4_ = auVar303._0_4_ * auVar123._0_4_;
            auVar248._4_4_ = auVar303._4_4_ * auVar123._4_4_;
            auVar248._8_4_ = auVar303._8_4_ * auVar123._8_4_;
            auVar248._12_4_ = auVar303._12_4_ * auVar123._12_4_;
            auVar40 = vsubps_avx(auVar152,auVar248);
            auVar123 = vrcpss_avx(auVar160,auVar160);
            auVar160 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                  ZEXT416((uint)(auVar360._0_4_ * (float)local_8e0._0_4_)));
            auVar123 = ZEXT416((uint)(auVar123._0_4_ * (2.0 - fVar113 * auVar123._0_4_)));
            auVar123 = vshufps_avx(auVar123,auVar123,0);
            uVar105 = CONCAT44(auVar303._4_4_,auVar303._0_4_);
            auVar343._0_8_ = uVar105 ^ 0x8000000080000000;
            auVar343._8_4_ = -auVar303._8_4_;
            auVar343._12_4_ = -auVar303._12_4_;
            auVar225 = ZEXT416((uint)(fVar239 * 1.5 + fVar113 * -0.5 * fVar239 * fVar239 * fVar239))
            ;
            auVar225 = vshufps_avx(auVar225,auVar225,0);
            auVar226._0_4_ = auVar225._0_4_ * auVar40._0_4_ * auVar123._0_4_;
            auVar226._4_4_ = auVar225._4_4_ * auVar40._4_4_ * auVar123._4_4_;
            auVar226._8_4_ = auVar225._8_4_ * auVar40._8_4_ * auVar123._8_4_;
            auVar226._12_4_ = auVar225._12_4_ * auVar40._12_4_ * auVar123._12_4_;
            local_a20._0_4_ = auVar303._0_4_ * auVar225._0_4_;
            local_a20._4_4_ = auVar303._4_4_ * auVar225._4_4_;
            fStack_a18 = auVar303._8_4_ * auVar225._8_4_;
            fStack_a14 = auVar303._12_4_ * auVar225._12_4_;
            local_a00._0_16_ = auVar303;
            local_960._0_4_ = auVar160._0_4_;
            if (fVar113 < 0.0) {
              local_880._0_4_ = fVar221;
              local_980._0_16_ = auVar343;
              local_800._0_16_ = auVar226;
              fVar113 = sqrtf(fVar113);
              auVar226 = local_800._0_16_;
              auVar343 = local_980._0_16_;
              fVar220 = (float)local_960._0_4_;
            }
            else {
              auVar118 = vsqrtss_avx(auVar118,auVar118);
              fVar113 = auVar118._0_4_;
              fVar220 = auVar160._0_4_;
              local_880._0_4_ = fVar221;
            }
            auVar160 = vdpps_avx(_local_9a0,_local_a20,0x7f);
            local_980._0_4_ =
                 ((float)local_860._0_4_ / fVar113) * ((float)local_880._0_4_ + 1.0) +
                 fVar220 + (float)local_880._0_4_ * (float)local_860._0_4_;
            auVar118 = vdpps_avx(auVar343,_local_a20,0x7f);
            auVar123 = vdpps_avx(_local_9a0,auVar226,0x7f);
            auVar225 = vdpps_avx(_local_8c0,_local_a20,0x7f);
            auVar40 = vdpps_avx(_local_9a0,auVar343,0x7f);
            fVar221 = auVar118._0_4_ + auVar123._0_4_;
            fVar113 = auVar160._0_4_;
            auVar119._0_4_ = fVar113 * fVar113;
            auVar119._4_4_ = auVar160._4_4_ * auVar160._4_4_;
            auVar119._8_4_ = auVar160._8_4_ * auVar160._8_4_;
            auVar119._12_4_ = auVar160._12_4_ * auVar160._12_4_;
            auVar123 = vsubps_avx(local_a80._0_16_,auVar119);
            _local_a20 = ZEXT416((uint)fVar221);
            auVar118 = vdpps_avx(_local_9a0,_local_8c0,0x7f);
            fVar239 = auVar40._0_4_ - fVar113 * fVar221;
            local_880._0_16_ = auVar160;
            fVar113 = auVar118._0_4_ - fVar113 * auVar225._0_4_;
            auVar160 = vrsqrtss_avx(auVar123,auVar123);
            fVar114 = auVar123._0_4_;
            fVar221 = auVar160._0_4_;
            fVar221 = fVar221 * 1.5 + fVar114 * -0.5 * fVar221 * fVar221 * fVar221;
            if (fVar114 < 0.0) {
              local_800._0_16_ = auVar225;
              local_700._0_4_ = fVar239;
              local_720._0_4_ = fVar113;
              local_740._0_4_ = fVar221;
              fVar114 = sqrtf(fVar114);
              fVar221 = (float)local_740._0_4_;
              fVar239 = (float)local_700._0_4_;
              fVar113 = (float)local_720._0_4_;
              auVar225 = local_800._0_16_;
              auVar160 = local_a80._0_16_;
              fVar220 = (float)local_960._0_4_;
            }
            else {
              auVar160 = vsqrtss_avx(auVar123,auVar123);
              fVar114 = auVar160._0_4_;
              auVar160 = local_a80._0_16_;
            }
            auVar379 = ZEXT1664(auVar160);
            auVar123 = vpermilps_avx(local_6e0._0_16_,0xff);
            auVar40 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
            fVar239 = fVar239 * fVar221 - auVar40._0_4_;
            auVar249._0_8_ = auVar225._0_8_ ^ 0x8000000080000000;
            auVar249._8_4_ = auVar225._8_4_ ^ 0x80000000;
            auVar249._12_4_ = auVar225._12_4_ ^ 0x80000000;
            auVar272._0_4_ = -fVar239;
            auVar272._4_4_ = 0x80000000;
            auVar272._8_4_ = 0x80000000;
            auVar272._12_4_ = 0x80000000;
            auVar118 = vinsertps_avx(ZEXT416((uint)(fVar113 * fVar221)),auVar249,0x10);
            auVar225 = vmovsldup_avx(ZEXT416((uint)(local_a20._0_4_ * fVar113 * fVar221 -
                                                   auVar225._0_4_ * fVar239)));
            auVar118 = vdivps_avx(auVar118,auVar225);
            auVar313 = ZEXT1664(local_880._0_16_);
            auVar153 = ZEXT416((uint)(fVar114 - auVar123._0_4_));
            auVar123 = vinsertps_avx(local_880._0_16_,auVar153,0x10);
            auVar227._0_4_ = auVar123._0_4_ * auVar118._0_4_;
            auVar227._4_4_ = auVar123._4_4_ * auVar118._4_4_;
            auVar227._8_4_ = auVar123._8_4_ * auVar118._8_4_;
            auVar227._12_4_ = auVar123._12_4_ * auVar118._12_4_;
            auVar118 = vinsertps_avx(auVar272,_local_a20,0x1c);
            auVar118 = vdivps_avx(auVar118,auVar225);
            auVar204._0_4_ = auVar123._0_4_ * auVar118._0_4_;
            auVar204._4_4_ = auVar123._4_4_ * auVar118._4_4_;
            auVar204._8_4_ = auVar123._8_4_ * auVar118._8_4_;
            auVar204._12_4_ = auVar123._12_4_ * auVar118._12_4_;
            auVar118 = vhaddps_avx(auVar227,auVar227);
            auVar123 = vhaddps_avx(auVar204,auVar204);
            local_aa0 = local_aa0 - auVar118._0_4_;
            auVar259 = ZEXT464((uint)local_aa0);
            fVar294 = (float)local_ae0._0_4_ - auVar123._0_4_;
            auVar360 = ZEXT464((uint)fVar294);
            auVar250._8_4_ = 0x7fffffff;
            auVar250._0_8_ = 0x7fffffff7fffffff;
            auVar250._12_4_ = 0x7fffffff;
            auVar288 = ZEXT1664(auVar250);
            auVar118 = vandps_avx(local_880._0_16_,auVar250);
            fVar114 = (float)local_900._4_4_;
            fVar145 = fStack_8f8;
            fVar240 = fStack_8f4;
            fVar191 = fStack_8f0;
            fVar241 = fStack_8ec;
            fVar242 = fStack_8e8;
            fVar221 = (float)local_900._0_4_;
            fVar243 = (float)local_820._4_4_;
            fVar244 = fStack_818;
            fVar260 = fStack_814;
            fVar261 = fStack_810;
            fVar262 = fStack_80c;
            fVar263 = fStack_808;
            fVar113 = (float)local_820._0_4_;
            fVar264 = (float)local_840._4_4_;
            fVar266 = fStack_838;
            fVar268 = fStack_834;
            fVar289 = fStack_830;
            fVar290 = fStack_82c;
            fVar292 = fStack_828;
            fVar239 = (float)local_840._0_4_;
            if ((float)local_980._0_4_ <= auVar118._0_4_) {
LAB_011e262c:
              bVar90 = false;
LAB_011e2635:
              auVar336 = ZEXT864(0) << 0x20;
            }
            else {
              auVar118 = vandps_avx(auVar153,auVar250);
              if ((float)local_780._0_4_ * 1.9073486e-06 + fVar220 + (float)local_980._0_4_ <=
                  auVar118._0_4_) goto LAB_011e262c;
              fVar294 = fVar294 + (float)local_7c0._0_4_;
              auVar360 = ZEXT464((uint)fVar294);
              bVar90 = true;
              if ((fVar294 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
                 (fVar220 = (ray->super_RayK<1>).tfar, fVar220 < fVar294)) goto LAB_011e2635;
              auVar336 = ZEXT864(0) << 0x20;
              if ((0.0 <= local_aa0) && (local_aa0 <= 1.0)) {
                auVar118 = vrsqrtss_avx(auVar160,auVar160);
                fVar296 = auVar118._0_4_;
                pGVar31 = (context->scene->geometries).items[local_aa8].ptr;
                if ((pGVar31->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar118 = ZEXT416((uint)(fVar296 * 1.5 +
                                           auVar160._0_4_ * -0.5 * fVar296 * fVar296 * fVar296));
                  auVar118 = vshufps_avx(auVar118,auVar118,0);
                  auVar154._0_4_ = auVar118._0_4_ * (float)local_9a0._0_4_;
                  auVar154._4_4_ = auVar118._4_4_ * (float)local_9a0._4_4_;
                  auVar154._8_4_ = auVar118._8_4_ * fStack_998;
                  auVar154._12_4_ = auVar118._12_4_ * fStack_994;
                  auVar120._0_4_ = local_a00._0_4_ + auVar40._0_4_ * auVar154._0_4_;
                  auVar120._4_4_ = local_a00._4_4_ + auVar40._4_4_ * auVar154._4_4_;
                  auVar120._8_4_ = local_a00._8_4_ + auVar40._8_4_ * auVar154._8_4_;
                  auVar120._12_4_ = local_a00._12_4_ + auVar40._12_4_ * auVar154._12_4_;
                  auVar118 = vshufps_avx(auVar154,auVar154,0xc9);
                  auVar123 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                  auVar155._0_4_ = auVar123._0_4_ * auVar154._0_4_;
                  auVar155._4_4_ = auVar123._4_4_ * auVar154._4_4_;
                  auVar155._8_4_ = auVar123._8_4_ * auVar154._8_4_;
                  auVar155._12_4_ = auVar123._12_4_ * auVar154._12_4_;
                  auVar205._0_4_ = local_a00._0_4_ * auVar118._0_4_;
                  auVar205._4_4_ = local_a00._4_4_ * auVar118._4_4_;
                  auVar205._8_4_ = local_a00._8_4_ * auVar118._8_4_;
                  auVar205._12_4_ = local_a00._12_4_ * auVar118._12_4_;
                  auVar225 = vsubps_avx(auVar205,auVar155);
                  auVar118 = vshufps_avx(auVar225,auVar225,0xc9);
                  auVar123 = vshufps_avx(auVar120,auVar120,0xc9);
                  auVar206._0_4_ = auVar123._0_4_ * auVar118._0_4_;
                  auVar206._4_4_ = auVar123._4_4_ * auVar118._4_4_;
                  auVar206._8_4_ = auVar123._8_4_ * auVar118._8_4_;
                  auVar206._12_4_ = auVar123._12_4_ * auVar118._12_4_;
                  auVar118 = vshufps_avx(auVar225,auVar225,0xd2);
                  auVar121._0_4_ = auVar120._0_4_ * auVar118._0_4_;
                  auVar121._4_4_ = auVar120._4_4_ * auVar118._4_4_;
                  auVar121._8_4_ = auVar120._8_4_ * auVar118._8_4_;
                  auVar121._12_4_ = auVar120._12_4_ * auVar118._12_4_;
                  auVar118 = vsubps_avx(auVar206,auVar121);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar31->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar294;
                    auVar160 = vshufps_avx(auVar118,auVar118,0xe9);
                    uVar9 = vmovlps_avx(auVar160);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                    (ray->Ng).field_0.field_0.z = auVar118._0_4_;
                    ray->u = local_aa0;
                    ray->v = 0.0;
                    ray->primID = (uint)local_a58;
                    ray->geomID = (uint)local_aa8;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    auVar123 = vshufps_avx(auVar118,auVar118,0xe9);
                    local_930 = vmovlps_avx(auVar123);
                    local_928 = auVar118._0_4_;
                    local_924 = local_aa0;
                    local_920 = 0;
                    local_91c = (uint)local_a58;
                    local_918 = (uint)local_aa8;
                    local_914 = context->user->instID[0];
                    local_910 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar294;
                    local_ae4 = -1;
                    local_a50.valid = &local_ae4;
                    local_a50.geometryUserPtr = pGVar31->userPtr;
                    local_a50.context = context->user;
                    local_a50.ray = (RTCRayN *)ray;
                    local_a50.hit = (RTCHitN *)&local_930;
                    local_a50.N = 1;
                    fStack_a9c = 0.0;
                    fStack_a98 = 0.0;
                    fStack_a94 = 0.0;
                    local_ae0._0_16_ = ZEXT416((uint)fVar294);
                    local_a80._0_4_ = fVar220;
                    if (pGVar31->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011e278c:
                      p_Var34 = context->args->filter;
                      fVar221 = (float)local_900._0_4_;
                      fVar114 = (float)local_900._4_4_;
                      fVar145 = fStack_8f8;
                      fVar240 = fStack_8f4;
                      fVar191 = fStack_8f0;
                      fVar241 = fStack_8ec;
                      fVar242 = fStack_8e8;
                      fVar113 = (float)local_820._0_4_;
                      fVar243 = (float)local_820._4_4_;
                      fVar244 = fStack_818;
                      fVar260 = fStack_814;
                      fVar261 = fStack_810;
                      fVar262 = fStack_80c;
                      fVar263 = fStack_808;
                      fVar239 = (float)local_840._0_4_;
                      fVar264 = (float)local_840._4_4_;
                      fVar266 = fStack_838;
                      fVar268 = fStack_834;
                      fVar289 = fStack_830;
                      fVar290 = fStack_82c;
                      fVar292 = fStack_828;
                      if (p_Var34 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar31->field_8).field_0x2 & 0x40) != 0)) {
                          auVar313 = ZEXT1664(auVar313._0_16_);
                          auVar379 = ZEXT1664(auVar379._0_16_);
                          (*p_Var34)(&local_a50);
                          auVar360 = ZEXT1664(local_ae0._0_16_);
                          auVar259 = ZEXT1664(CONCAT412(fStack_a94,
                                                        CONCAT48(fStack_a98,
                                                                 CONCAT44(fStack_a9c,local_aa0))));
                          auVar288 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                          fVar220 = (float)local_a80._0_4_;
                          fVar221 = (float)local_900._0_4_;
                          fVar114 = (float)local_900._4_4_;
                          fVar145 = fStack_8f8;
                          fVar240 = fStack_8f4;
                          fVar191 = fStack_8f0;
                          fVar241 = fStack_8ec;
                          fVar242 = fStack_8e8;
                          fVar113 = (float)local_820._0_4_;
                          fVar243 = (float)local_820._4_4_;
                          fVar244 = fStack_818;
                          fVar260 = fStack_814;
                          fVar261 = fStack_810;
                          fVar262 = fStack_80c;
                          fVar263 = fStack_808;
                          fVar239 = (float)local_840._0_4_;
                          fVar264 = (float)local_840._4_4_;
                          fVar266 = fStack_838;
                          fVar268 = fStack_834;
                          fVar289 = fStack_830;
                          fVar290 = fStack_82c;
                          fVar292 = fStack_828;
                        }
                        if (*local_a50.valid == 0) goto LAB_011e285c;
                      }
                      (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).components[0] =
                           *(float *)local_a50.hit;
                      (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_a50.hit + 4);
                      (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_a50.hit + 8);
                      *(float *)((long)local_a50.ray + 0x3c) = *(float *)(local_a50.hit + 0xc);
                      *(float *)((long)local_a50.ray + 0x40) = *(float *)(local_a50.hit + 0x10);
                      *(float *)((long)local_a50.ray + 0x44) = *(float *)(local_a50.hit + 0x14);
                      *(float *)((long)local_a50.ray + 0x48) = *(float *)(local_a50.hit + 0x18);
                      *(float *)((long)local_a50.ray + 0x4c) = *(float *)(local_a50.hit + 0x1c);
                      *(float *)((long)local_a50.ray + 0x50) = *(float *)(local_a50.hit + 0x20);
                    }
                    else {
                      auVar313 = ZEXT1664(local_880._0_16_);
                      auVar379 = ZEXT1664(auVar160);
                      (*pGVar31->intersectionFilterN)(&local_a50);
                      auVar360 = ZEXT1664(local_ae0._0_16_);
                      auVar259 = ZEXT1664(CONCAT412(fStack_a94,
                                                    CONCAT48(fStack_a98,
                                                             CONCAT44(fStack_a9c,local_aa0))));
                      auVar288 = ZEXT1664(CONCAT412(0x7fffffff,
                                                    CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                      fVar220 = (float)local_a80._0_4_;
                      fVar221 = (float)local_900._0_4_;
                      fVar114 = (float)local_900._4_4_;
                      fVar145 = fStack_8f8;
                      fVar240 = fStack_8f4;
                      fVar191 = fStack_8f0;
                      fVar241 = fStack_8ec;
                      fVar242 = fStack_8e8;
                      fVar113 = (float)local_820._0_4_;
                      fVar243 = (float)local_820._4_4_;
                      fVar244 = fStack_818;
                      fVar260 = fStack_814;
                      fVar261 = fStack_810;
                      fVar262 = fStack_80c;
                      fVar263 = fStack_808;
                      fVar239 = (float)local_840._0_4_;
                      fVar264 = (float)local_840._4_4_;
                      fVar266 = fStack_838;
                      fVar268 = fStack_834;
                      fVar289 = fStack_830;
                      fVar290 = fStack_82c;
                      fVar292 = fStack_828;
                      if (*local_a50.valid != 0) goto LAB_011e278c;
LAB_011e285c:
                      (ray->super_RayK<1>).tfar = fVar220;
                    }
                  }
                }
              }
            }
            auVar174 = local_600;
            bVar111 = lVar107 != 0;
            lVar107 = lVar107 + -1;
          } while ((!bVar90) && (bVar111));
          fVar220 = (ray->super_RayK<1>).tfar;
          auVar136._4_4_ = fVar220;
          auVar136._0_4_ = fVar220;
          auVar136._8_4_ = fVar220;
          auVar136._12_4_ = fVar220;
          auVar136._16_4_ = fVar220;
          auVar136._20_4_ = fVar220;
          auVar136._24_4_ = fVar220;
          auVar136._28_4_ = fVar220;
          auVar135 = vcmpps_avx(_local_560,auVar136,2);
          local_600 = vandps_avx(auVar135,local_600);
          auVar259 = ZEXT3264(local_600);
          auVar174 = auVar174 & auVar135;
          auVar35 = local_660;
        } while ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar174 >> 0x7f,0) != '\0') ||
                   (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar174 >> 0xbf,0) != '\0') ||
                 (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar174[0x1f] < '\0');
      }
      auVar137._0_4_ =
           fVar221 * (float)local_7a0._0_4_ +
           fVar113 * (float)local_680._0_4_ + fVar239 * (float)local_6a0._0_4_;
      auVar137._4_4_ =
           fVar114 * (float)local_7a0._4_4_ +
           fVar243 * (float)local_680._4_4_ + fVar264 * (float)local_6a0._4_4_;
      auVar137._8_4_ = fVar145 * fStack_798 + fVar244 * fStack_678 + fVar266 * fStack_698;
      auVar137._12_4_ = fVar240 * fStack_794 + fVar260 * fStack_674 + fVar268 * fStack_694;
      auVar137._16_4_ = fVar191 * fStack_790 + fVar261 * fStack_670 + fVar289 * fStack_690;
      auVar137._20_4_ = fVar241 * fStack_78c + fVar262 * fStack_66c + fVar290 * fStack_68c;
      auVar137._24_4_ = fVar242 * fStack_788 + fVar263 * fStack_668 + fVar292 * fStack_688;
      auVar137._28_4_ = auVar135._28_4_ + auVar135._28_4_ + auVar259._28_4_;
      auVar180._8_4_ = 0x7fffffff;
      auVar180._0_8_ = 0x7fffffff7fffffff;
      auVar180._12_4_ = 0x7fffffff;
      auVar180._16_4_ = 0x7fffffff;
      auVar180._20_4_ = 0x7fffffff;
      auVar180._24_4_ = 0x7fffffff;
      auVar180._28_4_ = 0x7fffffff;
      auVar135 = vandps_avx(auVar137,auVar180);
      auVar181._8_4_ = 0x3e99999a;
      auVar181._0_8_ = 0x3e99999a3e99999a;
      auVar181._12_4_ = 0x3e99999a;
      auVar181._16_4_ = 0x3e99999a;
      auVar181._20_4_ = 0x3e99999a;
      auVar181._24_4_ = 0x3e99999a;
      auVar181._28_4_ = 0x3e99999a;
      auVar135 = vcmpps_avx(auVar135,auVar181,1);
      auVar174 = vorps_avx(auVar135,local_5e0);
      auVar182._0_4_ = (float)local_5c0._0_4_ + (float)local_760._0_4_;
      auVar182._4_4_ = (float)local_5c0._4_4_ + (float)local_760._4_4_;
      auVar182._8_4_ = fStack_5b8 + fStack_758;
      auVar182._12_4_ = fStack_5b4 + fStack_754;
      auVar182._16_4_ = fStack_5b0 + fStack_750;
      auVar182._20_4_ = fStack_5ac + fStack_74c;
      auVar182._24_4_ = fStack_5a8 + fStack_748;
      auVar182._28_4_ = fStack_5a4 + fStack_744;
      fVar221 = (ray->super_RayK<1>).tfar;
      auVar216._4_4_ = fVar221;
      auVar216._0_4_ = fVar221;
      auVar216._8_4_ = fVar221;
      auVar216._12_4_ = fVar221;
      auVar216._16_4_ = fVar221;
      auVar216._20_4_ = fVar221;
      auVar216._24_4_ = fVar221;
      auVar216._28_4_ = fVar221;
      auVar135 = vcmpps_avx(auVar182,auVar216,2);
      local_780 = vandps_avx(auVar135,auVar35);
      auVar183._8_4_ = 3;
      auVar183._0_8_ = 0x300000003;
      auVar183._12_4_ = 3;
      auVar183._16_4_ = 3;
      auVar183._20_4_ = 3;
      auVar183._24_4_ = 3;
      auVar183._28_4_ = 3;
      auVar217._8_4_ = 2;
      auVar217._0_8_ = 0x200000002;
      auVar217._12_4_ = 2;
      auVar217._16_4_ = 2;
      auVar217._20_4_ = 2;
      auVar217._24_4_ = 2;
      auVar217._28_4_ = 2;
      auVar135 = vblendvps_avx(auVar217,auVar183,auVar174);
      auVar160 = vpcmpgtd_avx(auVar135._16_16_,local_490);
      auVar118 = vpshufd_avx(_local_6c0,0);
      auVar118 = vpcmpgtd_avx(auVar135._0_16_,auVar118);
      auVar184._16_16_ = auVar160;
      auVar184._0_16_ = auVar118;
      _local_8a0 = vblendps_avx(ZEXT1632(auVar118),auVar184,0xf0);
      local_620 = vandnps_avx(_local_8a0,local_780);
      auVar135 = local_780 & ~_local_8a0;
      if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar135 >> 0x7f,0) != '\0') ||
            (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar135 >> 0xbf,0) != '\0') ||
          (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar135[0x1f] < '\0') {
        local_720 = _local_480;
        local_740._4_4_ = (float)local_480._4_4_ + (float)local_760._4_4_;
        local_740._0_4_ = (float)local_480._0_4_ + (float)local_760._0_4_;
        fStack_738 = fStack_478 + fStack_758;
        fStack_734 = fStack_474 + fStack_754;
        fStack_730 = fStack_470 + fStack_750;
        fStack_72c = fStack_46c + fStack_74c;
        fStack_728 = fStack_468 + fStack_748;
        fStack_724 = fStack_464 + fStack_744;
        do {
          auVar251 = auVar288._0_16_;
          auVar185._8_4_ = 0x7f800000;
          auVar185._0_8_ = 0x7f8000007f800000;
          auVar185._12_4_ = 0x7f800000;
          auVar185._16_4_ = 0x7f800000;
          auVar185._20_4_ = 0x7f800000;
          auVar185._24_4_ = 0x7f800000;
          auVar185._28_4_ = 0x7f800000;
          auVar135 = vblendvps_avx(auVar185,local_720,local_620);
          auVar174 = vshufps_avx(auVar135,auVar135,0xb1);
          auVar174 = vminps_avx(auVar135,auVar174);
          auVar35 = vshufpd_avx(auVar174,auVar174,5);
          auVar174 = vminps_avx(auVar174,auVar35);
          auVar35 = vperm2f128_avx(auVar174,auVar174,1);
          auVar174 = vminps_avx(auVar174,auVar35);
          auVar174 = vcmpps_avx(auVar135,auVar174,0);
          auVar35 = local_620 & auVar174;
          auVar135 = local_620;
          if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar35 >> 0x7f,0) != '\0') ||
                (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar35 >> 0xbf,0) != '\0') ||
              (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar35[0x1f] < '\0') {
            auVar135 = vandps_avx(auVar174,local_620);
          }
          uVar109 = vmovmskps_avx(auVar135);
          uVar104 = 0;
          if (uVar109 != 0) {
            for (; (uVar109 >> uVar104 & 1) == 0; uVar104 = uVar104 + 1) {
            }
          }
          uVar105 = (ulong)uVar104;
          *(undefined4 *)(local_620 + uVar105 * 4) = 0;
          aVar12 = (ray->super_RayK<1>).dir.field_0;
          _local_8c0 = (undefined1  [16])aVar12;
          auVar160 = vdpps_avx((undefined1  [16])aVar12,(undefined1  [16])aVar12,0x7f);
          local_aa0 = local_4e0[uVar105];
          auVar259 = ZEXT464((uint)local_aa0);
          auVar360 = ZEXT464(*(uint *)(local_460 + uVar105 * 4));
          if (auVar160._0_4_ < 0.0) {
            fStack_a9c = 0.0;
            fStack_a98 = 0.0;
            fStack_a94 = 0.0;
            local_ae0._0_16_ = ZEXT416(*(uint *)(local_460 + uVar105 * 4));
            fVar221 = sqrtf(auVar160._0_4_);
            auVar360 = ZEXT1664(local_ae0._0_16_);
            auVar259 = ZEXT1664(CONCAT412(fStack_a94,
                                          CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
            auVar251._8_4_ = 0x7fffffff;
            auVar251._0_8_ = 0x7fffffff7fffffff;
            auVar251._12_4_ = 0x7fffffff;
            auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          else {
            auVar160 = vsqrtss_avx(auVar160,auVar160);
            fVar221 = auVar160._0_4_;
          }
          auVar118 = vminps_avx(_local_9b0,_local_9d0);
          auVar160 = vmaxps_avx(_local_9b0,_local_9d0);
          auVar123 = vminps_avx(_local_9c0,_local_9e0);
          auVar225 = vminps_avx(auVar118,auVar123);
          auVar118 = vmaxps_avx(_local_9c0,_local_9e0);
          auVar123 = vmaxps_avx(auVar160,auVar118);
          auVar160 = vandps_avx(auVar225,auVar251);
          auVar118 = vandps_avx(auVar123,auVar251);
          auVar160 = vmaxps_avx(auVar160,auVar118);
          auVar118 = vmovshdup_avx(auVar160);
          auVar118 = vmaxss_avx(auVar118,auVar160);
          auVar160 = vshufpd_avx(auVar160,auVar160,1);
          auVar160 = vmaxss_avx(auVar160,auVar118);
          local_860._0_4_ = auVar160._0_4_ * 1.9073486e-06;
          local_880._0_4_ = fVar221 * 1.9073486e-06;
          local_700._0_16_ = vshufps_avx(auVar123,auVar123,0xff);
          lVar107 = 4;
          do {
            local_aa0 = auVar259._0_4_;
            local_a00._0_4_ = 1.0 - local_aa0;
            auVar160 = vshufps_avx(auVar259._0_16_,auVar259._0_16_,0);
            fVar221 = auVar160._0_4_;
            fVar113 = auVar160._4_4_;
            fVar239 = auVar160._8_4_;
            fVar114 = auVar160._12_4_;
            auVar160 = vshufps_avx(ZEXT416((uint)local_a00._0_4_),ZEXT416((uint)local_a00._0_4_),0);
            fVar220 = auVar160._0_4_;
            fVar145 = auVar160._4_4_;
            fVar240 = auVar160._8_4_;
            fVar191 = auVar160._12_4_;
            fVar241 = (float)local_9c0._0_4_ * fVar221 + (float)local_9d0._0_4_ * fVar220;
            fVar242 = (float)local_9c0._4_4_ * fVar113 + (float)local_9d0._4_4_ * fVar145;
            fVar243 = fStack_9b8 * fVar239 + fStack_9c8 * fVar240;
            fVar244 = fStack_9b4 * fVar114 + fStack_9c4 * fVar191;
            auVar273._0_4_ =
                 fVar220 * ((float)local_9d0._0_4_ * fVar221 + fVar220 * (float)local_9b0._0_4_) +
                 fVar221 * fVar241;
            auVar273._4_4_ =
                 fVar145 * ((float)local_9d0._4_4_ * fVar113 + fVar145 * (float)local_9b0._4_4_) +
                 fVar113 * fVar242;
            auVar273._8_4_ =
                 fVar240 * (fStack_9c8 * fVar239 + fVar240 * fStack_9a8) + fVar239 * fVar243;
            auVar273._12_4_ =
                 fVar191 * (fStack_9c4 * fVar114 + fVar191 * fStack_9a4) + fVar114 * fVar244;
            auVar228._0_4_ =
                 fVar220 * fVar241 +
                 fVar221 * (fVar221 * (float)local_9e0._0_4_ + (float)local_9c0._0_4_ * fVar220);
            auVar228._4_4_ =
                 fVar145 * fVar242 +
                 fVar113 * (fVar113 * (float)local_9e0._4_4_ + (float)local_9c0._4_4_ * fVar145);
            auVar228._8_4_ =
                 fVar240 * fVar243 + fVar239 * (fVar239 * fStack_9d8 + fStack_9b8 * fVar240);
            auVar228._12_4_ =
                 fVar191 * fVar244 + fVar114 * (fVar114 * fStack_9d4 + fStack_9b4 * fVar191);
            auVar118 = auVar360._0_16_;
            auVar160 = vshufps_avx(auVar118,auVar118,0);
            auVar156._0_4_ = auVar160._0_4_ * (float)local_8c0._0_4_ + 0.0;
            auVar156._4_4_ = auVar160._4_4_ * (float)local_8c0._4_4_ + 0.0;
            auVar156._8_4_ = auVar160._8_4_ * fStack_8b8 + 0.0;
            auVar156._12_4_ = auVar160._12_4_ * fStack_8b4 + 0.0;
            auVar122._0_4_ = fVar220 * auVar273._0_4_ + fVar221 * auVar228._0_4_;
            auVar122._4_4_ = fVar145 * auVar273._4_4_ + fVar113 * auVar228._4_4_;
            auVar122._8_4_ = fVar240 * auVar273._8_4_ + fVar239 * auVar228._8_4_;
            auVar122._12_4_ = fVar191 * auVar273._12_4_ + fVar114 * auVar228._12_4_;
            local_6e0._0_16_ = auVar122;
            auVar160 = vsubps_avx(auVar156,auVar122);
            _local_9a0 = auVar160;
            auVar160 = vdpps_avx(auVar160,auVar160,0x7f);
            fStack_a9c = auVar259._4_4_;
            fStack_a98 = auVar259._8_4_;
            fStack_a94 = auVar259._12_4_;
            local_ae0._0_16_ = auVar118;
            local_a80._0_16_ = auVar160;
            if (auVar160._0_4_ < 0.0) {
              local_a00._0_16_ = ZEXT416((uint)local_a00._0_4_);
              local_960._0_16_ = auVar273;
              local_980._0_16_ = auVar228;
              fVar221 = sqrtf(auVar160._0_4_);
              auVar259 = ZEXT1664(CONCAT412(fStack_a94,
                                            CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
              auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar228 = local_980._0_16_;
              auVar273 = local_960._0_16_;
              auVar118 = local_ae0._0_16_;
            }
            else {
              auVar160 = vsqrtss_avx(auVar160,auVar160);
              fVar221 = auVar160._0_4_;
            }
            auVar160 = vsubps_avx(auVar228,auVar273);
            auVar304._0_4_ = auVar160._0_4_ * 3.0;
            auVar304._4_4_ = auVar160._4_4_ * 3.0;
            auVar304._8_4_ = auVar160._8_4_ * 3.0;
            auVar304._12_4_ = auVar160._12_4_ * 3.0;
            fVar113 = auVar259._0_4_;
            auVar160 = vshufps_avx(ZEXT416((uint)(fVar113 * 6.0)),ZEXT416((uint)(fVar113 * 6.0)),0);
            auVar123 = ZEXT416((uint)(((float)local_a00._0_4_ - (fVar113 + fVar113)) * 6.0));
            auVar225 = vshufps_avx(auVar123,auVar123,0);
            auVar123 = ZEXT416((uint)((fVar113 - ((float)local_a00._0_4_ + (float)local_a00._0_4_))
                                     * 6.0));
            auVar40 = vshufps_avx(auVar123,auVar123,0);
            auVar153 = vshufps_avx(ZEXT416((uint)((float)local_a00._0_4_ * 6.0)),
                                   ZEXT416((uint)((float)local_a00._0_4_ * 6.0)),0);
            auVar123 = vdpps_avx(auVar304,auVar304,0x7f);
            auVar157._0_4_ =
                 auVar153._0_4_ * (float)local_9b0._0_4_ +
                 auVar40._0_4_ * (float)local_9d0._0_4_ +
                 auVar160._0_4_ * (float)local_9e0._0_4_ + auVar225._0_4_ * (float)local_9c0._0_4_;
            auVar157._4_4_ =
                 auVar153._4_4_ * (float)local_9b0._4_4_ +
                 auVar40._4_4_ * (float)local_9d0._4_4_ +
                 auVar160._4_4_ * (float)local_9e0._4_4_ + auVar225._4_4_ * (float)local_9c0._4_4_;
            auVar157._8_4_ =
                 auVar153._8_4_ * fStack_9a8 +
                 auVar40._8_4_ * fStack_9c8 +
                 auVar160._8_4_ * fStack_9d8 + auVar225._8_4_ * fStack_9b8;
            auVar157._12_4_ =
                 auVar153._12_4_ * fStack_9a4 +
                 auVar40._12_4_ * fStack_9c4 +
                 auVar160._12_4_ * fStack_9d4 + auVar225._12_4_ * fStack_9b4;
            auVar160 = vblendps_avx(auVar123,_DAT_01feba10,0xe);
            auVar225 = vrsqrtss_avx(auVar160,auVar160);
            fVar239 = auVar225._0_4_;
            fVar113 = auVar123._0_4_;
            auVar225 = vdpps_avx(auVar304,auVar157,0x7f);
            auVar40 = vshufps_avx(auVar123,auVar123,0);
            auVar158._0_4_ = auVar157._0_4_ * auVar40._0_4_;
            auVar158._4_4_ = auVar157._4_4_ * auVar40._4_4_;
            auVar158._8_4_ = auVar157._8_4_ * auVar40._8_4_;
            auVar158._12_4_ = auVar157._12_4_ * auVar40._12_4_;
            auVar225 = vshufps_avx(auVar225,auVar225,0);
            auVar252._0_4_ = auVar304._0_4_ * auVar225._0_4_;
            auVar252._4_4_ = auVar304._4_4_ * auVar225._4_4_;
            auVar252._8_4_ = auVar304._8_4_ * auVar225._8_4_;
            auVar252._12_4_ = auVar304._12_4_ * auVar225._12_4_;
            auVar40 = vsubps_avx(auVar158,auVar252);
            auVar225 = vrcpss_avx(auVar160,auVar160);
            auVar160 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                  ZEXT416((uint)(auVar118._0_4_ * (float)local_880._0_4_)));
            auVar118 = ZEXT416((uint)(auVar225._0_4_ * (2.0 - fVar113 * auVar225._0_4_)));
            auVar118 = vshufps_avx(auVar118,auVar118,0);
            uVar105 = CONCAT44(auVar304._4_4_,auVar304._0_4_);
            auVar274._0_8_ = uVar105 ^ 0x8000000080000000;
            auVar274._8_4_ = -auVar304._8_4_;
            auVar274._12_4_ = -auVar304._12_4_;
            auVar225 = ZEXT416((uint)(fVar239 * 1.5 + fVar113 * -0.5 * fVar239 * fVar239 * fVar239))
            ;
            auVar225 = vshufps_avx(auVar225,auVar225,0);
            auVar229._0_4_ = auVar225._0_4_ * auVar40._0_4_ * auVar118._0_4_;
            auVar229._4_4_ = auVar225._4_4_ * auVar40._4_4_ * auVar118._4_4_;
            auVar229._8_4_ = auVar225._8_4_ * auVar40._8_4_ * auVar118._8_4_;
            auVar229._12_4_ = auVar225._12_4_ * auVar40._12_4_ * auVar118._12_4_;
            auVar344._0_4_ = auVar304._0_4_ * auVar225._0_4_;
            auVar344._4_4_ = auVar304._4_4_ * auVar225._4_4_;
            auVar344._8_4_ = auVar304._8_4_ * auVar225._8_4_;
            auVar344._12_4_ = auVar304._12_4_ * auVar225._12_4_;
            local_a00._0_16_ = auVar304;
            local_960._0_4_ = auVar160._0_4_;
            if (fVar113 < 0.0) {
              local_980._0_4_ = fVar221;
              local_8e0._0_16_ = auVar344;
              _local_900 = auVar229;
              _local_a20 = auVar274;
              fVar239 = sqrtf(fVar113);
              auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar229 = _local_900;
              auVar274 = _local_a20;
              auVar344 = local_8e0._0_16_;
              fVar113 = (float)local_960._0_4_;
              fVar221 = (float)local_980._0_4_;
            }
            else {
              auVar118 = vsqrtss_avx(auVar123,auVar123);
              fVar239 = auVar118._0_4_;
              fVar113 = auVar160._0_4_;
            }
            auVar160 = vdpps_avx(_local_9a0,auVar344,0x7f);
            fVar221 = ((float)local_860._0_4_ / fVar239) * (fVar221 + 1.0) +
                      fVar113 + fVar221 * (float)local_860._0_4_;
            auVar118 = vdpps_avx(auVar274,auVar344,0x7f);
            auVar123 = vdpps_avx(_local_9a0,auVar229,0x7f);
            auVar225 = vdpps_avx(_local_8c0,auVar344,0x7f);
            auVar40 = vdpps_avx(_local_9a0,auVar274,0x7f);
            fVar239 = auVar118._0_4_ + auVar123._0_4_;
            fVar114 = auVar160._0_4_;
            auVar124._0_4_ = fVar114 * fVar114;
            auVar124._4_4_ = auVar160._4_4_ * auVar160._4_4_;
            auVar124._8_4_ = auVar160._8_4_ * auVar160._8_4_;
            auVar124._12_4_ = auVar160._12_4_ * auVar160._12_4_;
            auVar123 = vsubps_avx(local_a80._0_16_,auVar124);
            auVar118 = vdpps_avx(_local_9a0,_local_8c0,0x7f);
            fVar220 = auVar40._0_4_ - fVar114 * fVar239;
            fVar145 = auVar118._0_4_ - fVar114 * auVar225._0_4_;
            auVar118 = vrsqrtss_avx(auVar123,auVar123);
            fVar240 = auVar123._0_4_;
            fVar114 = auVar118._0_4_;
            fVar114 = fVar114 * 1.5 + fVar240 * -0.5 * fVar114 * fVar114 * fVar114;
            if (fVar240 < 0.0) {
              local_980._0_16_ = auVar160;
              local_a20._0_4_ = fVar221;
              local_8e0._0_16_ = ZEXT416((uint)fVar239);
              _local_900 = auVar225;
              local_820._0_4_ = fVar220;
              local_840._0_4_ = fVar145;
              local_800._0_4_ = fVar114;
              fVar240 = sqrtf(fVar240);
              auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar221 = (float)local_a20._0_4_;
              fVar114 = (float)local_800._0_4_;
              fVar220 = (float)local_820._0_4_;
              fVar145 = (float)local_840._0_4_;
              auVar225 = _local_900;
              auVar160 = local_980._0_16_;
              auVar118 = local_8e0._0_16_;
              fVar113 = (float)local_960._0_4_;
            }
            else {
              auVar118 = vsqrtss_avx(auVar123,auVar123);
              fVar240 = auVar118._0_4_;
              auVar118 = ZEXT416((uint)fVar239);
            }
            auVar379 = ZEXT1664(local_a00._0_16_);
            auVar159 = vpermilps_avx(local_6e0._0_16_,0xff);
            auVar153 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
            fVar239 = fVar220 * fVar114 - auVar153._0_4_;
            auVar253._0_8_ = auVar225._0_8_ ^ 0x8000000080000000;
            auVar253._8_4_ = auVar225._8_4_ ^ 0x80000000;
            auVar253._12_4_ = auVar225._12_4_ ^ 0x80000000;
            auVar275._0_4_ = -fVar239;
            auVar275._4_4_ = 0x80000000;
            auVar275._8_4_ = 0x80000000;
            auVar275._12_4_ = 0x80000000;
            fVar220 = auVar118._0_4_ * fVar145 * fVar114;
            auVar313 = ZEXT464((uint)fVar220);
            auVar123 = vinsertps_avx(ZEXT416((uint)(fVar145 * fVar114)),auVar253,0x10);
            auVar40 = vmovsldup_avx(ZEXT416((uint)(fVar220 - auVar225._0_4_ * fVar239)));
            auVar123 = vdivps_avx(auVar123,auVar40);
            auVar159 = ZEXT416((uint)(fVar240 - auVar159._0_4_));
            auVar225 = vinsertps_avx(auVar160,auVar159,0x10);
            auVar230._0_4_ = auVar225._0_4_ * auVar123._0_4_;
            auVar230._4_4_ = auVar225._4_4_ * auVar123._4_4_;
            auVar230._8_4_ = auVar225._8_4_ * auVar123._8_4_;
            auVar230._12_4_ = auVar225._12_4_ * auVar123._12_4_;
            auVar118 = vinsertps_avx(auVar275,auVar118,0x1c);
            auVar118 = vdivps_avx(auVar118,auVar40);
            auVar207._0_4_ = auVar225._0_4_ * auVar118._0_4_;
            auVar207._4_4_ = auVar225._4_4_ * auVar118._4_4_;
            auVar207._8_4_ = auVar225._8_4_ * auVar118._8_4_;
            auVar207._12_4_ = auVar225._12_4_ * auVar118._12_4_;
            auVar118 = vhaddps_avx(auVar230,auVar230);
            auVar123 = vhaddps_avx(auVar207,auVar207);
            local_aa0 = local_aa0 - auVar118._0_4_;
            auVar259 = ZEXT464((uint)local_aa0);
            fVar239 = (float)local_ae0._0_4_ - auVar123._0_4_;
            auVar360 = ZEXT464((uint)fVar239);
            auVar254._8_4_ = 0x7fffffff;
            auVar254._0_8_ = 0x7fffffff7fffffff;
            auVar254._12_4_ = 0x7fffffff;
            auVar288 = ZEXT1664(auVar254);
            auVar160 = vandps_avx(auVar160,auVar254);
            if (fVar221 <= auVar160._0_4_) {
LAB_011e3107:
              bVar90 = false;
            }
            else {
              auVar160 = vandps_avx(auVar159,auVar254);
              if ((float)local_700._0_4_ * 1.9073486e-06 + fVar113 + fVar221 <= auVar160._0_4_)
              goto LAB_011e3107;
              fVar239 = fVar239 + (float)local_7c0._0_4_;
              auVar360 = ZEXT464((uint)fVar239);
              bVar90 = true;
              if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar239) &&
                   (fVar221 = (ray->super_RayK<1>).tfar, fVar239 <= fVar221)) && (0.0 <= local_aa0))
                 && (local_aa0 <= 1.0)) {
                auVar160 = vrsqrtss_avx(local_a80._0_16_,local_a80._0_16_);
                fVar113 = auVar160._0_4_;
                pGVar31 = (context->scene->geometries).items[local_aa8].ptr;
                if ((pGVar31->mask & (ray->super_RayK<1>).mask) != 0) {
                  auVar160 = ZEXT416((uint)(fVar113 * 1.5 +
                                           local_a80._0_4_ * -0.5 * fVar113 * fVar113 * fVar113));
                  auVar160 = vshufps_avx(auVar160,auVar160,0);
                  auVar161._0_4_ = auVar160._0_4_ * (float)local_9a0._0_4_;
                  auVar161._4_4_ = auVar160._4_4_ * (float)local_9a0._4_4_;
                  auVar161._8_4_ = auVar160._8_4_ * fStack_998;
                  auVar161._12_4_ = auVar160._12_4_ * fStack_994;
                  auVar125._0_4_ = local_a00._0_4_ + auVar153._0_4_ * auVar161._0_4_;
                  auVar125._4_4_ = local_a00._4_4_ + auVar153._4_4_ * auVar161._4_4_;
                  auVar125._8_4_ = local_a00._8_4_ + auVar153._8_4_ * auVar161._8_4_;
                  auVar125._12_4_ = local_a00._12_4_ + auVar153._12_4_ * auVar161._12_4_;
                  auVar160 = vshufps_avx(auVar161,auVar161,0xc9);
                  auVar118 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                  auVar162._0_4_ = auVar118._0_4_ * auVar161._0_4_;
                  auVar162._4_4_ = auVar118._4_4_ * auVar161._4_4_;
                  auVar162._8_4_ = auVar118._8_4_ * auVar161._8_4_;
                  auVar162._12_4_ = auVar118._12_4_ * auVar161._12_4_;
                  auVar208._0_4_ = local_a00._0_4_ * auVar160._0_4_;
                  auVar208._4_4_ = local_a00._4_4_ * auVar160._4_4_;
                  auVar208._8_4_ = local_a00._8_4_ * auVar160._8_4_;
                  auVar208._12_4_ = local_a00._12_4_ * auVar160._12_4_;
                  auVar123 = vsubps_avx(auVar208,auVar162);
                  auVar160 = vshufps_avx(auVar123,auVar123,0xc9);
                  auVar118 = vshufps_avx(auVar125,auVar125,0xc9);
                  auVar209._0_4_ = auVar118._0_4_ * auVar160._0_4_;
                  auVar209._4_4_ = auVar118._4_4_ * auVar160._4_4_;
                  auVar209._8_4_ = auVar118._8_4_ * auVar160._8_4_;
                  auVar209._12_4_ = auVar118._12_4_ * auVar160._12_4_;
                  auVar160 = vshufps_avx(auVar123,auVar123,0xd2);
                  auVar126._0_4_ = auVar125._0_4_ * auVar160._0_4_;
                  auVar126._4_4_ = auVar125._4_4_ * auVar160._4_4_;
                  auVar126._8_4_ = auVar125._8_4_ * auVar160._8_4_;
                  auVar126._12_4_ = auVar125._12_4_ * auVar160._12_4_;
                  auVar160 = vsubps_avx(auVar209,auVar126);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar31->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    (ray->super_RayK<1>).tfar = fVar239;
                    auVar118 = vshufps_avx(auVar160,auVar160,0xe9);
                    uVar9 = vmovlps_avx(auVar118);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                    (ray->Ng).field_0.field_0.z = auVar160._0_4_;
                    ray->u = local_aa0;
                    ray->v = 0.0;
                    ray->primID = (uint)local_a58;
                    ray->geomID = (uint)local_aa8;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                  }
                  else {
                    auVar118 = vshufps_avx(auVar160,auVar160,0xe9);
                    local_930 = vmovlps_avx(auVar118);
                    local_928 = auVar160._0_4_;
                    local_924 = local_aa0;
                    local_920 = 0;
                    local_91c = (uint)local_a58;
                    local_918 = (uint)local_aa8;
                    local_914 = context->user->instID[0];
                    local_910 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar239;
                    local_ae4 = -1;
                    local_a50.valid = &local_ae4;
                    local_a50.geometryUserPtr = pGVar31->userPtr;
                    local_a50.context = context->user;
                    local_a50.ray = (RTCRayN *)ray;
                    local_a50.hit = (RTCHitN *)&local_930;
                    local_a50.N = 1;
                    fStack_a9c = 0.0;
                    fStack_a98 = 0.0;
                    fStack_a94 = 0.0;
                    local_ae0._0_16_ = ZEXT416((uint)fVar239);
                    local_a80._0_4_ = fVar221;
                    if (pGVar31->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011e3242:
                      p_Var34 = context->args->filter;
                      if (p_Var34 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar31->field_8).field_0x2 & 0x40) != 0)) {
                          auVar313 = ZEXT1664(auVar313._0_16_);
                          auVar379 = ZEXT1664(auVar379._0_16_);
                          (*p_Var34)(&local_a50);
                          auVar360 = ZEXT1664(local_ae0._0_16_);
                          auVar259 = ZEXT1664(CONCAT412(fStack_a94,
                                                        CONCAT48(fStack_a98,
                                                                 CONCAT44(fStack_a9c,local_aa0))));
                          auVar288 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                          fVar221 = (float)local_a80._0_4_;
                        }
                        if (*local_a50.valid == 0) goto LAB_011e32f7;
                      }
                      (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).components[0] =
                           *(float *)local_a50.hit;
                      (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_a50.hit + 4);
                      (((Vec3f *)((long)local_a50.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_a50.hit + 8);
                      *(float *)((long)local_a50.ray + 0x3c) = *(float *)(local_a50.hit + 0xc);
                      *(float *)((long)local_a50.ray + 0x40) = *(float *)(local_a50.hit + 0x10);
                      *(float *)((long)local_a50.ray + 0x44) = *(float *)(local_a50.hit + 0x14);
                      *(float *)((long)local_a50.ray + 0x48) = *(float *)(local_a50.hit + 0x18);
                      *(float *)((long)local_a50.ray + 0x4c) = *(float *)(local_a50.hit + 0x1c);
                      *(float *)((long)local_a50.ray + 0x50) = *(float *)(local_a50.hit + 0x20);
                    }
                    else {
                      auVar313 = ZEXT464((uint)fVar220);
                      auVar379 = ZEXT1664(local_a00._0_16_);
                      (*pGVar31->intersectionFilterN)(&local_a50);
                      auVar360 = ZEXT1664(local_ae0._0_16_);
                      auVar259 = ZEXT1664(CONCAT412(fStack_a94,
                                                    CONCAT48(fStack_a98,
                                                             CONCAT44(fStack_a9c,local_aa0))));
                      auVar288 = ZEXT1664(CONCAT412(0x7fffffff,
                                                    CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                      fVar221 = (float)local_a80._0_4_;
                      if (*local_a50.valid != 0) goto LAB_011e3242;
LAB_011e32f7:
                      (ray->super_RayK<1>).tfar = fVar221;
                    }
                  }
                }
              }
            }
            auVar135 = local_620;
            bVar111 = lVar107 != 0;
            lVar107 = lVar107 + -1;
          } while ((!bVar90) && (bVar111));
          fVar221 = (ray->super_RayK<1>).tfar;
          auVar138._4_4_ = fVar221;
          auVar138._0_4_ = fVar221;
          auVar138._8_4_ = fVar221;
          auVar138._12_4_ = fVar221;
          auVar138._16_4_ = fVar221;
          auVar138._20_4_ = fVar221;
          auVar138._24_4_ = fVar221;
          auVar138._28_4_ = fVar221;
          auVar174 = vcmpps_avx(_local_740,auVar138,2);
          local_620 = vandps_avx(auVar174,local_620);
          auVar135 = auVar135 & auVar174;
        } while ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar135 >> 0x7f,0) != '\0') ||
                   (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar135 >> 0xbf,0) != '\0') ||
                 (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar135[0x1f] < '\0');
      }
      auVar135 = vandps_avx(local_5a0,local_580);
      auVar174 = vandps_avx(_local_8a0,local_780);
      auVar218._0_4_ = (float)local_760._0_4_ + local_440._0_4_;
      auVar218._4_4_ = (float)local_760._4_4_ + local_440._4_4_;
      auVar218._8_4_ = fStack_758 + local_440._8_4_;
      auVar218._12_4_ = fStack_754 + local_440._12_4_;
      auVar218._16_4_ = fStack_750 + local_440._16_4_;
      auVar218._20_4_ = fStack_74c + local_440._20_4_;
      auVar218._24_4_ = fStack_748 + local_440._24_4_;
      auVar218._28_4_ = fStack_744 + local_440._28_4_;
      fVar221 = (ray->super_RayK<1>).tfar;
      auVar258._4_4_ = fVar221;
      auVar258._0_4_ = fVar221;
      auVar258._8_4_ = fVar221;
      auVar258._12_4_ = fVar221;
      auVar258._16_4_ = fVar221;
      auVar258._20_4_ = fVar221;
      auVar258._24_4_ = fVar221;
      auVar258._28_4_ = fVar221;
      auVar35 = vcmpps_avx(auVar218,auVar258,2);
      auVar135 = vandps_avx(auVar35,auVar135);
      auVar286._0_4_ = (float)local_760._0_4_ + local_480._0_4_;
      auVar286._4_4_ = (float)local_760._4_4_ + local_480._4_4_;
      auVar286._8_4_ = fStack_758 + local_480._8_4_;
      auVar286._12_4_ = fStack_754 + local_480._12_4_;
      auVar286._16_4_ = fStack_750 + local_480._16_4_;
      auVar286._20_4_ = fStack_74c + local_480._20_4_;
      auVar286._24_4_ = fStack_748 + local_480._24_4_;
      auVar286._28_4_ = fStack_744 + local_480._28_4_;
      auVar35 = vcmpps_avx(auVar286,auVar258,2);
      auVar174 = vandps_avx(auVar35,auVar174);
      auVar174 = vorps_avx(auVar135,auVar174);
      if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar174 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar174 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar174 >> 0x7f,0) != '\0') ||
            (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar174 >> 0xbf,0) != '\0') ||
          (auVar174 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar174[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar106 * 0x60) = auVar174;
        auVar135 = vblendvps_avx(_local_480,local_440,auVar135);
        *(undefined1 (*) [32])(auStack_160 + uVar106 * 0x60) = auVar135;
        auVar101._8_8_ = uStack_7c8;
        auVar101._0_8_ = local_7d0;
        uVar9 = vmovlps_avx(auVar101);
        *(undefined8 *)(afStack_140 + uVar106 * 0x18) = uVar9;
        auStack_138[uVar106 * 0x18] = (int)local_640 + 1;
        uVar106 = (ulong)((int)uVar106 + 1);
      }
      auVar288 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    fVar221 = (ray->super_RayK<1>).tfar;
    auVar133._4_4_ = fVar221;
    auVar133._0_4_ = fVar221;
    auVar133._8_4_ = fVar221;
    auVar133._12_4_ = fVar221;
    auVar133._16_4_ = fVar221;
    auVar133._20_4_ = fVar221;
    auVar133._24_4_ = fVar221;
    auVar133._28_4_ = fVar221;
    do {
      if ((int)uVar106 == 0) {
        fVar221 = (ray->super_RayK<1>).tfar;
        auVar140._4_4_ = fVar221;
        auVar140._0_4_ = fVar221;
        auVar140._8_4_ = fVar221;
        auVar140._12_4_ = fVar221;
        auVar140._16_4_ = fVar221;
        auVar140._20_4_ = fVar221;
        auVar140._24_4_ = fVar221;
        auVar140._28_4_ = fVar221;
        auVar135 = vcmpps_avx(local_3e0,auVar140,2);
        uVar104 = vmovmskps_avx(auVar135);
        uVar104 = (uint)local_7a8 - 1 & (uint)local_7a8 & uVar104;
        if (uVar104 == 0) {
          return;
        }
        goto LAB_011e0b4f;
      }
      uVar105 = (ulong)((int)uVar106 - 1);
      lVar107 = uVar105 * 0x60;
      auVar235 = *(undefined1 (*) [32])(auStack_180 + lVar107);
      auVar135 = *(undefined1 (*) [32])(auStack_160 + lVar107);
      auVar173._0_4_ = auVar135._0_4_ + (float)local_760._0_4_;
      auVar173._4_4_ = auVar135._4_4_ + (float)local_760._4_4_;
      auVar173._8_4_ = auVar135._8_4_ + fStack_758;
      auVar173._12_4_ = auVar135._12_4_ + fStack_754;
      auVar173._16_4_ = auVar135._16_4_ + fStack_750;
      auVar173._20_4_ = auVar135._20_4_ + fStack_74c;
      auVar173._24_4_ = auVar135._24_4_ + fStack_748;
      auVar173._28_4_ = auVar135._28_4_ + fStack_744;
      auVar35 = vcmpps_avx(auVar173,auVar133,2);
      auVar174 = vandps_avx(auVar35,auVar235);
      local_440 = auVar174;
      auVar36 = auVar235 & auVar35;
      bVar96 = (auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar97 = (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar95 = (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar94 = SUB321(auVar36 >> 0x7f,0) == '\0';
      bVar93 = (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar92 = SUB321(auVar36 >> 0xbf,0) == '\0';
      bVar111 = (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar90 = -1 < auVar36[0x1f];
      if (((((((!bVar96 || !bVar97) || !bVar95) || !bVar94) || !bVar93) || !bVar92) || !bVar111) ||
          !bVar90) {
        auVar238._8_4_ = 0x7f800000;
        auVar238._0_8_ = 0x7f8000007f800000;
        auVar238._12_4_ = 0x7f800000;
        auVar238._16_4_ = 0x7f800000;
        auVar238._20_4_ = 0x7f800000;
        auVar238._24_4_ = 0x7f800000;
        auVar238._28_4_ = 0x7f800000;
        auVar135 = vblendvps_avx(auVar238,auVar135,auVar174);
        auVar35 = vshufps_avx(auVar135,auVar135,0xb1);
        auVar35 = vminps_avx(auVar135,auVar35);
        auVar36 = vshufpd_avx(auVar35,auVar35,5);
        auVar36 = vminps_avx(auVar35,auVar36);
        auVar35 = vperm2f128_avx(auVar36,auVar36,1);
        auVar36 = vminps_avx(auVar36,auVar35);
        auVar135 = vcmpps_avx(auVar135,auVar36,0);
        auVar36 = auVar174 & auVar135;
        if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar36 >> 0x7f,0) != '\0') ||
              (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar36 >> 0xbf,0) != '\0') ||
            (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar36[0x1f] < '\0') {
          auVar174 = vandps_avx(auVar135,auVar174);
        }
        fVar221 = afStack_140[uVar105 * 0x18 + 1];
        local_640 = (ulong)auStack_138[uVar105 * 0x18];
        uVar109 = vmovmskps_avx(auVar174);
        uVar104 = 0;
        if (uVar109 != 0) {
          for (; (uVar109 >> uVar104 & 1) == 0; uVar104 = uVar104 + 1) {
          }
        }
        fVar113 = afStack_140[uVar105 * 0x18];
        *(undefined4 *)(local_440 + (ulong)uVar104 * 4) = 0;
        if ((((((((local_440 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_440 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_440 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_440 >> 0x7f,0) != '\0') ||
              (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_440 >> 0xbf,0) != '\0') ||
            (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_440[0x1f] < '\0') {
          uVar105 = uVar106;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar107) = local_440;
        auVar160 = vshufps_avx(ZEXT416((uint)(fVar221 - fVar113)),ZEXT416((uint)(fVar221 - fVar113))
                               ,0);
        local_480._4_4_ = fVar113 + auVar160._4_4_ * 0.14285715;
        local_480._0_4_ = fVar113 + auVar160._0_4_ * 0.0;
        fStack_478 = fVar113 + auVar160._8_4_ * 0.2857143;
        fStack_474 = fVar113 + auVar160._12_4_ * 0.42857146;
        fStack_470 = fVar113 + auVar160._0_4_ * 0.5714286;
        fStack_46c = fVar113 + auVar160._4_4_ * 0.71428573;
        fStack_468 = fVar113 + auVar160._8_4_ * 0.8571429;
        fStack_464 = fVar113 + auVar160._12_4_;
        local_7d0 = *(undefined8 *)(local_480 + (ulong)uVar104 * 4);
        uStack_7c8 = 0;
        auVar235 = local_440;
      }
      uVar106 = uVar105;
      auVar259 = ZEXT3264(auVar35);
      uVar105 = local_640;
    } while (((((((bVar96 && bVar97) && bVar95) && bVar94) && bVar93) && bVar92) && bVar111) &&
             bVar90);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }